

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

bool embree::avx::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [28];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  Primitive PVar24;
  Geometry *pGVar25;
  __int_type_conflict _Var26;
  long lVar27;
  long lVar28;
  RTCFilterFunctionN p_Var29;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [12];
  ulong uVar110;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  uint uVar120;
  uint uVar121;
  undefined1 (*pauVar122) [32];
  ulong uVar123;
  uint uVar124;
  uint uVar125;
  int iVar126;
  ulong uVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  bool bVar131;
  bool bVar132;
  byte bVar133;
  float fVar162;
  float fVar163;
  __m128 a;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar164;
  float fVar165;
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar136 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  float fVar169;
  float fVar196;
  float fVar197;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  float fVar170;
  float fVar171;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  float fVar198;
  float fVar199;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar178 [16];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar200;
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  float fVar230;
  float fVar231;
  undefined1 auVar217 [32];
  float fVar233;
  undefined1 auVar218 [32];
  undefined1 auVar201 [16];
  undefined1 auVar219 [32];
  undefined1 auVar202 [16];
  float fVar232;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar394 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar208 [16];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  float fVar234;
  float fVar256;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [28];
  float fVar255;
  float fVar257;
  float fVar258;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar259;
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  float fVar260;
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar266 [16];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  float fVar277;
  float fVar292;
  float fVar293;
  undefined1 auVar278 [16];
  float fVar294;
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  float fVar295;
  float fVar296;
  float fVar298;
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  float fVar297;
  float fVar299;
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [64];
  float fVar300;
  float fVar301;
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar315;
  float fVar317;
  float fVar323;
  float fVar327;
  float fVar331;
  undefined1 auVar305 [32];
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar324;
  float fVar325;
  float fVar328;
  float fVar329;
  float fVar332;
  float fVar333;
  float fVar335;
  undefined1 auVar306 [32];
  float fVar316;
  float fVar318;
  float fVar322;
  float fVar326;
  float fVar330;
  float fVar334;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [64];
  float fVar336;
  float fVar348;
  float fVar349;
  float fVar351;
  float fVar353;
  float fVar355;
  float fVar357;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  float fVar350;
  float fVar352;
  float fVar354;
  float fVar356;
  float fVar358;
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [64];
  float fVar359;
  float fVar360;
  float fVar361;
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  float fVar373;
  float fVar376;
  float fVar382;
  float fVar385;
  float fVar388;
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  float fVar374;
  float fVar375;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar383;
  float fVar384;
  float fVar386;
  float fVar387;
  float fVar389;
  float fVar390;
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  float fVar402;
  float fVar403;
  float fVar404;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  float fVar405;
  float fVar406;
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [64];
  float fVar407;
  float fVar416;
  float fVar417;
  float fVar418;
  float fVar419;
  float fVar420;
  float fVar421;
  undefined1 auVar408 [32];
  undefined1 auVar409 [32];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  float fVar422;
  undefined1 auVar412 [32];
  undefined1 auVar413 [32];
  undefined1 auVar414 [32];
  undefined1 auVar415 [64];
  undefined1 auVar423 [16];
  undefined1 auVar424 [32];
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [32];
  undefined1 auVar428 [32];
  float fVar432;
  undefined1 auVar429 [32];
  undefined1 auVar430 [32];
  undefined1 auVar434 [16];
  float fVar433;
  float fVar441;
  float fVar442;
  float fVar444;
  float fVar445;
  float fVar446;
  float in_register_0000151c;
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  undefined1 auVar438 [32];
  float fVar443;
  undefined1 auVar439 [32];
  float fVar447;
  float fVar448;
  undefined1 auVar449 [16];
  float fVar454;
  float fVar456;
  float fVar460;
  float fVar462;
  float fVar464;
  undefined1 auVar450 [32];
  undefined1 auVar451 [32];
  float fVar455;
  float fVar457;
  float fVar458;
  float fVar459;
  float fVar461;
  float fVar463;
  float fVar465;
  undefined1 auVar452 [32];
  undefined1 auVar453 [32];
  float in_register_0000159c;
  undefined1 auVar466 [32];
  undefined1 auVar467 [32];
  undefined1 auVar468 [32];
  undefined1 auVar469 [32];
  float in_register_000015dc;
  undefined1 auVar470 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_be8;
  float local_be0;
  float local_ae0;
  float fStack_adc;
  float fStack_ad8;
  float fStack_ad4;
  float local_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [8];
  float fStack_a18;
  float fStack_a14;
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  RTCHitN local_760 [16];
  undefined1 auStack_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [16];
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint uStack_6e0;
  uint uStack_6dc;
  uint uStack_6d8;
  uint uStack_6d4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5b0 [16];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar431 [64];
  undefined1 auVar440 [64];
  
  PVar24 = prim[1];
  uVar127 = (ulong)(byte)PVar24;
  lVar130 = uVar127 * 0x25;
  auVar175 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar175 = vinsertps_avx(auVar175,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar35 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar35 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar175 = vsubps_avx(auVar175,*(undefined1 (*) [16])(prim + lVar130 + 6));
  fVar234 = *(float *)(prim + lVar130 + 0x12);
  auVar172._0_4_ = fVar234 * auVar175._0_4_;
  auVar172._4_4_ = fVar234 * auVar175._4_4_;
  auVar172._8_4_ = fVar234 * auVar175._8_4_;
  auVar172._12_4_ = fVar234 * auVar175._12_4_;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 4 + 6)));
  auVar278._0_4_ = fVar234 * auVar35._0_4_;
  auVar278._4_4_ = fVar234 * auVar35._4_4_;
  auVar278._8_4_ = fVar234 * auVar35._8_4_;
  auVar278._12_4_ = fVar234 * auVar35._12_4_;
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 4 + 10)));
  auVar147._16_16_ = auVar35;
  auVar147._0_16_ = auVar175;
  auVar147 = vcvtdq2ps_avx(auVar147);
  lVar27 = uVar127 * 5;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar27 + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar27 + 10)));
  auVar217._16_16_ = auVar35;
  auVar217._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 6 + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 6 + 10)));
  auVar195 = vcvtdq2ps_avx(auVar217);
  auVar248._16_16_ = auVar35;
  auVar248._0_16_ = auVar175;
  auVar30 = vcvtdq2ps_avx(auVar248);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0xf + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0xf + 10)));
  auVar249._16_16_ = auVar35;
  auVar249._0_16_ = auVar175;
  auVar31 = vcvtdq2ps_avx(auVar249);
  lVar128 = (ulong)(byte)PVar24 * 0x10;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar128 + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar128 + 10)));
  auVar305._16_16_ = auVar35;
  auVar305._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar128 + uVar127 + 6)));
  auVar32 = vcvtdq2ps_avx(auVar305);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar128 + uVar127 + 10)));
  auVar337._16_16_ = auVar35;
  auVar337._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1a + 6)));
  auVar400 = vcvtdq2ps_avx(auVar337);
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1a + 10)));
  auVar338._16_16_ = auVar35;
  auVar338._0_16_ = auVar175;
  auVar221 = vcvtdq2ps_avx(auVar338);
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1b + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1b + 10)));
  auVar395._16_16_ = auVar35;
  auVar395._0_16_ = auVar175;
  auVar175 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1c + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar127 * 0x1c + 10)));
  auVar33 = vcvtdq2ps_avx(auVar395);
  auVar408._16_16_ = auVar35;
  auVar408._0_16_ = auVar175;
  auVar34 = vcvtdq2ps_avx(auVar408);
  auVar175 = vshufps_avx(auVar278,auVar278,0);
  auVar35 = vshufps_avx(auVar278,auVar278,0x55);
  auVar52 = vshufps_avx(auVar278,auVar278,0xaa);
  fVar234 = auVar52._0_4_;
  fVar171 = auVar52._4_4_;
  fVar255 = auVar52._8_4_;
  fVar163 = auVar52._12_4_;
  fVar233 = auVar35._0_4_;
  fVar169 = auVar35._4_4_;
  fVar256 = auVar35._8_4_;
  fVar198 = auVar35._12_4_;
  fVar257 = auVar175._0_4_;
  fVar258 = auVar175._4_4_;
  fVar259 = auVar175._8_4_;
  fVar260 = auVar175._12_4_;
  auVar435._0_4_ = fVar257 * auVar147._0_4_ + fVar233 * auVar195._0_4_ + fVar234 * auVar30._0_4_;
  auVar435._4_4_ = fVar258 * auVar147._4_4_ + fVar169 * auVar195._4_4_ + fVar171 * auVar30._4_4_;
  auVar435._8_4_ = fVar259 * auVar147._8_4_ + fVar256 * auVar195._8_4_ + fVar255 * auVar30._8_4_;
  auVar435._12_4_ = fVar260 * auVar147._12_4_ + fVar198 * auVar195._12_4_ + fVar163 * auVar30._12_4_
  ;
  auVar435._16_4_ = fVar257 * auVar147._16_4_ + fVar233 * auVar195._16_4_ + fVar234 * auVar30._16_4_
  ;
  auVar435._20_4_ = fVar258 * auVar147._20_4_ + fVar169 * auVar195._20_4_ + fVar171 * auVar30._20_4_
  ;
  auVar435._24_4_ = fVar259 * auVar147._24_4_ + fVar256 * auVar195._24_4_ + fVar255 * auVar30._24_4_
  ;
  auVar435._28_4_ = fVar198 + in_register_000015dc + in_register_0000151c;
  auVar424._0_4_ = fVar257 * auVar31._0_4_ + fVar233 * auVar32._0_4_ + auVar400._0_4_ * fVar234;
  auVar424._4_4_ = fVar258 * auVar31._4_4_ + fVar169 * auVar32._4_4_ + auVar400._4_4_ * fVar171;
  auVar424._8_4_ = fVar259 * auVar31._8_4_ + fVar256 * auVar32._8_4_ + auVar400._8_4_ * fVar255;
  auVar424._12_4_ = fVar260 * auVar31._12_4_ + fVar198 * auVar32._12_4_ + auVar400._12_4_ * fVar163;
  auVar424._16_4_ = fVar257 * auVar31._16_4_ + fVar233 * auVar32._16_4_ + auVar400._16_4_ * fVar234;
  auVar424._20_4_ = fVar258 * auVar31._20_4_ + fVar169 * auVar32._20_4_ + auVar400._20_4_ * fVar171;
  auVar424._24_4_ = fVar259 * auVar31._24_4_ + fVar256 * auVar32._24_4_ + auVar400._24_4_ * fVar255;
  auVar424._28_4_ = fVar198 + in_register_000015dc + in_register_0000159c;
  auVar284._0_4_ = fVar257 * auVar221._0_4_ + fVar233 * auVar33._0_4_ + auVar34._0_4_ * fVar234;
  auVar284._4_4_ = fVar258 * auVar221._4_4_ + fVar169 * auVar33._4_4_ + auVar34._4_4_ * fVar171;
  auVar284._8_4_ = fVar259 * auVar221._8_4_ + fVar256 * auVar33._8_4_ + auVar34._8_4_ * fVar255;
  auVar284._12_4_ = fVar260 * auVar221._12_4_ + fVar198 * auVar33._12_4_ + auVar34._12_4_ * fVar163;
  auVar284._16_4_ = fVar257 * auVar221._16_4_ + fVar233 * auVar33._16_4_ + auVar34._16_4_ * fVar234;
  auVar284._20_4_ = fVar258 * auVar221._20_4_ + fVar169 * auVar33._20_4_ + auVar34._20_4_ * fVar171;
  auVar284._24_4_ = fVar259 * auVar221._24_4_ + fVar256 * auVar33._24_4_ + auVar34._24_4_ * fVar255;
  auVar284._28_4_ = fVar260 + fVar198 + fVar163;
  auVar175 = vshufps_avx(auVar172,auVar172,0);
  auVar35 = vshufps_avx(auVar172,auVar172,0x55);
  auVar52 = vshufps_avx(auVar172,auVar172,0xaa);
  fVar234 = auVar52._0_4_;
  fVar171 = auVar52._4_4_;
  fVar255 = auVar52._8_4_;
  fVar163 = auVar52._12_4_;
  fVar258 = auVar35._0_4_;
  fVar259 = auVar35._4_4_;
  fVar260 = auVar35._8_4_;
  fVar271 = auVar35._12_4_;
  fVar233 = auVar195._28_4_ + auVar30._28_4_;
  fVar169 = auVar175._0_4_;
  fVar256 = auVar175._4_4_;
  fVar198 = auVar175._8_4_;
  fVar257 = auVar175._12_4_;
  auVar184._0_4_ = fVar169 * auVar147._0_4_ + fVar258 * auVar195._0_4_ + fVar234 * auVar30._0_4_;
  auVar184._4_4_ = fVar256 * auVar147._4_4_ + fVar259 * auVar195._4_4_ + fVar171 * auVar30._4_4_;
  auVar184._8_4_ = fVar198 * auVar147._8_4_ + fVar260 * auVar195._8_4_ + fVar255 * auVar30._8_4_;
  auVar184._12_4_ = fVar257 * auVar147._12_4_ + fVar271 * auVar195._12_4_ + fVar163 * auVar30._12_4_
  ;
  auVar184._16_4_ = fVar169 * auVar147._16_4_ + fVar258 * auVar195._16_4_ + fVar234 * auVar30._16_4_
  ;
  auVar184._20_4_ = fVar256 * auVar147._20_4_ + fVar259 * auVar195._20_4_ + fVar171 * auVar30._20_4_
  ;
  auVar184._24_4_ = fVar198 * auVar147._24_4_ + fVar260 * auVar195._24_4_ + fVar255 * auVar30._24_4_
  ;
  auVar184._28_4_ = auVar147._28_4_ + fVar233;
  auVar148._0_4_ = fVar169 * auVar31._0_4_ + auVar400._0_4_ * fVar234 + fVar258 * auVar32._0_4_;
  auVar148._4_4_ = fVar256 * auVar31._4_4_ + auVar400._4_4_ * fVar171 + fVar259 * auVar32._4_4_;
  auVar148._8_4_ = fVar198 * auVar31._8_4_ + auVar400._8_4_ * fVar255 + fVar260 * auVar32._8_4_;
  auVar148._12_4_ = fVar257 * auVar31._12_4_ + auVar400._12_4_ * fVar163 + fVar271 * auVar32._12_4_;
  auVar148._16_4_ = fVar169 * auVar31._16_4_ + auVar400._16_4_ * fVar234 + fVar258 * auVar32._16_4_;
  auVar148._20_4_ = fVar256 * auVar31._20_4_ + auVar400._20_4_ * fVar171 + fVar259 * auVar32._20_4_;
  auVar148._24_4_ = fVar198 * auVar31._24_4_ + auVar400._24_4_ * fVar255 + fVar260 * auVar32._24_4_;
  auVar148._28_4_ = auVar147._28_4_ + auVar400._28_4_ + auVar30._28_4_;
  auVar339._8_4_ = 0x7fffffff;
  auVar339._0_8_ = 0x7fffffff7fffffff;
  auVar339._12_4_ = 0x7fffffff;
  auVar339._16_4_ = 0x7fffffff;
  auVar339._20_4_ = 0x7fffffff;
  auVar339._24_4_ = 0x7fffffff;
  auVar339._28_4_ = 0x7fffffff;
  auVar364._8_4_ = 0x219392ef;
  auVar364._0_8_ = 0x219392ef219392ef;
  auVar364._12_4_ = 0x219392ef;
  auVar364._16_4_ = 0x219392ef;
  auVar364._20_4_ = 0x219392ef;
  auVar364._24_4_ = 0x219392ef;
  auVar364._28_4_ = 0x219392ef;
  auVar147 = vandps_avx(auVar435,auVar339);
  auVar147 = vcmpps_avx(auVar147,auVar364,1);
  auVar195 = vblendvps_avx(auVar435,auVar364,auVar147);
  auVar147 = vandps_avx(auVar424,auVar339);
  auVar147 = vcmpps_avx(auVar147,auVar364,1);
  auVar30 = vblendvps_avx(auVar424,auVar364,auVar147);
  auVar147 = vandps_avx(auVar284,auVar339);
  auVar147 = vcmpps_avx(auVar147,auVar364,1);
  auVar147 = vblendvps_avx(auVar284,auVar364,auVar147);
  auVar218._0_4_ = fVar169 * auVar221._0_4_ + fVar258 * auVar33._0_4_ + auVar34._0_4_ * fVar234;
  auVar218._4_4_ = fVar256 * auVar221._4_4_ + fVar259 * auVar33._4_4_ + auVar34._4_4_ * fVar171;
  auVar218._8_4_ = fVar198 * auVar221._8_4_ + fVar260 * auVar33._8_4_ + auVar34._8_4_ * fVar255;
  auVar218._12_4_ = fVar257 * auVar221._12_4_ + fVar271 * auVar33._12_4_ + auVar34._12_4_ * fVar163;
  auVar218._16_4_ = fVar169 * auVar221._16_4_ + fVar258 * auVar33._16_4_ + auVar34._16_4_ * fVar234;
  auVar218._20_4_ = fVar256 * auVar221._20_4_ + fVar259 * auVar33._20_4_ + auVar34._20_4_ * fVar171;
  auVar218._24_4_ = fVar198 * auVar221._24_4_ + fVar260 * auVar33._24_4_ + auVar34._24_4_ * fVar255;
  auVar218._28_4_ = fVar233 + auVar32._28_4_ + fVar163;
  auVar31 = vrcpps_avx(auVar195);
  fVar234 = auVar31._0_4_;
  fVar255 = auVar31._4_4_;
  auVar32._4_4_ = auVar195._4_4_ * fVar255;
  auVar32._0_4_ = auVar195._0_4_ * fVar234;
  fVar233 = auVar31._8_4_;
  auVar32._8_4_ = auVar195._8_4_ * fVar233;
  fVar256 = auVar31._12_4_;
  auVar32._12_4_ = auVar195._12_4_ * fVar256;
  fVar257 = auVar31._16_4_;
  auVar32._16_4_ = auVar195._16_4_ * fVar257;
  fVar258 = auVar31._20_4_;
  auVar32._20_4_ = auVar195._20_4_ * fVar258;
  fVar259 = auVar31._24_4_;
  auVar32._24_4_ = auVar195._24_4_ * fVar259;
  auVar32._28_4_ = auVar195._28_4_;
  auVar365._8_4_ = 0x3f800000;
  auVar365._0_8_ = 0x3f8000003f800000;
  auVar365._12_4_ = 0x3f800000;
  auVar365._16_4_ = 0x3f800000;
  auVar365._20_4_ = 0x3f800000;
  auVar365._24_4_ = 0x3f800000;
  auVar365._28_4_ = 0x3f800000;
  auVar400 = vsubps_avx(auVar365,auVar32);
  auVar32 = vrcpps_avx(auVar30);
  fVar234 = fVar234 + fVar234 * auVar400._0_4_;
  fVar255 = fVar255 + fVar255 * auVar400._4_4_;
  fVar233 = fVar233 + fVar233 * auVar400._8_4_;
  fVar256 = fVar256 + fVar256 * auVar400._12_4_;
  fVar257 = fVar257 + fVar257 * auVar400._16_4_;
  fVar258 = fVar258 + fVar258 * auVar400._20_4_;
  fVar259 = fVar259 + fVar259 * auVar400._24_4_;
  fVar260 = auVar32._0_4_;
  fVar271 = auVar32._4_4_;
  auVar195._4_4_ = fVar271 * auVar30._4_4_;
  auVar195._0_4_ = fVar260 * auVar30._0_4_;
  fVar272 = auVar32._8_4_;
  auVar195._8_4_ = fVar272 * auVar30._8_4_;
  fVar273 = auVar32._12_4_;
  auVar195._12_4_ = fVar273 * auVar30._12_4_;
  fVar274 = auVar32._16_4_;
  auVar195._16_4_ = fVar274 * auVar30._16_4_;
  fVar275 = auVar32._20_4_;
  auVar195._20_4_ = fVar275 * auVar30._20_4_;
  fVar276 = auVar32._24_4_;
  auVar195._24_4_ = fVar276 * auVar30._24_4_;
  auVar195._28_4_ = auVar30._28_4_;
  auVar30 = vsubps_avx(auVar365,auVar195);
  fVar260 = fVar260 + fVar260 * auVar30._0_4_;
  fVar271 = fVar271 + fVar271 * auVar30._4_4_;
  fVar272 = fVar272 + fVar272 * auVar30._8_4_;
  fVar273 = fVar273 + fVar273 * auVar30._12_4_;
  fVar274 = fVar274 + fVar274 * auVar30._16_4_;
  fVar275 = fVar275 + fVar275 * auVar30._20_4_;
  fVar276 = fVar276 + fVar276 * auVar30._24_4_;
  auVar195 = vrcpps_avx(auVar147);
  fVar277 = auVar195._0_4_;
  fVar292 = auVar195._4_4_;
  auVar221._4_4_ = fVar292 * auVar147._4_4_;
  auVar221._0_4_ = fVar277 * auVar147._0_4_;
  fVar293 = auVar195._8_4_;
  auVar221._8_4_ = fVar293 * auVar147._8_4_;
  fVar294 = auVar195._12_4_;
  auVar221._12_4_ = fVar294 * auVar147._12_4_;
  fVar295 = auVar195._16_4_;
  auVar221._16_4_ = fVar295 * auVar147._16_4_;
  fVar296 = auVar195._20_4_;
  auVar221._20_4_ = fVar296 * auVar147._20_4_;
  fVar298 = auVar195._24_4_;
  auVar221._24_4_ = fVar298 * auVar147._24_4_;
  auVar221._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(auVar365,auVar221);
  fVar277 = fVar277 + fVar277 * auVar147._0_4_;
  fVar292 = fVar292 + fVar292 * auVar147._4_4_;
  fVar293 = fVar293 + fVar293 * auVar147._8_4_;
  fVar294 = fVar294 + fVar294 * auVar147._12_4_;
  fVar295 = fVar295 + fVar295 * auVar147._16_4_;
  fVar296 = fVar296 + fVar296 * auVar147._20_4_;
  fVar298 = fVar298 + fVar298 * auVar147._24_4_;
  auVar175 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar130 + 0x16)) *
                           *(float *)(prim + lVar130 + 0x1a)));
  auVar53 = vshufps_avx(auVar175,auVar175,0);
  auVar175._8_8_ = 0;
  auVar175._0_8_ = *(ulong *)(prim + uVar127 * 7 + 6);
  auVar175 = vpmovsxwd_avx(auVar175);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar127 * 7 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar340._16_16_ = auVar35;
  auVar340._0_16_ = auVar175;
  auVar147 = vcvtdq2ps_avx(auVar340);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar127 * 0xb + 6);
  auVar175 = vpmovsxwd_avx(auVar52);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar127 * 0xb + 0xe);
  auVar35 = vpmovsxwd_avx(auVar11);
  auVar366._16_16_ = auVar35;
  auVar366._0_16_ = auVar175;
  auVar195 = vcvtdq2ps_avx(auVar366);
  auVar195 = vsubps_avx(auVar195,auVar147);
  fVar171 = auVar53._0_4_;
  fVar163 = auVar53._4_4_;
  fVar169 = auVar53._8_4_;
  fVar198 = auVar53._12_4_;
  auVar53._8_8_ = 0;
  auVar53._0_8_ = *(ulong *)(prim + uVar127 * 9 + 6);
  auVar175 = vpmovsxwd_avx(auVar53);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar127 * 9 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar12);
  auVar341._0_4_ = auVar195._0_4_ * fVar171 + auVar147._0_4_;
  auVar341._4_4_ = auVar195._4_4_ * fVar163 + auVar147._4_4_;
  auVar341._8_4_ = auVar195._8_4_ * fVar169 + auVar147._8_4_;
  auVar341._12_4_ = auVar195._12_4_ * fVar198 + auVar147._12_4_;
  auVar341._16_4_ = auVar195._16_4_ * fVar171 + auVar147._16_4_;
  auVar341._20_4_ = auVar195._20_4_ * fVar163 + auVar147._20_4_;
  auVar341._24_4_ = auVar195._24_4_ * fVar169 + auVar147._24_4_;
  auVar341._28_4_ = auVar195._28_4_ + auVar147._28_4_;
  auVar367._16_16_ = auVar35;
  auVar367._0_16_ = auVar175;
  auVar147 = vcvtdq2ps_avx(auVar367);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar127 * 0xd + 6);
  auVar175 = vpmovsxwd_avx(auVar13);
  auVar213._8_8_ = 0;
  auVar213._0_8_ = *(ulong *)(prim + uVar127 * 0xd + 0xe);
  auVar35 = vpmovsxwd_avx(auVar213);
  auVar396._16_16_ = auVar35;
  auVar396._0_16_ = auVar175;
  auVar195 = vcvtdq2ps_avx(auVar396);
  auVar195 = vsubps_avx(auVar195,auVar147);
  auVar209._8_8_ = 0;
  auVar209._0_8_ = *(ulong *)(prim + uVar127 * 0x12 + 6);
  auVar175 = vpmovsxwd_avx(auVar209);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar127 * 0x12 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar143);
  auVar368._0_4_ = auVar147._0_4_ + auVar195._0_4_ * fVar171;
  auVar368._4_4_ = auVar147._4_4_ + auVar195._4_4_ * fVar163;
  auVar368._8_4_ = auVar147._8_4_ + auVar195._8_4_ * fVar169;
  auVar368._12_4_ = auVar147._12_4_ + auVar195._12_4_ * fVar198;
  auVar368._16_4_ = auVar147._16_4_ + auVar195._16_4_ * fVar171;
  auVar368._20_4_ = auVar147._20_4_ + auVar195._20_4_ * fVar163;
  auVar368._24_4_ = auVar147._24_4_ + auVar195._24_4_ * fVar169;
  auVar368._28_4_ = auVar147._28_4_ + auVar195._28_4_;
  auVar397._16_16_ = auVar35;
  auVar397._0_16_ = auVar175;
  auVar147 = vcvtdq2ps_avx(auVar397);
  uVar123 = (ulong)(uint)((int)lVar27 << 2);
  lVar130 = uVar127 * 2 + uVar123;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + lVar130 + 6);
  auVar175 = vpmovsxwd_avx(auVar179);
  auVar394._8_8_ = 0;
  auVar394._0_8_ = *(ulong *)(prim + lVar130 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar394);
  auVar409._16_16_ = auVar35;
  auVar409._0_16_ = auVar175;
  auVar195 = vcvtdq2ps_avx(auVar409);
  auVar195 = vsubps_avx(auVar195,auVar147);
  auVar142._8_8_ = 0;
  auVar142._0_8_ = *(ulong *)(prim + uVar123 + 6);
  auVar175 = vpmovsxwd_avx(auVar142);
  auVar398._0_4_ = auVar147._0_4_ + auVar195._0_4_ * fVar171;
  auVar398._4_4_ = auVar147._4_4_ + auVar195._4_4_ * fVar163;
  auVar398._8_4_ = auVar147._8_4_ + auVar195._8_4_ * fVar169;
  auVar398._12_4_ = auVar147._12_4_ + auVar195._12_4_ * fVar198;
  auVar398._16_4_ = auVar147._16_4_ + auVar195._16_4_ * fVar171;
  auVar398._20_4_ = auVar147._20_4_ + auVar195._20_4_ * fVar163;
  auVar398._24_4_ = auVar147._24_4_ + auVar195._24_4_ * fVar169;
  auVar398._28_4_ = auVar147._28_4_ + auVar195._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar123 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar14);
  auVar410._16_16_ = auVar35;
  auVar410._0_16_ = auVar175;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar127 * 0x18 + 6);
  auVar175 = vpmovsxwd_avx(auVar15);
  auVar182._8_8_ = 0;
  auVar182._0_8_ = *(ulong *)(prim + uVar127 * 0x18 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar182);
  auVar147 = vcvtdq2ps_avx(auVar410);
  auVar425._16_16_ = auVar35;
  auVar425._0_16_ = auVar175;
  auVar195 = vcvtdq2ps_avx(auVar425);
  auVar195 = vsubps_avx(auVar195,auVar147);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar127 * 0x1d + 6);
  auVar175 = vpmovsxwd_avx(auVar16);
  auVar411._0_4_ = auVar147._0_4_ + auVar195._0_4_ * fVar171;
  auVar411._4_4_ = auVar147._4_4_ + auVar195._4_4_ * fVar163;
  auVar411._8_4_ = auVar147._8_4_ + auVar195._8_4_ * fVar169;
  auVar411._12_4_ = auVar147._12_4_ + auVar195._12_4_ * fVar198;
  auVar411._16_4_ = auVar147._16_4_ + auVar195._16_4_ * fVar171;
  auVar411._20_4_ = auVar147._20_4_ + auVar195._20_4_ * fVar163;
  auVar411._24_4_ = auVar147._24_4_ + auVar195._24_4_ * fVar169;
  auVar411._28_4_ = auVar147._28_4_ + auVar195._28_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar127 * 0x1d + 0xe);
  auVar35 = vpmovsxwd_avx(auVar17);
  lVar130 = uVar127 + (ulong)(byte)PVar24 * 0x20;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar130 + 6);
  auVar52 = vpmovsxwd_avx(auVar18);
  auVar426._16_16_ = auVar35;
  auVar426._0_16_ = auVar175;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar130 + 0xe);
  auVar175 = vpmovsxwd_avx(auVar19);
  auVar436._16_16_ = auVar175;
  auVar436._0_16_ = auVar52;
  auVar147 = vcvtdq2ps_avx(auVar426);
  auVar195 = vcvtdq2ps_avx(auVar436);
  auVar195 = vsubps_avx(auVar195,auVar147);
  auVar427._0_4_ = auVar147._0_4_ + auVar195._0_4_ * fVar171;
  auVar427._4_4_ = auVar147._4_4_ + auVar195._4_4_ * fVar163;
  auVar427._8_4_ = auVar147._8_4_ + auVar195._8_4_ * fVar169;
  auVar427._12_4_ = auVar147._12_4_ + auVar195._12_4_ * fVar198;
  auVar427._16_4_ = auVar147._16_4_ + auVar195._16_4_ * fVar171;
  auVar427._20_4_ = auVar147._20_4_ + auVar195._20_4_ * fVar163;
  auVar427._24_4_ = auVar147._24_4_ + auVar195._24_4_ * fVar169;
  auVar427._28_4_ = auVar147._28_4_ + auVar195._28_4_;
  lVar130 = (ulong)(byte)PVar24 * 0x20 - uVar127;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar130 + 6);
  auVar175 = vpmovsxwd_avx(auVar20);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar130 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar21);
  auVar437._16_16_ = auVar35;
  auVar437._0_16_ = auVar175;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar127 * 0x23 + 6);
  auVar175 = vpmovsxwd_avx(auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar127 * 0x23 + 0xe);
  auVar35 = vpmovsxwd_avx(auVar23);
  auVar450._16_16_ = auVar35;
  auVar450._0_16_ = auVar175;
  auVar147 = vcvtdq2ps_avx(auVar437);
  auVar195 = vcvtdq2ps_avx(auVar450);
  auVar195 = vsubps_avx(auVar195,auVar147);
  auVar438._0_4_ = auVar147._0_4_ + auVar195._0_4_ * fVar171;
  auVar438._4_4_ = auVar147._4_4_ + auVar195._4_4_ * fVar163;
  auVar438._8_4_ = auVar147._8_4_ + auVar195._8_4_ * fVar169;
  auVar438._12_4_ = auVar147._12_4_ + auVar195._12_4_ * fVar198;
  auVar438._16_4_ = auVar147._16_4_ + auVar195._16_4_ * fVar171;
  auVar438._20_4_ = auVar147._20_4_ + auVar195._20_4_ * fVar163;
  auVar438._24_4_ = auVar147._24_4_ + auVar195._24_4_ * fVar169;
  auVar438._28_4_ = auVar147._28_4_ + fVar198;
  auVar147 = vsubps_avx(auVar341,auVar184);
  auVar302._0_4_ = fVar234 * auVar147._0_4_;
  auVar302._4_4_ = fVar255 * auVar147._4_4_;
  auVar302._8_4_ = fVar233 * auVar147._8_4_;
  auVar302._12_4_ = fVar256 * auVar147._12_4_;
  auVar33._16_4_ = fVar257 * auVar147._16_4_;
  auVar33._0_16_ = auVar302;
  auVar33._20_4_ = fVar258 * auVar147._20_4_;
  auVar33._24_4_ = fVar259 * auVar147._24_4_;
  auVar33._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(auVar368,auVar184);
  auVar235._0_4_ = fVar234 * auVar147._0_4_;
  auVar235._4_4_ = fVar255 * auVar147._4_4_;
  auVar235._8_4_ = fVar233 * auVar147._8_4_;
  auVar235._12_4_ = fVar256 * auVar147._12_4_;
  auVar34._16_4_ = fVar257 * auVar147._16_4_;
  auVar34._0_16_ = auVar235;
  auVar34._20_4_ = fVar258 * auVar147._20_4_;
  auVar34._24_4_ = fVar259 * auVar147._24_4_;
  auVar34._28_4_ = auVar31._28_4_ + auVar400._28_4_;
  auVar147 = vsubps_avx(auVar398,auVar148);
  auVar173._0_4_ = fVar260 * auVar147._0_4_;
  auVar173._4_4_ = fVar271 * auVar147._4_4_;
  auVar173._8_4_ = fVar272 * auVar147._8_4_;
  auVar173._12_4_ = fVar273 * auVar147._12_4_;
  auVar31._16_4_ = fVar274 * auVar147._16_4_;
  auVar31._0_16_ = auVar173;
  auVar31._20_4_ = fVar275 * auVar147._20_4_;
  auVar31._24_4_ = fVar276 * auVar147._24_4_;
  auVar31._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(auVar411,auVar148);
  auVar261._0_4_ = fVar260 * auVar147._0_4_;
  auVar261._4_4_ = fVar271 * auVar147._4_4_;
  auVar261._8_4_ = fVar272 * auVar147._8_4_;
  auVar261._12_4_ = fVar273 * auVar147._12_4_;
  auVar400._16_4_ = fVar274 * auVar147._16_4_;
  auVar400._0_16_ = auVar261;
  auVar400._20_4_ = fVar275 * auVar147._20_4_;
  auVar400._24_4_ = fVar276 * auVar147._24_4_;
  auVar400._28_4_ = auVar32._28_4_ + auVar30._28_4_;
  auVar147 = vsubps_avx(auVar427,auVar218);
  auVar134._0_4_ = fVar277 * auVar147._0_4_;
  auVar134._4_4_ = fVar292 * auVar147._4_4_;
  auVar134._8_4_ = fVar293 * auVar147._8_4_;
  auVar134._12_4_ = fVar294 * auVar147._12_4_;
  auVar30._16_4_ = fVar295 * auVar147._16_4_;
  auVar30._0_16_ = auVar134;
  auVar30._20_4_ = fVar296 * auVar147._20_4_;
  auVar30._24_4_ = fVar298 * auVar147._24_4_;
  auVar30._28_4_ = auVar147._28_4_;
  auVar147 = vsubps_avx(auVar438,auVar218);
  auVar201._0_4_ = fVar277 * auVar147._0_4_;
  auVar201._4_4_ = fVar292 * auVar147._4_4_;
  auVar201._8_4_ = fVar293 * auVar147._8_4_;
  auVar201._12_4_ = fVar294 * auVar147._12_4_;
  auVar54._16_4_ = fVar295 * auVar147._16_4_;
  auVar54._0_16_ = auVar201;
  auVar54._20_4_ = fVar296 * auVar147._20_4_;
  auVar54._24_4_ = fVar298 * auVar147._24_4_;
  auVar54._28_4_ = auVar147._28_4_;
  auVar175 = vpminsd_avx(auVar33._16_16_,auVar34._16_16_);
  auVar35 = vpminsd_avx(auVar302,auVar235);
  auVar369._16_16_ = auVar175;
  auVar369._0_16_ = auVar35;
  auVar175 = vpminsd_avx(auVar31._16_16_,auVar400._16_16_);
  auVar35 = vpminsd_avx(auVar173,auVar261);
  auVar428._16_16_ = auVar175;
  auVar428._0_16_ = auVar35;
  auVar147 = vmaxps_avx(auVar369,auVar428);
  auVar175 = vpminsd_avx(auVar30._16_16_,auVar54._16_16_);
  auVar35 = vpminsd_avx(auVar134,auVar201);
  auVar451._16_16_ = auVar175;
  auVar451._0_16_ = auVar35;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar466._4_4_ = uVar8;
  auVar466._0_4_ = uVar8;
  auVar466._8_4_ = uVar8;
  auVar466._12_4_ = uVar8;
  auVar466._16_4_ = uVar8;
  auVar466._20_4_ = uVar8;
  auVar466._24_4_ = uVar8;
  auVar466._28_4_ = uVar8;
  auVar195 = vmaxps_avx(auVar451,auVar466);
  auVar147 = vmaxps_avx(auVar147,auVar195);
  local_300._4_4_ = auVar147._4_4_ * 0.99999964;
  local_300._0_4_ = auVar147._0_4_ * 0.99999964;
  local_300._8_4_ = auVar147._8_4_ * 0.99999964;
  local_300._12_4_ = auVar147._12_4_ * 0.99999964;
  local_300._16_4_ = auVar147._16_4_ * 0.99999964;
  local_300._20_4_ = auVar147._20_4_ * 0.99999964;
  local_300._24_4_ = auVar147._24_4_ * 0.99999964;
  local_300._28_4_ = auVar147._28_4_;
  auVar175 = vpmaxsd_avx(auVar33._16_16_,auVar34._16_16_);
  auVar35 = vpmaxsd_avx(auVar302,auVar235);
  auVar250._16_16_ = auVar175;
  auVar250._0_16_ = auVar35;
  auVar175 = vpmaxsd_avx(auVar31._16_16_,auVar400._16_16_);
  auVar35 = vpmaxsd_avx(auVar173,auVar261);
  auVar185._16_16_ = auVar175;
  auVar185._0_16_ = auVar35;
  auVar147 = vminps_avx(auVar250,auVar185);
  auVar175 = vpmaxsd_avx(auVar30._16_16_,auVar54._16_16_);
  auVar35 = vpmaxsd_avx(auVar134,auVar201);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar219._4_4_ = uVar8;
  auVar219._0_4_ = uVar8;
  auVar219._8_4_ = uVar8;
  auVar219._12_4_ = uVar8;
  auVar219._16_4_ = uVar8;
  auVar219._20_4_ = uVar8;
  auVar219._24_4_ = uVar8;
  auVar219._28_4_ = uVar8;
  auVar149._16_16_ = auVar175;
  auVar149._0_16_ = auVar35;
  auVar195 = vminps_avx(auVar149,auVar219);
  auVar147 = vminps_avx(auVar147,auVar195);
  auVar439._4_4_ = auVar147._4_4_ * 1.0000004;
  auVar439._0_4_ = auVar147._0_4_ * 1.0000004;
  auVar439._8_4_ = auVar147._8_4_ * 1.0000004;
  auVar439._12_4_ = auVar147._12_4_ * 1.0000004;
  auVar439._16_4_ = auVar147._16_4_ * 1.0000004;
  auVar439._20_4_ = auVar147._20_4_ * 1.0000004;
  auVar439._24_4_ = auVar147._24_4_ * 1.0000004;
  auVar439._28_4_ = auVar147._28_4_;
  auVar147 = vcmpps_avx(local_300,auVar439,2);
  auVar175 = vpshufd_avx(ZEXT116((byte)PVar24),0);
  auVar186._16_16_ = auVar175;
  auVar186._0_16_ = auVar175;
  auVar195 = vcvtdq2ps_avx(auVar186);
  auVar195 = vcmpps_avx(_DAT_01faff40,auVar195,1);
  auVar147 = vandps_avx(auVar147,auVar195);
  uVar120 = vmovmskps_avx(auVar147);
  if (uVar120 == 0) {
    return false;
  }
  uVar120 = uVar120 & 0xff;
  auVar150._16_16_ = mm_lookupmask_ps._240_16_;
  auVar150._0_16_ = mm_lookupmask_ps._240_16_;
  local_520 = vblendps_avx(auVar150,ZEXT832(0) << 0x20,0x80);
  local_8b0 = prim;
LAB_01143742:
  local_8a8 = (ulong)uVar120;
  lVar130 = 0;
  if (local_8a8 != 0) {
    for (; (uVar120 >> lVar130 & 1) == 0; lVar130 = lVar130 + 1) {
    }
  }
  uVar120 = *(uint *)(local_8b0 + 2);
  pGVar25 = (context->scene->geometries).items[uVar120].ptr;
  uVar127 = (ulong)*(uint *)(*(long *)&pGVar25->field_0x58 +
                            (ulong)*(uint *)(local_8b0 + lVar130 * 4 + 6) *
                            pGVar25[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar234 = (pGVar25->time_range).lower;
  fVar234 = pGVar25->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar234) / ((pGVar25->time_range).upper - fVar234));
  auVar175 = vroundss_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),9);
  auVar175 = vminss_avx(auVar175,ZEXT416((uint)(pGVar25->fnumTimeSegments + -1.0)));
  auVar175 = vmaxss_avx(ZEXT816(0) << 0x20,auVar175);
  fVar234 = fVar234 - auVar175._0_4_;
  _Var26 = pGVar25[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar129 = (long)(int)auVar175._0_4_ * 0x38;
  lVar27 = *(long *)(_Var26 + 0x10 + lVar129);
  lVar128 = *(long *)(_Var26 + 0x38 + lVar129);
  lVar28 = *(long *)(_Var26 + 0x48 + lVar129);
  auVar175 = vshufps_avx(ZEXT416((uint)fVar234),ZEXT416((uint)fVar234),0);
  pfVar1 = (float *)(lVar128 + uVar127 * lVar28);
  fVar169 = auVar175._0_4_;
  fVar256 = auVar175._4_4_;
  fVar198 = auVar175._8_4_;
  fVar257 = auVar175._12_4_;
  pfVar2 = (float *)(lVar128 + (uVar127 + 1) * lVar28);
  pfVar3 = (float *)(lVar128 + (uVar127 + 2) * lVar28);
  pfVar4 = (float *)(lVar128 + lVar28 * (uVar127 + 3));
  lVar128 = *(long *)(_Var26 + lVar129);
  auVar175 = vshufps_avx(ZEXT416((uint)(1.0 - fVar234)),ZEXT416((uint)(1.0 - fVar234)),0);
  pfVar5 = (float *)(lVar128 + lVar27 * uVar127);
  fVar171 = auVar175._0_4_;
  fVar255 = auVar175._4_4_;
  fVar163 = auVar175._8_4_;
  fVar233 = auVar175._12_4_;
  pfVar6 = (float *)(lVar128 + lVar27 * (uVar127 + 1));
  pfVar7 = (float *)(lVar128 + lVar27 * (uVar127 + 2));
  auVar202._0_4_ = fVar169 * *pfVar1 + fVar171 * *pfVar5;
  auVar202._4_4_ = fVar256 * pfVar1[1] + fVar255 * pfVar5[1];
  auVar202._8_4_ = fVar198 * pfVar1[2] + fVar163 * pfVar5[2];
  auVar202._12_4_ = fVar257 * pfVar1[3] + fVar233 * pfVar5[3];
  auVar174._0_4_ = fVar171 * *pfVar6 + fVar169 * *pfVar2;
  auVar174._4_4_ = fVar255 * pfVar6[1] + fVar256 * pfVar2[1];
  auVar174._8_4_ = fVar163 * pfVar6[2] + fVar198 * pfVar2[2];
  auVar174._12_4_ = fVar233 * pfVar6[3] + fVar257 * pfVar2[3];
  pfVar1 = (float *)(lVar128 + lVar27 * (uVar127 + 3));
  auVar236._0_4_ = fVar171 * *pfVar7 + fVar169 * *pfVar3;
  auVar236._4_4_ = fVar255 * pfVar7[1] + fVar256 * pfVar3[1];
  auVar236._8_4_ = fVar163 * pfVar7[2] + fVar198 * pfVar3[2];
  auVar236._12_4_ = fVar233 * pfVar7[3] + fVar257 * pfVar3[3];
  auVar175 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar35 = vinsertps_avx(auVar175,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar234 = *(float *)(ray + k * 4 + 0x40);
  auVar423._4_4_ = fVar234;
  auVar423._0_4_ = fVar234;
  auVar423._8_4_ = fVar234;
  auVar423._12_4_ = fVar234;
  fStack_a10 = fVar234;
  _local_a20 = auVar423;
  fStack_a0c = fVar234;
  fStack_a08 = fVar234;
  fStack_a04 = fVar234;
  auVar431 = ZEXT3264(_local_a20);
  auVar279._0_4_ = fVar171 * *pfVar1 + fVar169 * *pfVar4;
  auVar279._4_4_ = fVar255 * pfVar1[1] + fVar256 * pfVar4[1];
  auVar279._8_4_ = fVar163 * pfVar1[2] + fVar198 * pfVar4[2];
  auVar279._12_4_ = fVar233 * pfVar1[3] + fVar257 * pfVar4[3];
  fVar171 = *(float *)(ray + k * 4 + 0x50);
  auVar434._4_4_ = fVar171;
  auVar434._0_4_ = fVar171;
  auVar434._8_4_ = fVar171;
  auVar434._12_4_ = fVar171;
  fStack_9f0 = fVar171;
  _local_a00 = auVar434;
  fStack_9ec = fVar171;
  fStack_9e8 = fVar171;
  fStack_9e4 = fVar171;
  auVar440 = ZEXT3264(_local_a00);
  auVar175 = vunpcklps_avx(auVar423,auVar434);
  fVar255 = *(float *)(ray + k * 4 + 0x60);
  auVar449._4_4_ = fVar255;
  auVar449._0_4_ = fVar255;
  auVar449._8_4_ = fVar255;
  auVar449._12_4_ = fVar255;
  fStack_7f0 = fVar255;
  _local_800 = auVar449;
  fStack_7ec = fVar255;
  fStack_7e8 = fVar255;
  fStack_7e4 = fVar255;
  _local_9b0 = vinsertps_avx(auVar175,auVar449,0x28);
  auVar401 = ZEXT1664(_local_9b0);
  auVar135._0_4_ = (auVar202._0_4_ + auVar174._0_4_ + auVar236._0_4_ + auVar279._0_4_) * 0.25;
  auVar135._4_4_ = (auVar202._4_4_ + auVar174._4_4_ + auVar236._4_4_ + auVar279._4_4_) * 0.25;
  auVar135._8_4_ = (auVar202._8_4_ + auVar174._8_4_ + auVar236._8_4_ + auVar279._8_4_) * 0.25;
  auVar135._12_4_ = (auVar202._12_4_ + auVar174._12_4_ + auVar236._12_4_ + auVar279._12_4_) * 0.25;
  auVar175 = vsubps_avx(auVar135,auVar35);
  auVar175 = vdpps_avx(auVar175,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar415 = ZEXT1664(local_9c0);
  auVar52 = vrcpss_avx(local_9c0,local_9c0);
  fVar198 = auVar175._0_4_ * auVar52._0_4_ * (2.0 - local_9c0._0_4_ * auVar52._0_4_);
  auVar347 = ZEXT464((uint)fVar198);
  auVar52 = vshufps_avx(ZEXT416((uint)fVar198),ZEXT416((uint)fVar198),0);
  fVar163 = auVar52._0_4_;
  fVar233 = auVar52._4_4_;
  fVar169 = auVar52._8_4_;
  fVar256 = auVar52._12_4_;
  auVar262._0_4_ = auVar35._0_4_ + local_9b0._0_4_ * fVar163;
  auVar262._4_4_ = auVar35._4_4_ + local_9b0._4_4_ * fVar233;
  auVar262._8_4_ = auVar35._8_4_ + local_9b0._8_4_ * fVar169;
  auVar262._12_4_ = auVar35._12_4_ + local_9b0._12_4_ * fVar256;
  auVar175 = vblendps_avx(auVar262,_DAT_01f7aa10,8);
  auVar11 = vsubps_avx(auVar202,auVar175);
  auVar314 = ZEXT1664(auVar11);
  auVar53 = vsubps_avx(auVar236,auVar175);
  auVar12 = vsubps_avx(auVar174,auVar175);
  auVar13 = vsubps_avx(auVar279,auVar175);
  auVar175 = vshufps_avx(auVar11,auVar11,0);
  register0x00001250 = auVar175;
  _local_1e0 = auVar175;
  auVar175 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001250 = auVar175;
  _local_200 = auVar175;
  auVar175 = vshufps_avx(auVar11,auVar11,0xaa);
  register0x00001250 = auVar175;
  _local_220 = auVar175;
  auVar175 = vshufps_avx(auVar11,auVar11,0xff);
  register0x00001290 = auVar175;
  _local_240 = auVar175;
  auVar175 = vshufps_avx(auVar12,auVar12,0);
  register0x00001290 = auVar175;
  _local_260 = auVar175;
  auVar175 = vshufps_avx(auVar12,auVar12,0x55);
  register0x00001290 = auVar175;
  _local_280 = auVar175;
  auVar175 = vshufps_avx(auVar12,auVar12,0xaa);
  register0x00001290 = auVar175;
  _local_400 = auVar175;
  auVar175 = vshufps_avx(auVar12,auVar12,0xff);
  register0x00001290 = auVar175;
  _local_2a0 = auVar175;
  auVar175 = vshufps_avx(auVar53,auVar53,0);
  register0x00001290 = auVar175;
  _local_420 = auVar175;
  auVar175 = vshufps_avx(auVar53,auVar53,0x55);
  register0x00001290 = auVar175;
  _local_440 = auVar175;
  auVar175 = vshufps_avx(auVar53,auVar53,0xaa);
  register0x00001290 = auVar175;
  _local_460 = auVar175;
  auVar175 = vshufps_avx(auVar53,auVar53,0xff);
  register0x00001290 = auVar175;
  _local_480 = auVar175;
  auVar175 = vshufps_avx(auVar13,auVar13,0);
  register0x00001290 = auVar175;
  _local_4a0 = auVar175;
  auVar175 = vshufps_avx(auVar13,auVar13,0x55);
  register0x00001290 = auVar175;
  _local_4c0 = auVar175;
  auVar175 = vshufps_avx(auVar13,auVar13,0xaa);
  register0x00001290 = auVar175;
  _local_4e0 = auVar175;
  auVar175 = vshufps_avx(auVar13,auVar13,0xff);
  local_500._16_16_ = auVar175;
  local_500._0_16_ = auVar175;
  auVar175 = ZEXT416((uint)(fVar234 * fVar234 + fVar171 * fVar171 + fVar255 * fVar255));
  auVar175 = vshufps_avx(auVar175,auVar175,0);
  local_2c0._16_16_ = auVar175;
  local_2c0._0_16_ = auVar175;
  auVar291 = ZEXT3264(local_2c0);
  fVar234 = *(float *)(ray + k * 4 + 0x30);
  local_8d0 = ZEXT416((uint)fVar198);
  auVar175 = vshufps_avx(ZEXT416((uint)(fVar234 - fVar198)),ZEXT416((uint)(fVar234 - fVar198)),0);
  local_2e0._16_16_ = auVar175;
  local_2e0._0_16_ = auVar175;
  local_770 = vpshufd_avx(ZEXT416(uVar120),0);
  local_780 = vpshufd_avx(ZEXT416(*(uint *)(local_8b0 + lVar130 * 4 + 6)),0);
  uVar127 = 0;
  bVar131 = false;
  local_be8 = 1;
  auVar151._8_4_ = 0x7fffffff;
  auVar151._0_8_ = 0x7fffffff7fffffff;
  auVar151._12_4_ = 0x7fffffff;
  auVar151._16_4_ = 0x7fffffff;
  auVar151._20_4_ = 0x7fffffff;
  auVar151._24_4_ = 0x7fffffff;
  auVar151._28_4_ = 0x7fffffff;
  local_540 = vandps_avx(local_2c0,auVar151);
  auVar175 = vsqrtss_avx(local_9c0,local_9c0);
  auVar35 = vsqrtss_avx(local_9c0,local_9c0);
  local_5b0 = ZEXT816(0x3f80000000000000);
  do {
    auVar267._8_4_ = 0x3f800000;
    auVar267._0_8_ = 0x3f8000003f800000;
    auVar267._12_4_ = 0x3f800000;
    auVar267._16_4_ = 0x3f800000;
    auVar267._20_4_ = 0x3f800000;
    auVar267._24_4_ = 0x3f800000;
    auVar267._28_4_ = 0x3f800000;
    iVar126 = (int)uVar127;
    auVar213 = vmovshdup_avx(local_5b0);
    auVar143 = vsubps_avx(auVar213,local_5b0);
    auVar213 = vshufps_avx(local_5b0,local_5b0,0);
    local_7e0._16_16_ = auVar213;
    local_7e0._0_16_ = auVar213;
    auVar209 = vshufps_avx(auVar143,auVar143,0);
    fVar170 = auVar209._0_4_;
    fVar196 = auVar209._4_4_;
    fVar197 = auVar209._8_4_;
    fVar199 = auVar209._12_4_;
    fVar200 = auVar213._0_4_;
    auVar251._0_4_ = fVar200 + fVar170 * 0.0;
    fVar230 = auVar213._4_4_;
    auVar251._4_4_ = fVar230 + fVar196 * 0.14285715;
    fVar231 = auVar213._8_4_;
    auVar251._8_4_ = fVar231 + fVar197 * 0.2857143;
    fVar232 = auVar213._12_4_;
    auVar251._12_4_ = fVar232 + fVar199 * 0.42857146;
    auVar251._16_4_ = fVar200 + fVar170 * 0.5714286;
    auVar251._20_4_ = fVar230 + fVar196 * 0.71428573;
    auVar251._24_4_ = fVar231 + fVar197 * 0.8571429;
    auVar251._28_4_ = fVar232 + fVar199;
    auVar147 = vsubps_avx(auVar267,auVar251);
    fVar171 = auVar147._0_4_;
    fVar255 = auVar147._4_4_;
    fVar198 = auVar147._8_4_;
    fVar257 = auVar147._12_4_;
    fVar258 = auVar147._16_4_;
    fVar259 = auVar147._20_4_;
    fVar260 = auVar147._24_4_;
    fVar273 = fVar171 * fVar171 * fVar171;
    fVar294 = fVar255 * fVar255 * fVar255;
    fVar296 = fVar198 * fVar198 * fVar198;
    fVar319 = fVar257 * fVar257 * fVar257;
    fVar323 = fVar258 * fVar258 * fVar258;
    fVar327 = fVar259 * fVar259 * fVar259;
    fVar331 = fVar260 * fVar260 * fVar260;
    fVar336 = auVar251._0_4_ * auVar251._0_4_ * auVar251._0_4_;
    fVar348 = auVar251._4_4_ * auVar251._4_4_ * auVar251._4_4_;
    fVar349 = auVar251._8_4_ * auVar251._8_4_ * auVar251._8_4_;
    fVar351 = auVar251._12_4_ * auVar251._12_4_ * auVar251._12_4_;
    fVar353 = auVar251._16_4_ * auVar251._16_4_ * auVar251._16_4_;
    fVar355 = auVar251._20_4_ * auVar251._20_4_ * auVar251._20_4_;
    fVar357 = auVar251._24_4_ * auVar251._24_4_ * auVar251._24_4_;
    fVar271 = auVar251._0_4_ * fVar171;
    fVar272 = auVar251._4_4_ * fVar255;
    fVar274 = auVar251._8_4_ * fVar198;
    fVar276 = auVar251._12_4_ * fVar257;
    fVar277 = auVar251._16_4_ * fVar258;
    fVar292 = auVar251._20_4_ * fVar259;
    fVar293 = auVar251._24_4_ * fVar260;
    fVar275 = auVar415._28_4_ + auVar440._28_4_;
    fVar391 = auVar347._28_4_ + auVar291._28_4_ + fVar275;
    fVar405 = fVar275 + auVar314._28_4_ + auVar431._28_4_ + auVar401._28_4_;
    fVar275 = fVar273 * 0.16666667;
    fVar295 = fVar294 * 0.16666667;
    fVar298 = fVar296 * 0.16666667;
    fVar320 = fVar319 * 0.16666667;
    fVar324 = fVar323 * 0.16666667;
    fVar328 = fVar327 * 0.16666667;
    fVar332 = fVar331 * 0.16666667;
    fVar359 = (fVar336 + fVar273 * 4.0 + fVar171 * fVar271 * 12.0 + auVar251._0_4_ * fVar271 * 6.0)
              * 0.16666667;
    fVar373 = (fVar348 + fVar294 * 4.0 + fVar255 * fVar272 * 12.0 + auVar251._4_4_ * fVar272 * 6.0)
              * 0.16666667;
    fVar376 = (fVar349 + fVar296 * 4.0 + fVar198 * fVar274 * 12.0 + auVar251._8_4_ * fVar274 * 6.0)
              * 0.16666667;
    fVar379 = (fVar351 + fVar319 * 4.0 + fVar257 * fVar276 * 12.0 + auVar251._12_4_ * fVar276 * 6.0)
              * 0.16666667;
    fVar382 = (fVar353 + fVar323 * 4.0 + fVar258 * fVar277 * 12.0 + auVar251._16_4_ * fVar277 * 6.0)
              * 0.16666667;
    fVar385 = (fVar355 + fVar327 * 4.0 + fVar259 * fVar292 * 12.0 + auVar251._20_4_ * fVar292 * 6.0)
              * 0.16666667;
    fVar388 = (fVar357 + fVar331 * 4.0 + fVar260 * fVar293 * 12.0 + auVar251._24_4_ * fVar293 * 6.0)
              * 0.16666667;
    fVar273 = (fVar336 * 4.0 + fVar273 + auVar251._0_4_ * fVar271 * 12.0 + fVar171 * fVar271 * 6.0)
              * 0.16666667;
    fVar294 = (fVar348 * 4.0 + fVar294 + auVar251._4_4_ * fVar272 * 12.0 + fVar255 * fVar272 * 6.0)
              * 0.16666667;
    fVar296 = (fVar349 * 4.0 + fVar296 + auVar251._8_4_ * fVar274 * 12.0 + fVar198 * fVar274 * 6.0)
              * 0.16666667;
    fVar319 = (fVar351 * 4.0 + fVar319 + auVar251._12_4_ * fVar276 * 12.0 + fVar257 * fVar276 * 6.0)
              * 0.16666667;
    fVar323 = (fVar353 * 4.0 + fVar323 + auVar251._16_4_ * fVar277 * 12.0 + fVar258 * fVar277 * 6.0)
              * 0.16666667;
    fVar327 = (fVar355 * 4.0 + fVar327 + auVar251._20_4_ * fVar292 * 12.0 + fVar259 * fVar292 * 6.0)
              * 0.16666667;
    fVar331 = (fVar357 * 4.0 + fVar331 + auVar251._24_4_ * fVar293 * 12.0 + fVar260 * fVar293 * 6.0)
              * 0.16666667;
    fVar336 = fVar336 * 0.16666667;
    fVar348 = fVar348 * 0.16666667;
    fVar349 = fVar349 * 0.16666667;
    fVar351 = fVar351 * 0.16666667;
    fVar353 = fVar353 * 0.16666667;
    fVar355 = fVar355 * 0.16666667;
    fVar357 = fVar357 * 0.16666667;
    fVar432 = auVar431._28_4_ + 12.0;
    fVar406 = fVar405 + 12.166667;
    fVar360 = (float)local_1e0._0_4_ * fVar275 +
              (float)local_260._0_4_ * fVar359 +
              fVar336 * (float)local_4a0._0_4_ + fVar273 * (float)local_420._0_4_;
    fVar374 = (float)local_1e0._4_4_ * fVar295 +
              (float)local_260._4_4_ * fVar373 +
              fVar348 * (float)local_4a0._4_4_ + fVar294 * (float)local_420._4_4_;
    fVar377 = fStack_1d8 * fVar298 +
              fStack_258 * fVar376 + fVar349 * fStack_498 + fVar296 * fStack_418;
    fVar380 = fStack_1d4 * fVar320 +
              fStack_254 * fVar379 + fVar351 * fStack_494 + fVar319 * fStack_414;
    fVar383 = fStack_1d0 * fVar324 +
              fStack_250 * fVar382 + fVar353 * fStack_490 + fVar323 * fStack_410;
    fVar386 = fStack_1cc * fVar328 +
              fStack_24c * fVar385 + fVar355 * fStack_48c + fVar327 * fStack_40c;
    fVar389 = fStack_1c8 * fVar332 +
              fStack_248 * fVar388 + fVar357 * fStack_488 + fVar331 * fStack_408;
    fVar392 = fVar391 + fVar406;
    fVar361 = (float)local_200._0_4_ * fVar275 +
              (float)local_280._0_4_ * fVar359 +
              fVar336 * (float)local_4c0._0_4_ + fVar273 * (float)local_440._0_4_;
    fVar375 = (float)local_200._4_4_ * fVar295 +
              (float)local_280._4_4_ * fVar373 +
              fVar348 * (float)local_4c0._4_4_ + fVar294 * (float)local_440._4_4_;
    fVar378 = fStack_1f8 * fVar298 +
              fStack_278 * fVar376 + fVar349 * fStack_4b8 + fVar296 * fStack_438;
    fVar381 = fStack_1f4 * fVar320 +
              fStack_274 * fVar379 + fVar351 * fStack_4b4 + fVar319 * fStack_434;
    fVar384 = fStack_1f0 * fVar324 +
              fStack_270 * fVar382 + fVar353 * fStack_4b0 + fVar323 * fStack_430;
    fVar387 = fStack_1ec * fVar328 +
              fStack_26c * fVar385 + fVar355 * fStack_4ac + fVar327 * fStack_42c;
    fVar390 = fStack_1e8 * fVar332 +
              fStack_268 * fVar388 + fVar357 * fStack_4a8 + fVar331 * fStack_428;
    fVar393 = fVar392 + fVar432 + 12.166667;
    local_940 = (float)local_220._0_4_ * fVar275 +
                fVar359 * (float)local_400._0_4_ +
                fVar336 * (float)local_4e0._0_4_ + fVar273 * (float)local_460._0_4_;
    fStack_93c = (float)local_220._4_4_ * fVar295 +
                 fVar373 * (float)local_400._4_4_ +
                 fVar348 * (float)local_4e0._4_4_ + fVar294 * (float)local_460._4_4_;
    fStack_938 = fStack_218 * fVar298 +
                 fVar376 * fStack_3f8 + fVar349 * fStack_4d8 + fVar296 * fStack_458;
    fStack_934 = fStack_214 * fVar320 +
                 fVar379 * fStack_3f4 + fVar351 * fStack_4d4 + fVar319 * fStack_454;
    fStack_930 = fStack_210 * fVar324 +
                 fVar382 * fStack_3f0 + fVar353 * fStack_4d0 + fVar323 * fStack_450;
    fStack_92c = fStack_20c * fVar328 +
                 fVar385 * fStack_3ec + fVar355 * fStack_4cc + fVar327 * fStack_44c;
    fStack_928 = fStack_208 * fVar332 +
                 fVar388 * fStack_3e8 + fVar357 * fStack_4c8 + fVar331 * fStack_448;
    fStack_924 = fVar393 + fVar432 + auVar440._28_4_ + 12.0;
    local_a80._0_4_ =
         (float)local_240._0_4_ * fVar275 +
         (float)local_2a0._0_4_ * fVar359 +
         fVar273 * (float)local_480._0_4_ + local_500._0_4_ * fVar336;
    local_a80._4_4_ =
         (float)local_240._4_4_ * fVar295 +
         (float)local_2a0._4_4_ * fVar373 +
         fVar294 * (float)local_480._4_4_ + local_500._4_4_ * fVar348;
    fStack_a78 = fStack_238 * fVar298 +
                 fStack_298 * fVar376 + fVar296 * fStack_478 + local_500._8_4_ * fVar349;
    fStack_a74 = fStack_234 * fVar320 +
                 fStack_294 * fVar379 + fVar319 * fStack_474 + local_500._12_4_ * fVar351;
    fStack_a70 = fStack_230 * fVar324 +
                 fStack_290 * fVar382 + fVar323 * fStack_470 + local_500._16_4_ * fVar353;
    fStack_a6c = fStack_22c * fVar328 +
                 fStack_28c * fVar385 + fVar327 * fStack_46c + local_500._20_4_ * fVar355;
    fStack_a68 = fStack_228 * fVar332 +
                 fStack_288 * fVar388 + fVar331 * fStack_468 + local_500._24_4_ * fVar357;
    fStack_a64 = auVar314._28_4_ + fVar391 + fVar405 + auVar347._28_4_;
    auVar55._4_4_ = auVar251._4_4_ * -auVar251._4_4_;
    auVar55._0_4_ = auVar251._0_4_ * -auVar251._0_4_;
    auVar55._8_4_ = auVar251._8_4_ * -auVar251._8_4_;
    auVar55._12_4_ = auVar251._12_4_ * -auVar251._12_4_;
    auVar55._16_4_ = auVar251._16_4_ * -auVar251._16_4_;
    auVar55._20_4_ = auVar251._20_4_ * -auVar251._20_4_;
    auVar55._24_4_ = auVar251._24_4_ * -auVar251._24_4_;
    auVar55._28_4_ = auVar251._28_4_;
    auVar56._4_4_ = fVar272 * 4.0;
    auVar56._0_4_ = fVar271 * 4.0;
    auVar56._8_4_ = fVar274 * 4.0;
    auVar56._12_4_ = fVar276 * 4.0;
    auVar56._16_4_ = fVar277 * 4.0;
    auVar56._20_4_ = fVar292 * 4.0;
    auVar56._24_4_ = fVar293 * 4.0;
    auVar56._28_4_ = auVar291._28_4_;
    auVar147 = vsubps_avx(auVar55,auVar56);
    fVar328 = fVar171 * -fVar171 * 0.5;
    fVar331 = fVar255 * -fVar255 * 0.5;
    fVar332 = fVar198 * -fVar198 * 0.5;
    fVar336 = fVar257 * -fVar257 * 0.5;
    fVar348 = fVar258 * -fVar258 * 0.5;
    fVar349 = fVar259 * -fVar259 * 0.5;
    fVar351 = fVar260 * -fVar260 * 0.5;
    fVar294 = auVar147._0_4_ * 0.5;
    fVar296 = auVar147._4_4_ * 0.5;
    fVar319 = auVar147._8_4_ * 0.5;
    fVar320 = auVar147._12_4_ * 0.5;
    fVar323 = auVar147._16_4_ * 0.5;
    fVar324 = auVar147._20_4_ * 0.5;
    fVar327 = auVar147._24_4_ * 0.5;
    fVar271 = (fVar171 * fVar171 + fVar271 * 4.0) * 0.5;
    fVar273 = (fVar255 * fVar255 + fVar272 * 4.0) * 0.5;
    fVar275 = (fVar198 * fVar198 + fVar274 * 4.0) * 0.5;
    fVar276 = (fVar257 * fVar257 + fVar276 * 4.0) * 0.5;
    fVar277 = (fVar258 * fVar258 + fVar277 * 4.0) * 0.5;
    fVar292 = (fVar259 * fVar259 + fVar292 * 4.0) * 0.5;
    fVar298 = (fVar260 * fVar260 + fVar293 * 4.0) * 0.5;
    fVar171 = auVar251._0_4_ * auVar251._0_4_ * 0.5;
    fVar255 = auVar251._4_4_ * auVar251._4_4_ * 0.5;
    fVar198 = auVar251._8_4_ * auVar251._8_4_ * 0.5;
    fVar257 = auVar251._12_4_ * auVar251._12_4_ * 0.5;
    fVar258 = auVar251._16_4_ * auVar251._16_4_ * 0.5;
    fVar259 = auVar251._20_4_ * auVar251._20_4_ * 0.5;
    fVar274 = auVar251._24_4_ * auVar251._24_4_ * 0.5;
    fVar335 = fVar393 + fVar406 + fVar406 + 4.0;
    auVar213 = vpermilps_avx(ZEXT416((uint)(auVar143._0_4_ * 0.04761905)),0);
    fVar260 = auVar213._0_4_;
    fVar300 = fVar260 * ((float)local_1e0._0_4_ * fVar328 +
                        (float)local_260._0_4_ * fVar294 +
                        fVar271 * (float)local_420._0_4_ + fVar171 * (float)local_4a0._0_4_);
    fVar272 = auVar213._4_4_;
    fVar315 = fVar272 * ((float)local_1e0._4_4_ * fVar331 +
                        (float)local_260._4_4_ * fVar296 +
                        fVar273 * (float)local_420._4_4_ + fVar255 * (float)local_4a0._4_4_);
    auVar57._4_4_ = fVar315;
    auVar57._0_4_ = fVar300;
    fVar293 = auVar213._8_4_;
    fVar317 = fVar293 * (fStack_1d8 * fVar332 +
                        fStack_258 * fVar319 + fVar275 * fStack_418 + fVar198 * fStack_498);
    auVar57._8_4_ = fVar317;
    fVar295 = auVar213._12_4_;
    fVar321 = fVar295 * (fStack_1d4 * fVar336 +
                        fStack_254 * fVar320 + fVar276 * fStack_414 + fVar257 * fStack_494);
    auVar57._12_4_ = fVar321;
    fVar325 = fVar260 * (fStack_1d0 * fVar348 +
                        fStack_250 * fVar323 + fVar277 * fStack_410 + fVar258 * fStack_490);
    auVar57._16_4_ = fVar325;
    fVar329 = fVar272 * (fStack_1cc * fVar349 +
                        fStack_24c * fVar324 + fVar292 * fStack_40c + fVar259 * fStack_48c);
    auVar57._20_4_ = fVar329;
    fVar333 = fVar293 * (fStack_1c8 * fVar351 +
                        fStack_248 * fVar327 + fVar298 * fStack_408 + fVar274 * fStack_488);
    auVar57._24_4_ = fVar333;
    auVar57._28_4_ = fVar335;
    fVar433 = fVar260 * ((float)local_200._0_4_ * fVar328 +
                        (float)local_280._0_4_ * fVar294 +
                        fVar271 * (float)local_440._0_4_ + fVar171 * (float)local_4c0._0_4_);
    fVar441 = fVar272 * ((float)local_200._4_4_ * fVar331 +
                        (float)local_280._4_4_ * fVar296 +
                        fVar273 * (float)local_440._4_4_ + fVar255 * (float)local_4c0._4_4_);
    auVar58._4_4_ = fVar441;
    auVar58._0_4_ = fVar433;
    fVar442 = fVar293 * (fStack_1f8 * fVar332 +
                        fStack_278 * fVar319 + fVar275 * fStack_438 + fVar198 * fStack_4b8);
    auVar58._8_4_ = fVar442;
    fVar443 = fVar295 * (fStack_1f4 * fVar336 +
                        fStack_274 * fVar320 + fVar276 * fStack_434 + fVar257 * fStack_4b4);
    auVar58._12_4_ = fVar443;
    fVar444 = fVar260 * (fStack_1f0 * fVar348 +
                        fStack_270 * fVar323 + fVar277 * fStack_430 + fVar258 * fStack_4b0);
    auVar58._16_4_ = fVar444;
    fVar445 = fVar272 * (fStack_1ec * fVar349 +
                        fStack_26c * fVar324 + fVar292 * fStack_42c + fVar259 * fStack_4ac);
    auVar58._20_4_ = fVar445;
    fVar446 = fVar293 * (fStack_1e8 * fVar351 +
                        fStack_268 * fVar327 + fVar298 * fStack_428 + fVar274 * fStack_4a8);
    auVar58._24_4_ = fVar446;
    auVar58._28_4_ = uStack_1c4;
    fVar447 = fVar260 * ((float)local_220._0_4_ * fVar328 +
                        fVar171 * (float)local_4e0._0_4_ + fVar271 * (float)local_460._0_4_ +
                        fVar294 * (float)local_400._0_4_);
    fVar454 = fVar272 * ((float)local_220._4_4_ * fVar331 +
                        fVar255 * (float)local_4e0._4_4_ + fVar273 * (float)local_460._4_4_ +
                        fVar296 * (float)local_400._4_4_);
    auVar59._4_4_ = fVar454;
    auVar59._0_4_ = fVar447;
    fVar456 = fVar293 * (fStack_218 * fVar332 +
                        fVar198 * fStack_4d8 + fVar275 * fStack_458 + fVar319 * fStack_3f8);
    auVar59._8_4_ = fVar456;
    fVar458 = fVar295 * (fStack_214 * fVar336 +
                        fVar257 * fStack_4d4 + fVar276 * fStack_454 + fVar320 * fStack_3f4);
    auVar59._12_4_ = fVar458;
    fVar460 = fVar260 * (fStack_210 * fVar348 +
                        fVar258 * fStack_4d0 + fVar277 * fStack_450 + fVar323 * fStack_3f0);
    auVar59._16_4_ = fVar460;
    fVar462 = fVar272 * (fStack_20c * fVar349 +
                        fVar259 * fStack_4cc + fVar292 * fStack_44c + fVar324 * fStack_3ec);
    auVar59._20_4_ = fVar462;
    fVar464 = fVar293 * (fStack_208 * fVar351 +
                        fVar274 * fStack_4c8 + fVar298 * fStack_448 + fVar327 * fStack_3e8);
    auVar59._24_4_ = fVar464;
    auVar59._28_4_ = uStack_1e4;
    fVar271 = fVar260 * ((float)local_240._0_4_ * fVar328 +
                        (float)local_2a0._0_4_ * fVar294 +
                        fVar171 * local_500._0_4_ + fVar271 * (float)local_480._0_4_);
    fVar273 = fVar272 * ((float)local_240._4_4_ * fVar331 +
                        (float)local_2a0._4_4_ * fVar296 +
                        fVar255 * local_500._4_4_ + fVar273 * (float)local_480._4_4_);
    auVar60._4_4_ = fVar273;
    auVar60._0_4_ = fVar271;
    fVar294 = fVar293 * (fStack_238 * fVar332 +
                        fStack_298 * fVar319 + fVar198 * local_500._8_4_ + fVar275 * fStack_478);
    auVar60._8_4_ = fVar294;
    fVar296 = fVar295 * (fStack_234 * fVar336 +
                        fStack_294 * fVar320 + fVar257 * local_500._12_4_ + fVar276 * fStack_474);
    auVar60._12_4_ = fVar296;
    fVar260 = fVar260 * (fStack_230 * fVar348 +
                        fStack_290 * fVar323 + fVar258 * local_500._16_4_ + fVar277 * fStack_470);
    auVar60._16_4_ = fVar260;
    fVar272 = fVar272 * (fStack_22c * fVar349 +
                        fStack_28c * fVar324 + fVar259 * local_500._20_4_ + fVar292 * fStack_46c);
    auVar60._20_4_ = fVar272;
    fVar293 = fVar293 * (fStack_228 * fVar351 +
                        fStack_288 * fVar327 + fVar274 * local_500._24_4_ + fVar298 * fStack_468);
    auVar60._24_4_ = fVar293;
    auVar60._28_4_ = fVar295;
    auVar111._4_4_ = fVar375;
    auVar111._0_4_ = fVar361;
    auVar111._8_4_ = fVar378;
    auVar111._12_4_ = fVar381;
    auVar111._16_4_ = fVar384;
    auVar111._20_4_ = fVar387;
    auVar111._24_4_ = fVar390;
    auVar111._28_4_ = fVar393;
    auVar147 = vperm2f128_avx(auVar111,auVar111,1);
    auVar147 = vshufps_avx(auVar147,auVar111,0x30);
    local_960 = vshufps_avx(auVar111,auVar147,0x29);
    auVar117._4_4_ = fStack_93c;
    auVar117._0_4_ = local_940;
    auVar117._8_4_ = fStack_938;
    auVar117._12_4_ = fStack_934;
    auVar117._16_4_ = fStack_930;
    auVar117._20_4_ = fStack_92c;
    auVar117._24_4_ = fStack_928;
    auVar117._28_4_ = fStack_924;
    auVar147 = vperm2f128_avx(auVar117,auVar117,1);
    auVar147 = vshufps_avx(auVar147,auVar117,0x30);
    auVar31 = vshufps_avx(auVar117,auVar147,0x29);
    auVar195 = vsubps_avx(_local_a80,auVar60);
    auVar147 = vperm2f128_avx(auVar195,auVar195,1);
    auVar147 = vshufps_avx(auVar147,auVar195,0x30);
    auVar32 = vshufps_avx(auVar195,auVar147,0x29);
    auVar30 = vsubps_avx(local_960,auVar111);
    auVar33 = vsubps_avx(auVar31,auVar117);
    fVar255 = auVar30._0_4_;
    fVar274 = auVar30._4_4_;
    auVar61._4_4_ = fVar454 * fVar274;
    auVar61._0_4_ = fVar447 * fVar255;
    fVar298 = auVar30._8_4_;
    auVar61._8_4_ = fVar456 * fVar298;
    fVar336 = auVar30._12_4_;
    auVar61._12_4_ = fVar458 * fVar336;
    fVar376 = auVar30._16_4_;
    auVar61._16_4_ = fVar460 * fVar376;
    fVar36 = auVar30._20_4_;
    auVar61._20_4_ = fVar462 * fVar36;
    fVar44 = auVar30._24_4_;
    auVar61._24_4_ = fVar464 * fVar44;
    auVar61._28_4_ = auVar195._28_4_;
    fVar198 = auVar33._0_4_;
    fVar275 = auVar33._4_4_;
    auVar62._4_4_ = fVar441 * fVar275;
    auVar62._0_4_ = fVar433 * fVar198;
    fVar319 = auVar33._8_4_;
    auVar62._8_4_ = fVar442 * fVar319;
    fVar348 = auVar33._12_4_;
    auVar62._12_4_ = fVar443 * fVar348;
    fVar379 = auVar33._16_4_;
    auVar62._16_4_ = fVar444 * fVar379;
    fVar37 = auVar33._20_4_;
    auVar62._20_4_ = fVar445 * fVar37;
    fVar45 = auVar33._24_4_;
    auVar62._24_4_ = fVar446 * fVar45;
    auVar62._28_4_ = auVar147._28_4_;
    auVar30 = vsubps_avx(auVar62,auVar61);
    auVar113._4_4_ = fVar374;
    auVar113._0_4_ = fVar360;
    auVar113._8_4_ = fVar377;
    auVar113._12_4_ = fVar380;
    auVar113._16_4_ = fVar383;
    auVar113._20_4_ = fVar386;
    auVar113._24_4_ = fVar389;
    auVar113._28_4_ = fVar392;
    auVar147 = vperm2f128_avx(auVar113,auVar113,1);
    auVar147 = vshufps_avx(auVar147,auVar113,0x30);
    auVar400 = vshufps_avx(auVar113,auVar147,0x29);
    auVar34 = vsubps_avx(auVar400,auVar113);
    auVar63._4_4_ = fVar275 * fVar315;
    auVar63._0_4_ = fVar198 * fVar300;
    auVar63._8_4_ = fVar319 * fVar317;
    auVar63._12_4_ = fVar348 * fVar321;
    auVar63._16_4_ = fVar379 * fVar325;
    auVar63._20_4_ = fVar37 * fVar329;
    auVar63._24_4_ = fVar45 * fVar333;
    auVar63._28_4_ = auVar400._28_4_;
    fVar257 = auVar34._0_4_;
    fVar276 = auVar34._4_4_;
    auVar64._4_4_ = fVar454 * fVar276;
    auVar64._0_4_ = fVar447 * fVar257;
    fVar320 = auVar34._8_4_;
    auVar64._8_4_ = fVar456 * fVar320;
    fVar349 = auVar34._12_4_;
    auVar64._12_4_ = fVar458 * fVar349;
    fVar382 = auVar34._16_4_;
    auVar64._16_4_ = fVar460 * fVar382;
    fVar38 = auVar34._20_4_;
    auVar64._20_4_ = fVar462 * fVar38;
    fVar46 = auVar34._24_4_;
    auVar64._24_4_ = fVar464 * fVar46;
    auVar64._28_4_ = fVar392;
    auVar221 = vsubps_avx(auVar64,auVar63);
    auVar65._4_4_ = fVar441 * fVar276;
    auVar65._0_4_ = fVar433 * fVar257;
    auVar65._8_4_ = fVar442 * fVar320;
    auVar65._12_4_ = fVar443 * fVar349;
    auVar65._16_4_ = fVar444 * fVar382;
    auVar65._20_4_ = fVar445 * fVar38;
    auVar65._24_4_ = fVar446 * fVar46;
    auVar65._28_4_ = fVar392;
    auVar66._4_4_ = fVar274 * fVar315;
    auVar66._0_4_ = fVar255 * fVar300;
    auVar66._8_4_ = fVar298 * fVar317;
    auVar66._12_4_ = fVar336 * fVar321;
    auVar66._16_4_ = fVar376 * fVar325;
    auVar66._20_4_ = fVar36 * fVar329;
    auVar66._24_4_ = fVar44 * fVar333;
    auVar66._28_4_ = uStack_204;
    auVar54 = vsubps_avx(auVar66,auVar65);
    fVar171 = auVar54._28_4_;
    auVar187._0_4_ = fVar257 * fVar257 + fVar255 * fVar255 + fVar198 * fVar198;
    auVar187._4_4_ = fVar276 * fVar276 + fVar274 * fVar274 + fVar275 * fVar275;
    auVar187._8_4_ = fVar320 * fVar320 + fVar298 * fVar298 + fVar319 * fVar319;
    auVar187._12_4_ = fVar349 * fVar349 + fVar336 * fVar336 + fVar348 * fVar348;
    auVar187._16_4_ = fVar382 * fVar382 + fVar376 * fVar376 + fVar379 * fVar379;
    auVar187._20_4_ = fVar38 * fVar38 + fVar36 * fVar36 + fVar37 * fVar37;
    auVar187._24_4_ = fVar46 * fVar46 + fVar44 * fVar44 + fVar45 * fVar45;
    auVar187._28_4_ = fVar171 + fVar171 + auVar30._28_4_;
    auVar147 = vrcpps_avx(auVar187);
    fVar327 = auVar147._0_4_;
    fVar328 = auVar147._4_4_;
    auVar67._4_4_ = fVar328 * auVar187._4_4_;
    auVar67._0_4_ = fVar327 * auVar187._0_4_;
    fVar331 = auVar147._8_4_;
    auVar67._8_4_ = fVar331 * auVar187._8_4_;
    fVar332 = auVar147._12_4_;
    auVar67._12_4_ = fVar332 * auVar187._12_4_;
    fVar355 = auVar147._16_4_;
    auVar67._16_4_ = fVar355 * auVar187._16_4_;
    fVar357 = auVar147._20_4_;
    auVar67._20_4_ = fVar357 * auVar187._20_4_;
    fVar359 = auVar147._24_4_;
    auVar67._24_4_ = fVar359 * auVar187._24_4_;
    auVar67._28_4_ = uStack_204;
    auVar268._8_4_ = 0x3f800000;
    auVar268._0_8_ = 0x3f8000003f800000;
    auVar268._12_4_ = 0x3f800000;
    auVar268._16_4_ = 0x3f800000;
    auVar268._20_4_ = 0x3f800000;
    auVar268._24_4_ = 0x3f800000;
    auVar268._28_4_ = 0x3f800000;
    auVar439 = vsubps_avx(auVar268,auVar67);
    fVar327 = auVar439._0_4_ * fVar327 + fVar327;
    fVar328 = auVar439._4_4_ * fVar328 + fVar328;
    fVar331 = auVar439._8_4_ * fVar331 + fVar331;
    fVar332 = auVar439._12_4_ * fVar332 + fVar332;
    fVar355 = auVar439._16_4_ * fVar355 + fVar355;
    fVar357 = auVar439._20_4_ * fVar357 + fVar357;
    fVar359 = auVar439._24_4_ * fVar359 + fVar359;
    auVar195 = vperm2f128_avx(auVar58,auVar58,1);
    auVar195 = vshufps_avx(auVar195,auVar58,0x30);
    local_9e0 = vshufps_avx(auVar58,auVar195,0x29);
    auVar195 = vperm2f128_avx(auVar59,auVar59,1);
    auVar195 = vshufps_avx(auVar195,auVar59,0x30);
    local_7c0 = vshufps_avx(auVar59,auVar195,0x29);
    fVar448 = local_7c0._0_4_;
    fVar455 = local_7c0._4_4_;
    auVar68._4_4_ = fVar455 * fVar274;
    auVar68._0_4_ = fVar448 * fVar255;
    fVar457 = local_7c0._8_4_;
    auVar68._8_4_ = fVar457 * fVar298;
    fVar459 = local_7c0._12_4_;
    auVar68._12_4_ = fVar459 * fVar336;
    fVar461 = local_7c0._16_4_;
    auVar68._16_4_ = fVar461 * fVar376;
    fVar463 = local_7c0._20_4_;
    auVar68._20_4_ = fVar463 * fVar36;
    fVar465 = local_7c0._24_4_;
    auVar68._24_4_ = fVar465 * fVar44;
    auVar68._28_4_ = auVar195._28_4_;
    fVar258 = local_9e0._0_4_;
    fVar277 = local_9e0._4_4_;
    auVar69._4_4_ = fVar275 * fVar277;
    auVar69._0_4_ = fVar198 * fVar258;
    fVar323 = local_9e0._8_4_;
    auVar69._8_4_ = fVar319 * fVar323;
    fVar351 = local_9e0._12_4_;
    auVar69._12_4_ = fVar348 * fVar351;
    fVar385 = local_9e0._16_4_;
    auVar69._16_4_ = fVar379 * fVar385;
    fVar39 = local_9e0._20_4_;
    auVar69._20_4_ = fVar37 * fVar39;
    fVar47 = local_9e0._24_4_;
    auVar69._24_4_ = fVar45 * fVar47;
    auVar69._28_4_ = uStack_1c4;
    auVar148 = vsubps_avx(auVar69,auVar68);
    auVar195 = vperm2f128_avx(auVar57,auVar57,1);
    auVar195 = vshufps_avx(auVar195,auVar57,0x30);
    local_7a0 = vshufps_avx(auVar57,auVar195,0x29);
    fVar259 = local_7a0._0_4_;
    fVar292 = local_7a0._4_4_;
    auVar70._4_4_ = fVar275 * fVar292;
    auVar70._0_4_ = fVar198 * fVar259;
    fVar324 = local_7a0._8_4_;
    auVar70._8_4_ = fVar319 * fVar324;
    fVar353 = local_7a0._12_4_;
    auVar70._12_4_ = fVar348 * fVar353;
    fVar388 = local_7a0._16_4_;
    auVar70._16_4_ = fVar379 * fVar388;
    fVar40 = local_7a0._20_4_;
    auVar70._20_4_ = fVar37 * fVar40;
    fVar48 = local_7a0._24_4_;
    auVar70._24_4_ = fVar45 * fVar48;
    auVar70._28_4_ = auVar195._28_4_;
    auVar71._4_4_ = fVar455 * fVar276;
    auVar71._0_4_ = fVar448 * fVar257;
    auVar71._8_4_ = fVar457 * fVar320;
    auVar71._12_4_ = fVar459 * fVar349;
    auVar71._16_4_ = fVar461 * fVar382;
    auVar71._20_4_ = fVar463 * fVar38;
    uVar124 = local_7c0._28_4_;
    auVar71._24_4_ = fVar465 * fVar46;
    auVar71._28_4_ = uVar124;
    auVar195 = vsubps_avx(auVar71,auVar70);
    auVar72._4_4_ = fVar276 * fVar277;
    auVar72._0_4_ = fVar257 * fVar258;
    auVar72._8_4_ = fVar320 * fVar323;
    auVar72._12_4_ = fVar349 * fVar351;
    auVar72._16_4_ = fVar382 * fVar385;
    auVar72._20_4_ = fVar38 * fVar39;
    auVar72._24_4_ = fVar46 * fVar47;
    auVar72._28_4_ = uVar124;
    auVar73._4_4_ = fVar274 * fVar292;
    auVar73._0_4_ = fVar255 * fVar259;
    auVar73._8_4_ = fVar298 * fVar324;
    auVar73._12_4_ = fVar336 * fVar353;
    auVar73._16_4_ = fVar376 * fVar388;
    auVar73._20_4_ = fVar36 * fVar40;
    auVar73._24_4_ = fVar44 * fVar48;
    auVar73._28_4_ = fVar393;
    auVar149 = vsubps_avx(auVar73,auVar72);
    auVar74._4_4_ =
         (auVar30._4_4_ * auVar30._4_4_ +
         auVar221._4_4_ * auVar221._4_4_ + auVar54._4_4_ * auVar54._4_4_) * fVar328;
    auVar74._0_4_ =
         (auVar30._0_4_ * auVar30._0_4_ +
         auVar221._0_4_ * auVar221._0_4_ + auVar54._0_4_ * auVar54._0_4_) * fVar327;
    auVar74._8_4_ =
         (auVar30._8_4_ * auVar30._8_4_ +
         auVar221._8_4_ * auVar221._8_4_ + auVar54._8_4_ * auVar54._8_4_) * fVar331;
    auVar74._12_4_ =
         (auVar30._12_4_ * auVar30._12_4_ +
         auVar221._12_4_ * auVar221._12_4_ + auVar54._12_4_ * auVar54._12_4_) * fVar332;
    auVar74._16_4_ =
         (auVar30._16_4_ * auVar30._16_4_ +
         auVar221._16_4_ * auVar221._16_4_ + auVar54._16_4_ * auVar54._16_4_) * fVar355;
    auVar74._20_4_ =
         (auVar30._20_4_ * auVar30._20_4_ +
         auVar221._20_4_ * auVar221._20_4_ + auVar54._20_4_ * auVar54._20_4_) * fVar357;
    auVar74._24_4_ =
         (auVar30._24_4_ * auVar30._24_4_ +
         auVar221._24_4_ * auVar221._24_4_ + auVar54._24_4_ * auVar54._24_4_) * fVar359;
    auVar74._28_4_ = auVar30._28_4_ + auVar221._28_4_ + fVar171;
    auVar75._4_4_ =
         (auVar148._4_4_ * auVar148._4_4_ +
         auVar195._4_4_ * auVar195._4_4_ + auVar149._4_4_ * auVar149._4_4_) * fVar328;
    auVar75._0_4_ =
         (auVar148._0_4_ * auVar148._0_4_ +
         auVar195._0_4_ * auVar195._0_4_ + auVar149._0_4_ * auVar149._0_4_) * fVar327;
    auVar75._8_4_ =
         (auVar148._8_4_ * auVar148._8_4_ +
         auVar195._8_4_ * auVar195._8_4_ + auVar149._8_4_ * auVar149._8_4_) * fVar331;
    auVar75._12_4_ =
         (auVar148._12_4_ * auVar148._12_4_ +
         auVar195._12_4_ * auVar195._12_4_ + auVar149._12_4_ * auVar149._12_4_) * fVar332;
    auVar75._16_4_ =
         (auVar148._16_4_ * auVar148._16_4_ +
         auVar195._16_4_ * auVar195._16_4_ + auVar149._16_4_ * auVar149._16_4_) * fVar355;
    auVar75._20_4_ =
         (auVar148._20_4_ * auVar148._20_4_ +
         auVar195._20_4_ * auVar195._20_4_ + auVar149._20_4_ * auVar149._20_4_) * fVar357;
    auVar75._24_4_ =
         (auVar148._24_4_ * auVar148._24_4_ +
         auVar195._24_4_ * auVar195._24_4_ + auVar149._24_4_ * auVar149._24_4_) * fVar359;
    auVar75._28_4_ = auVar439._28_4_ + auVar147._28_4_;
    auVar147 = vmaxps_avx(auVar74,auVar75);
    auVar195 = vperm2f128_avx(_local_a80,_local_a80,1);
    auVar195 = vshufps_avx(auVar195,_local_a80,0x30);
    auVar221 = vshufps_avx(_local_a80,auVar195,0x29);
    auVar152._0_4_ = (float)local_a80._0_4_ + fVar271;
    auVar152._4_4_ = (float)local_a80._4_4_ + fVar273;
    auVar152._8_4_ = fStack_a78 + fVar294;
    auVar152._12_4_ = fStack_a74 + fVar296;
    auVar152._16_4_ = fStack_a70 + fVar260;
    auVar152._20_4_ = fStack_a6c + fVar272;
    auVar152._24_4_ = fStack_a68 + fVar293;
    auVar152._28_4_ = fStack_a64 + fVar295;
    auVar195 = vmaxps_avx(_local_a80,auVar152);
    auVar30 = vmaxps_avx(auVar32,auVar221);
    auVar195 = vmaxps_avx(auVar195,auVar30);
    auVar30 = vrsqrtps_avx(auVar187);
    fVar171 = auVar30._0_4_;
    fVar260 = auVar30._4_4_;
    fVar271 = auVar30._8_4_;
    fVar272 = auVar30._12_4_;
    fVar273 = auVar30._16_4_;
    fVar293 = auVar30._20_4_;
    fVar294 = auVar30._24_4_;
    auVar76._4_4_ = fVar260 * fVar260 * fVar260 * auVar187._4_4_ * 0.5;
    auVar76._0_4_ = fVar171 * fVar171 * fVar171 * auVar187._0_4_ * 0.5;
    auVar76._8_4_ = fVar271 * fVar271 * fVar271 * auVar187._8_4_ * 0.5;
    auVar76._12_4_ = fVar272 * fVar272 * fVar272 * auVar187._12_4_ * 0.5;
    auVar76._16_4_ = fVar273 * fVar273 * fVar273 * auVar187._16_4_ * 0.5;
    auVar76._20_4_ = fVar293 * fVar293 * fVar293 * auVar187._20_4_ * 0.5;
    auVar76._24_4_ = fVar294 * fVar294 * fVar294 * auVar187._24_4_ * 0.5;
    auVar76._28_4_ = auVar187._28_4_;
    auVar77._4_4_ = fVar260 * 1.5;
    auVar77._0_4_ = fVar171 * 1.5;
    auVar77._8_4_ = fVar271 * 1.5;
    auVar77._12_4_ = fVar272 * 1.5;
    auVar77._16_4_ = fVar273 * 1.5;
    auVar77._20_4_ = fVar293 * 1.5;
    auVar77._24_4_ = fVar294 * 1.5;
    auVar77._28_4_ = auVar30._28_4_;
    local_560 = vsubps_avx(auVar77,auVar76);
    auVar112._4_4_ = fVar375;
    auVar112._0_4_ = fVar361;
    auVar112._8_4_ = fVar378;
    auVar112._12_4_ = fVar381;
    auVar112._16_4_ = fVar384;
    auVar112._20_4_ = fVar387;
    auVar112._24_4_ = fVar390;
    auVar112._28_4_ = fVar393;
    auVar439 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar54 = vsubps_avx(auVar439,auVar112);
    auVar439 = vsubps_avx(auVar439,auVar117);
    fVar260 = auVar439._0_4_;
    fVar293 = auVar439._4_4_;
    fVar327 = auVar439._8_4_;
    fVar355 = auVar439._12_4_;
    fVar391 = auVar439._16_4_;
    fVar41 = auVar439._20_4_;
    fVar49 = auVar439._24_4_;
    fVar271 = auVar54._0_4_;
    fVar294 = auVar54._4_4_;
    fVar328 = auVar54._8_4_;
    fVar357 = auVar54._12_4_;
    fVar405 = auVar54._16_4_;
    fVar42 = auVar54._20_4_;
    fVar50 = auVar54._24_4_;
    auVar114._4_4_ = fVar374;
    auVar114._0_4_ = fVar360;
    auVar114._8_4_ = fVar377;
    auVar114._12_4_ = fVar380;
    auVar114._16_4_ = fVar383;
    auVar114._20_4_ = fVar386;
    auVar114._24_4_ = fVar389;
    auVar114._28_4_ = fVar392;
    auVar185 = ZEXT1232(ZEXT412(0)) << 0x20;
    auVar148 = vsubps_avx(auVar185,auVar114);
    fVar272 = auVar148._0_4_;
    fVar295 = auVar148._4_4_;
    fVar331 = auVar148._8_4_;
    fVar359 = auVar148._12_4_;
    fVar406 = auVar148._16_4_;
    fVar43 = auVar148._20_4_;
    fVar51 = auVar148._24_4_;
    auVar452._0_4_ =
         (float)local_a20._0_4_ * fVar272 +
         (float)local_a00._0_4_ * fVar271 + (float)local_800._0_4_ * fVar260;
    auVar452._4_4_ =
         (float)local_a20._4_4_ * fVar295 +
         (float)local_a00._4_4_ * fVar294 + (float)local_800._4_4_ * fVar293;
    auVar452._8_4_ = fStack_a18 * fVar331 + fStack_9f8 * fVar328 + fStack_7f8 * fVar327;
    auVar452._12_4_ = fStack_a14 * fVar359 + fStack_9f4 * fVar357 + fStack_7f4 * fVar355;
    auVar452._16_4_ = fStack_a10 * fVar406 + fStack_9f0 * fVar405 + fStack_7f0 * fVar391;
    auVar452._20_4_ = fStack_a0c * fVar43 + fStack_9ec * fVar42 + fStack_7ec * fVar41;
    auVar452._24_4_ = fStack_a08 * fVar51 + fStack_9e8 * fVar50 + fStack_7e8 * fVar49;
    auVar452._28_4_ = fVar393 + auVar149._28_4_ + auVar30._28_4_;
    auVar467._0_4_ = fVar272 * fVar272 + fVar271 * fVar271 + fVar260 * fVar260;
    auVar467._4_4_ = fVar295 * fVar295 + fVar294 * fVar294 + fVar293 * fVar293;
    auVar467._8_4_ = fVar331 * fVar331 + fVar328 * fVar328 + fVar327 * fVar327;
    auVar467._12_4_ = fVar359 * fVar359 + fVar357 * fVar357 + fVar355 * fVar355;
    auVar467._16_4_ = fVar406 * fVar406 + fVar405 * fVar405 + fVar391 * fVar391;
    auVar467._20_4_ = fVar43 * fVar43 + fVar42 * fVar42 + fVar41 * fVar41;
    auVar467._24_4_ = fVar51 * fVar51 + fVar50 * fVar50 + fVar49 * fVar49;
    auVar467._28_4_ = fStack_a64 + fStack_a64 + fVar393;
    fVar273 = local_560._0_4_;
    fVar296 = local_560._4_4_;
    fVar332 = local_560._8_4_;
    fVar373 = local_560._12_4_;
    fVar432 = local_560._16_4_;
    fVar297 = local_560._20_4_;
    fVar299 = local_560._24_4_;
    local_5a0 = (float)local_a20._0_4_ * fVar257 * fVar273 +
                fVar255 * fVar273 * (float)local_a00._0_4_ +
                fVar198 * fVar273 * (float)local_800._0_4_;
    fStack_59c = (float)local_a20._4_4_ * fVar276 * fVar296 +
                 fVar274 * fVar296 * (float)local_a00._4_4_ +
                 fVar275 * fVar296 * (float)local_800._4_4_;
    fStack_598 = fStack_a18 * fVar320 * fVar332 +
                 fVar298 * fVar332 * fStack_9f8 + fVar319 * fVar332 * fStack_7f8;
    fStack_594 = fStack_a14 * fVar349 * fVar373 +
                 fVar336 * fVar373 * fStack_9f4 + fVar348 * fVar373 * fStack_7f4;
    fStack_590 = fStack_a10 * fVar382 * fVar432 +
                 fVar376 * fVar432 * fStack_9f0 + fVar379 * fVar432 * fStack_7f0;
    fStack_58c = fStack_a0c * fVar38 * fVar297 +
                 fVar36 * fVar297 * fStack_9ec + fVar37 * fVar297 * fStack_7ec;
    fStack_588 = fStack_a08 * fVar46 * fVar299 +
                 fVar44 * fVar299 * fStack_9e8 + fVar45 * fVar299 * fStack_7e8;
    fStack_584 = fStack_a04 + fStack_9e4 + fStack_7e4;
    fVar171 = fStack_a04 + fStack_9e4 + fStack_7e4;
    fVar407 = fVar272 * fVar257 * fVar273 +
              fVar255 * fVar273 * fVar271 + fVar198 * fVar273 * fVar260;
    fVar416 = fVar295 * fVar276 * fVar296 +
              fVar274 * fVar296 * fVar294 + fVar275 * fVar296 * fVar293;
    fVar417 = fVar331 * fVar320 * fVar332 +
              fVar298 * fVar332 * fVar328 + fVar319 * fVar332 * fVar327;
    fVar418 = fVar359 * fVar349 * fVar373 +
              fVar336 * fVar373 * fVar357 + fVar348 * fVar373 * fVar355;
    fVar419 = fVar406 * fVar382 * fVar432 +
              fVar376 * fVar432 * fVar405 + fVar379 * fVar432 * fVar391;
    fVar420 = fVar43 * fVar38 * fVar297 + fVar36 * fVar297 * fVar42 + fVar37 * fVar297 * fVar41;
    fVar421 = fVar51 * fVar46 * fVar299 + fVar44 * fVar299 * fVar50 + fVar45 * fVar299 * fVar49;
    fVar422 = fStack_9e4 + fVar171;
    auVar78._4_4_ = fStack_59c * fVar416;
    auVar78._0_4_ = local_5a0 * fVar407;
    auVar78._8_4_ = fStack_598 * fVar417;
    auVar78._12_4_ = fStack_594 * fVar418;
    auVar78._16_4_ = fStack_590 * fVar419;
    auVar78._20_4_ = fStack_58c * fVar420;
    auVar78._24_4_ = fStack_588 * fVar421;
    auVar78._28_4_ = fVar171;
    auVar149 = vsubps_avx(auVar452,auVar78);
    auVar79._4_4_ = fVar416 * fVar416;
    auVar79._0_4_ = fVar407 * fVar407;
    auVar79._8_4_ = fVar417 * fVar417;
    auVar79._12_4_ = fVar418 * fVar418;
    auVar79._16_4_ = fVar419 * fVar419;
    auVar79._20_4_ = fVar420 * fVar420;
    auVar79._24_4_ = fVar421 * fVar421;
    auVar79._28_4_ = fStack_9e4;
    auVar184 = vsubps_avx(auVar467,auVar79);
    auVar30 = vsqrtps_avx(auVar147);
    fVar171 = (auVar30._0_4_ + auVar195._0_4_) * 1.0000002;
    fVar162 = (auVar30._4_4_ + auVar195._4_4_) * 1.0000002;
    fVar164 = (auVar30._8_4_ + auVar195._8_4_) * 1.0000002;
    fVar165 = (auVar30._12_4_ + auVar195._12_4_) * 1.0000002;
    fVar166 = (auVar30._16_4_ + auVar195._16_4_) * 1.0000002;
    fVar167 = (auVar30._20_4_ + auVar195._20_4_) * 1.0000002;
    fVar168 = (auVar30._24_4_ + auVar195._24_4_) * 1.0000002;
    auVar80._4_4_ = fVar162 * fVar162;
    auVar80._0_4_ = fVar171 * fVar171;
    auVar80._8_4_ = fVar164 * fVar164;
    auVar80._12_4_ = fVar165 * fVar165;
    auVar80._16_4_ = fVar166 * fVar166;
    auVar80._20_4_ = fVar167 * fVar167;
    auVar80._24_4_ = fVar168 * fVar168;
    auVar80._28_4_ = auVar30._28_4_ + auVar195._28_4_;
    fVar162 = auVar149._0_4_ + auVar149._0_4_;
    fVar164 = auVar149._4_4_ + auVar149._4_4_;
    local_980._0_8_ = CONCAT44(fVar164,fVar162);
    local_980._8_4_ = auVar149._8_4_ + auVar149._8_4_;
    local_980._12_4_ = auVar149._12_4_ + auVar149._12_4_;
    local_980._16_4_ = auVar149._16_4_ + auVar149._16_4_;
    local_980._20_4_ = auVar149._20_4_ + auVar149._20_4_;
    local_980._24_4_ = auVar149._24_4_ + auVar149._24_4_;
    fVar171 = auVar149._28_4_;
    local_980._28_4_ = fVar171 + fVar171;
    auVar195 = vsubps_avx(auVar184,auVar80);
    local_360._4_4_ = fStack_59c * fStack_59c;
    local_360._0_4_ = local_5a0 * local_5a0;
    local_360._8_4_ = fStack_598 * fStack_598;
    local_360._12_4_ = fStack_594 * fStack_594;
    local_360._16_4_ = fStack_590 * fStack_590;
    local_360._20_4_ = fStack_58c * fStack_58c;
    local_360._24_4_ = fStack_588 * fStack_588;
    local_360._28_4_ = auVar33._28_4_;
    auVar431 = ZEXT3264(local_360);
    local_580 = vsubps_avx(local_2c0,local_360);
    auVar401 = ZEXT3264(local_580);
    auVar81._4_4_ = fVar164 * fVar164;
    auVar81._0_4_ = fVar162 * fVar162;
    auVar81._8_4_ = local_980._8_4_ * local_980._8_4_;
    auVar81._12_4_ = local_980._12_4_ * local_980._12_4_;
    auVar81._16_4_ = local_980._16_4_ * local_980._16_4_;
    auVar81._20_4_ = local_980._20_4_ * local_980._20_4_;
    auVar81._24_4_ = local_980._24_4_ * local_980._24_4_;
    auVar81._28_4_ = fVar171;
    fVar165 = local_580._0_4_;
    fVar166 = local_580._4_4_;
    fVar167 = local_580._8_4_;
    fVar168 = local_580._12_4_;
    fVar402 = local_580._16_4_;
    fVar403 = local_580._20_4_;
    fVar404 = local_580._24_4_;
    auVar82._4_4_ = auVar195._4_4_ * fVar166 * 4.0;
    auVar82._0_4_ = auVar195._0_4_ * fVar165 * 4.0;
    auVar82._8_4_ = auVar195._8_4_ * fVar167 * 4.0;
    auVar82._12_4_ = auVar195._12_4_ * fVar168 * 4.0;
    auVar82._16_4_ = auVar195._16_4_ * fVar402 * 4.0;
    auVar82._20_4_ = auVar195._20_4_ * fVar403 * 4.0;
    auVar82._24_4_ = auVar195._24_4_ * fVar404 * 4.0;
    auVar82._28_4_ = 0x40800000;
    auVar33 = vsubps_avx(auVar81,auVar82);
    auVar147 = vcmpps_avx(auVar33,auVar185,5);
    fVar171 = local_580._28_4_;
    if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar147 >> 0x7f,0) == '\0') &&
          (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar147 >> 0xbf,0) == '\0') &&
        (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar147[0x1f])
    {
      auVar440 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar468._8_4_ = 0xff800000;
      auVar468._0_8_ = 0xff800000ff800000;
      auVar468._12_4_ = 0xff800000;
      auVar468._16_4_ = 0xff800000;
      auVar468._20_4_ = 0xff800000;
      auVar468._24_4_ = 0xff800000;
      auVar468._28_4_ = 0xff800000;
    }
    else {
      auVar149 = vcmpps_avx(auVar33,auVar185,5);
      auVar185 = vsqrtps_avx(auVar33);
      auVar306._0_4_ = fVar165 + fVar165;
      auVar306._4_4_ = fVar166 + fVar166;
      auVar306._8_4_ = fVar167 + fVar167;
      auVar306._12_4_ = fVar168 + fVar168;
      auVar306._16_4_ = fVar402 + fVar402;
      auVar306._20_4_ = fVar403 + fVar403;
      auVar306._24_4_ = fVar404 + fVar404;
      auVar306._28_4_ = fVar171 + fVar171;
      auVar33 = vrcpps_avx(auVar306);
      fVar301 = auVar33._0_4_;
      fVar316 = auVar33._4_4_;
      auVar83._4_4_ = auVar306._4_4_ * fVar316;
      auVar83._0_4_ = auVar306._0_4_ * fVar301;
      fVar318 = auVar33._8_4_;
      auVar83._8_4_ = auVar306._8_4_ * fVar318;
      fVar322 = auVar33._12_4_;
      auVar83._12_4_ = auVar306._12_4_ * fVar322;
      fVar326 = auVar33._16_4_;
      auVar83._16_4_ = auVar306._16_4_ * fVar326;
      fVar330 = auVar33._20_4_;
      auVar83._20_4_ = auVar306._20_4_ * fVar330;
      fVar334 = auVar33._24_4_;
      auVar83._24_4_ = auVar306._24_4_ * fVar334;
      auVar83._28_4_ = auVar306._28_4_;
      auVar370._8_4_ = 0x3f800000;
      auVar370._0_8_ = 0x3f8000003f800000;
      auVar370._12_4_ = 0x3f800000;
      auVar370._16_4_ = 0x3f800000;
      auVar370._20_4_ = 0x3f800000;
      auVar370._24_4_ = 0x3f800000;
      auVar370._28_4_ = 0x3f800000;
      auVar186 = vsubps_avx(auVar370,auVar83);
      fVar301 = fVar301 + fVar301 * auVar186._0_4_;
      fVar316 = fVar316 + fVar316 * auVar186._4_4_;
      fVar318 = fVar318 + fVar318 * auVar186._8_4_;
      fVar322 = fVar322 + fVar322 * auVar186._12_4_;
      fVar326 = fVar326 + fVar326 * auVar186._16_4_;
      fVar330 = fVar330 + fVar330 * auVar186._20_4_;
      fVar334 = fVar334 + fVar334 * auVar186._24_4_;
      auVar342._0_8_ = CONCAT44(fVar164,fVar162) ^ 0x8000000080000000;
      auVar342._8_4_ = -local_980._8_4_;
      auVar342._12_4_ = -local_980._12_4_;
      auVar342._16_4_ = -local_980._16_4_;
      auVar342._20_4_ = -local_980._20_4_;
      auVar342._24_4_ = -local_980._24_4_;
      auVar342._28_4_ = -local_980._28_4_;
      auVar217 = vsubps_avx(auVar342,auVar185);
      fVar162 = auVar217._0_4_ * fVar301;
      fVar164 = auVar217._4_4_ * fVar316;
      auVar84._4_4_ = fVar164;
      auVar84._0_4_ = fVar162;
      fVar350 = auVar217._8_4_ * fVar318;
      auVar84._8_4_ = fVar350;
      fVar352 = auVar217._12_4_ * fVar322;
      auVar84._12_4_ = fVar352;
      fVar354 = auVar217._16_4_ * fVar326;
      auVar84._16_4_ = fVar354;
      fVar356 = auVar217._20_4_ * fVar330;
      auVar84._20_4_ = fVar356;
      fVar358 = auVar217._24_4_ * fVar334;
      auVar84._24_4_ = fVar358;
      auVar84._28_4_ = auVar217._28_4_;
      auVar185 = vsubps_avx(auVar185,local_980);
      fVar301 = auVar185._0_4_ * fVar301;
      fVar316 = auVar185._4_4_ * fVar316;
      auVar85._4_4_ = fVar316;
      auVar85._0_4_ = fVar301;
      fVar318 = auVar185._8_4_ * fVar318;
      auVar85._8_4_ = fVar318;
      fVar322 = auVar185._12_4_ * fVar322;
      auVar85._12_4_ = fVar322;
      fVar326 = auVar185._16_4_ * fVar326;
      auVar85._16_4_ = fVar326;
      fVar330 = auVar185._20_4_ * fVar330;
      auVar85._20_4_ = fVar330;
      fVar334 = auVar185._24_4_ * fVar334;
      auVar85._24_4_ = fVar334;
      auVar85._28_4_ = auVar185._28_4_;
      local_320 = fVar273 * (fVar407 + local_5a0 * fVar162);
      fStack_31c = fVar296 * (fVar416 + fStack_59c * fVar164);
      fStack_318 = fVar332 * (fVar417 + fStack_598 * fVar350);
      fStack_314 = fVar373 * (fVar418 + fStack_594 * fVar352);
      fStack_310 = fVar432 * (fVar419 + fStack_590 * fVar354);
      fStack_30c = fVar297 * (fVar420 + fStack_58c * fVar356);
      fStack_308 = fVar299 * (fVar421 + fStack_588 * fVar358);
      fStack_304 = fVar422 + auVar33._28_4_ + auVar186._28_4_;
      auVar307._8_4_ = 0x7fffffff;
      auVar307._0_8_ = 0x7fffffff7fffffff;
      auVar307._12_4_ = 0x7fffffff;
      auVar307._16_4_ = 0x7fffffff;
      auVar307._20_4_ = 0x7fffffff;
      auVar307._24_4_ = 0x7fffffff;
      auVar307._28_4_ = 0x7fffffff;
      auVar33 = vandps_avx(local_360,auVar307);
      auVar186 = vmaxps_avx(local_540,auVar33);
      auVar86._4_4_ = auVar186._4_4_ * 1.9073486e-06;
      auVar86._0_4_ = auVar186._0_4_ * 1.9073486e-06;
      auVar86._8_4_ = auVar186._8_4_ * 1.9073486e-06;
      auVar86._12_4_ = auVar186._12_4_ * 1.9073486e-06;
      auVar86._16_4_ = auVar186._16_4_ * 1.9073486e-06;
      auVar86._20_4_ = auVar186._20_4_ * 1.9073486e-06;
      auVar86._24_4_ = auVar186._24_4_ * 1.9073486e-06;
      auVar86._28_4_ = auVar186._28_4_;
      auVar33 = vandps_avx(local_580,auVar307);
      auVar185 = vcmpps_avx(auVar33,auVar86,1);
      auVar371._8_4_ = 0x7f800000;
      auVar371._0_8_ = 0x7f8000007f800000;
      auVar371._12_4_ = 0x7f800000;
      auVar371._16_4_ = 0x7f800000;
      auVar371._20_4_ = 0x7f800000;
      auVar371._24_4_ = 0x7f800000;
      auVar371._28_4_ = 0x7f800000;
      auVar33 = vblendvps_avx(auVar371,auVar84,auVar149);
      auVar440 = ZEXT3264(auVar33);
      local_340 = fVar273 * (fVar407 + local_5a0 * fVar301);
      fStack_33c = fVar296 * (fVar416 + fStack_59c * fVar316);
      fStack_338 = fVar332 * (fVar417 + fStack_598 * fVar318);
      fStack_334 = fVar373 * (fVar418 + fStack_594 * fVar322);
      fStack_330 = fVar432 * (fVar419 + fStack_590 * fVar326);
      fStack_32c = fVar297 * (fVar420 + fStack_58c * fVar330);
      fStack_328 = fVar299 * (fVar421 + fStack_588 * fVar334);
      fStack_324 = fVar422 + auVar186._28_4_;
      auVar308._8_4_ = 0xff800000;
      auVar308._0_8_ = 0xff800000ff800000;
      auVar308._12_4_ = 0xff800000;
      auVar308._16_4_ = 0xff800000;
      auVar308._20_4_ = 0xff800000;
      auVar308._24_4_ = 0xff800000;
      auVar308._28_4_ = 0xff800000;
      auVar468 = vblendvps_avx(auVar308,auVar85,auVar149);
      auVar186 = auVar149 & auVar185;
      if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar186 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar186 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar186 >> 0x7f,0) != '\0') ||
            (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar186 >> 0xbf,0) != '\0') ||
          (auVar186 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar186[0x1f] < '\0') {
        auVar147 = vandps_avx(auVar185,auVar149);
        auVar213 = vpackssdw_avx(auVar147._0_16_,auVar147._16_16_);
        auVar185 = vcmpps_avx(auVar195,ZEXT832(0) << 0x20,2);
        auVar470._8_4_ = 0xff800000;
        auVar470._0_8_ = 0xff800000ff800000;
        auVar470._12_4_ = 0xff800000;
        auVar470._16_4_ = 0xff800000;
        auVar470._20_4_ = 0xff800000;
        auVar470._24_4_ = 0xff800000;
        auVar470._28_4_ = 0xff800000;
        auVar345._8_4_ = 0x7f800000;
        auVar345._0_8_ = 0x7f8000007f800000;
        auVar345._12_4_ = 0x7f800000;
        auVar345._16_4_ = 0x7f800000;
        auVar345._20_4_ = 0x7f800000;
        auVar345._24_4_ = 0x7f800000;
        auVar345._28_4_ = 0x7f800000;
        auVar195 = vblendvps_avx(auVar345,auVar470,auVar185);
        auVar209 = vpmovsxwd_avx(auVar213);
        auVar213 = vpunpckhwd_avx(auVar213,auVar213);
        auVar290._16_16_ = auVar213;
        auVar290._0_16_ = auVar209;
        auVar195 = vblendvps_avx(auVar33,auVar195,auVar290);
        auVar440 = ZEXT3264(auVar195);
        auVar346._8_4_ = 0x7f800000;
        auVar346._0_8_ = 0x7f8000007f800000;
        auVar346._12_4_ = 0x7f800000;
        auVar346._16_4_ = 0x7f800000;
        auVar346._20_4_ = 0x7f800000;
        auVar346._24_4_ = 0x7f800000;
        auVar346._28_4_ = 0x7f800000;
        auVar195 = vblendvps_avx(auVar470,auVar346,auVar185);
        auVar468 = vblendvps_avx(auVar468,auVar195,auVar290);
        auVar195 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar159._0_4_ = auVar147._0_4_ ^ auVar195._0_4_;
        auVar159._4_4_ = auVar147._4_4_ ^ auVar195._4_4_;
        auVar159._8_4_ = auVar147._8_4_ ^ auVar195._8_4_;
        auVar159._12_4_ = auVar147._12_4_ ^ auVar195._12_4_;
        auVar159._16_4_ = auVar147._16_4_ ^ auVar195._16_4_;
        auVar159._20_4_ = auVar147._20_4_ ^ auVar195._20_4_;
        auVar159._24_4_ = auVar147._24_4_ ^ auVar195._24_4_;
        auVar159._28_4_ = auVar147._28_4_ ^ auVar195._28_4_;
        auVar147 = vorps_avx(auVar185,auVar159);
        auVar147 = vandps_avx(auVar149,auVar147);
      }
    }
    auVar415 = ZEXT3264(CONCAT428(fVar422,CONCAT424(fVar421,CONCAT420(fVar420,CONCAT416(fVar419,
                                                  CONCAT412(fVar418,CONCAT48(fVar417,CONCAT44(
                                                  fVar416,fVar407))))))));
    auVar347 = ZEXT3264(local_980);
    auVar291 = ZEXT3264(local_520);
    auVar195 = local_520 & auVar147;
    auVar314 = ZEXT3264(_local_a00);
    if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar195 >> 0x7f,0) != '\0') ||
          (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar195 >> 0xbf,0) != '\0') ||
        (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar195[0x1f] < '\0') {
      auVar209 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      auVar213 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8d0._0_4_));
      auVar213 = vshufps_avx(auVar213,auVar213,0);
      auVar285._16_16_ = auVar213;
      auVar285._0_16_ = auVar213;
      auVar149 = vminps_avx(auVar285,auVar468);
      fVar330 = auVar439._28_4_;
      auVar220._0_4_ =
           (float)local_a20._0_4_ * fVar300 +
           (float)local_a00._0_4_ * fVar433 + (float)local_800._0_4_ * fVar447;
      auVar220._4_4_ =
           (float)local_a20._4_4_ * fVar315 +
           (float)local_a00._4_4_ * fVar441 + (float)local_800._4_4_ * fVar454;
      auVar220._8_4_ = fStack_a18 * fVar317 + fStack_9f8 * fVar442 + fStack_7f8 * fVar456;
      auVar220._12_4_ = fStack_a14 * fVar321 + fStack_9f4 * fVar443 + fStack_7f4 * fVar458;
      auVar220._16_4_ = fStack_a10 * fVar325 + fStack_9f0 * fVar444 + fStack_7f0 * fVar460;
      auVar220._20_4_ = fStack_a0c * fVar329 + fStack_9ec * fVar445 + fStack_7ec * fVar462;
      auVar220._24_4_ = fStack_a08 * fVar333 + fStack_9e8 * fVar446 + fStack_7e8 * fVar464;
      auVar220._28_4_ = fVar330 + fVar330 + auVar148._28_4_;
      auVar195 = vrcpps_avx(auVar220);
      fVar162 = auVar195._0_4_;
      fVar164 = auVar195._4_4_;
      auVar87._4_4_ = auVar220._4_4_ * fVar164;
      auVar87._0_4_ = auVar220._0_4_ * fVar162;
      fVar301 = auVar195._8_4_;
      auVar87._8_4_ = auVar220._8_4_ * fVar301;
      fVar316 = auVar195._12_4_;
      auVar87._12_4_ = auVar220._12_4_ * fVar316;
      fVar318 = auVar195._16_4_;
      auVar87._16_4_ = auVar220._16_4_ * fVar318;
      fVar322 = auVar195._20_4_;
      auVar87._20_4_ = auVar220._20_4_ * fVar322;
      fVar326 = auVar195._24_4_;
      auVar87._24_4_ = auVar220._24_4_ * fVar326;
      auVar87._28_4_ = fVar335;
      auVar412._8_4_ = 0x3f800000;
      auVar412._0_8_ = 0x3f8000003f800000;
      auVar412._12_4_ = 0x3f800000;
      auVar412._16_4_ = 0x3f800000;
      auVar412._20_4_ = 0x3f800000;
      auVar412._24_4_ = 0x3f800000;
      auVar412._28_4_ = 0x3f800000;
      auVar415 = ZEXT3264(auVar412);
      auVar439 = vsubps_avx(auVar412,auVar87);
      auVar343._8_4_ = 0x7fffffff;
      auVar343._0_8_ = 0x7fffffff7fffffff;
      auVar343._12_4_ = 0x7fffffff;
      auVar343._16_4_ = 0x7fffffff;
      auVar343._20_4_ = 0x7fffffff;
      auVar343._24_4_ = 0x7fffffff;
      auVar343._28_4_ = 0x7fffffff;
      auVar195 = vandps_avx(auVar220,auVar343);
      auVar399._8_4_ = 0x219392ef;
      auVar399._0_8_ = 0x219392ef219392ef;
      auVar399._12_4_ = 0x219392ef;
      auVar399._16_4_ = 0x219392ef;
      auVar399._20_4_ = 0x219392ef;
      auVar399._24_4_ = 0x219392ef;
      auVar399._28_4_ = 0x219392ef;
      auVar33 = vcmpps_avx(auVar195,auVar399,1);
      auVar88._4_4_ =
           (fVar164 + fVar164 * auVar439._4_4_) *
           -(fVar315 * fVar295 + fVar441 * fVar294 + fVar454 * fVar293);
      auVar88._0_4_ =
           (fVar162 + fVar162 * auVar439._0_4_) *
           -(fVar300 * fVar272 + fVar433 * fVar271 + fVar447 * fVar260);
      auVar88._8_4_ =
           (fVar301 + fVar301 * auVar439._8_4_) *
           -(fVar317 * fVar331 + fVar442 * fVar328 + fVar456 * fVar327);
      auVar88._12_4_ =
           (fVar316 + fVar316 * auVar439._12_4_) *
           -(fVar321 * fVar359 + fVar443 * fVar357 + fVar458 * fVar355);
      auVar88._16_4_ =
           (fVar318 + fVar318 * auVar439._16_4_) *
           -(fVar325 * fVar406 + fVar444 * fVar405 + fVar460 * fVar391);
      auVar88._20_4_ =
           (fVar322 + fVar322 * auVar439._20_4_) *
           -(fVar329 * fVar43 + fVar445 * fVar42 + fVar462 * fVar41);
      auVar88._24_4_ =
           (fVar326 + fVar326 * auVar439._24_4_) *
           -(fVar333 * fVar51 + fVar446 * fVar50 + fVar464 * fVar49);
      auVar88._28_4_ = -(auVar148._28_4_ + auVar54._28_4_ + fVar330);
      auVar109 = ZEXT812(0);
      auVar401 = ZEXT1264(auVar109) << 0x20;
      auVar195 = vcmpps_avx(auVar220,ZEXT1232(auVar109) << 0x20,1);
      auVar195 = vorps_avx(auVar33,auVar195);
      auVar372._8_4_ = 0xff800000;
      auVar372._0_8_ = 0xff800000ff800000;
      auVar372._12_4_ = 0xff800000;
      auVar372._16_4_ = 0xff800000;
      auVar372._20_4_ = 0xff800000;
      auVar372._24_4_ = 0xff800000;
      auVar372._28_4_ = 0xff800000;
      auVar195 = vblendvps_avx(auVar88,auVar372,auVar195);
      auVar54 = vcmpps_avx(auVar220,ZEXT1232(auVar109) << 0x20,6);
      auVar33 = vorps_avx(auVar33,auVar54);
      auVar429._8_4_ = 0x7f800000;
      auVar429._0_8_ = 0x7f8000007f800000;
      auVar429._12_4_ = 0x7f800000;
      auVar429._16_4_ = 0x7f800000;
      auVar429._20_4_ = 0x7f800000;
      auVar429._24_4_ = 0x7f800000;
      auVar429._28_4_ = 0x7f800000;
      auVar431 = ZEXT3264(auVar429);
      auVar33 = vblendvps_avx(auVar88,auVar429,auVar33);
      auVar54 = vmaxps_avx(local_2e0,auVar440._0_32_);
      auVar54 = vmaxps_avx(auVar54,auVar195);
      auVar33 = vminps_avx(auVar149,auVar33);
      auVar149 = ZEXT1232(auVar109) << 0x20;
      auVar195 = vsubps_avx(auVar149,local_960);
      auVar31 = vsubps_avx(auVar149,auVar31);
      auVar89._4_4_ = auVar31._4_4_ * -fVar455;
      auVar89._0_4_ = auVar31._0_4_ * -fVar448;
      auVar89._8_4_ = auVar31._8_4_ * -fVar457;
      auVar89._12_4_ = auVar31._12_4_ * -fVar459;
      auVar89._16_4_ = auVar31._16_4_ * -fVar461;
      auVar89._20_4_ = auVar31._20_4_ * -fVar463;
      auVar89._24_4_ = auVar31._24_4_ * -fVar465;
      auVar89._28_4_ = auVar31._28_4_;
      auVar440 = ZEXT3264(local_9e0);
      auVar90._4_4_ = fVar277 * auVar195._4_4_;
      auVar90._0_4_ = fVar258 * auVar195._0_4_;
      auVar90._8_4_ = fVar323 * auVar195._8_4_;
      auVar90._12_4_ = fVar351 * auVar195._12_4_;
      auVar90._16_4_ = fVar385 * auVar195._16_4_;
      auVar90._20_4_ = fVar39 * auVar195._20_4_;
      auVar90._24_4_ = fVar47 * auVar195._24_4_;
      auVar90._28_4_ = auVar195._28_4_;
      auVar195 = vsubps_avx(auVar89,auVar90);
      auVar31 = vsubps_avx(auVar149,auVar400);
      auVar91._4_4_ = fVar292 * auVar31._4_4_;
      auVar91._0_4_ = fVar259 * auVar31._0_4_;
      auVar91._8_4_ = fVar324 * auVar31._8_4_;
      auVar91._12_4_ = fVar353 * auVar31._12_4_;
      auVar91._16_4_ = fVar388 * auVar31._16_4_;
      auVar91._20_4_ = fVar40 * auVar31._20_4_;
      uVar8 = auVar31._28_4_;
      auVar91._24_4_ = fVar48 * auVar31._24_4_;
      auVar91._28_4_ = uVar8;
      auVar400 = vsubps_avx(auVar195,auVar91);
      auVar92._4_4_ = (float)local_800._4_4_ * -fVar455;
      auVar92._0_4_ = (float)local_800._0_4_ * -fVar448;
      auVar92._8_4_ = fStack_7f8 * -fVar457;
      auVar92._12_4_ = fStack_7f4 * -fVar459;
      auVar92._16_4_ = fStack_7f0 * -fVar461;
      auVar92._20_4_ = fStack_7ec * -fVar463;
      auVar92._24_4_ = fStack_7e8 * -fVar465;
      auVar92._28_4_ = uVar124 ^ 0x80000000;
      auVar93._4_4_ = fVar277 * (float)local_a00._4_4_;
      auVar93._0_4_ = fVar258 * (float)local_a00._0_4_;
      auVar93._8_4_ = fVar323 * fStack_9f8;
      auVar93._12_4_ = fVar351 * fStack_9f4;
      auVar93._16_4_ = fVar385 * fStack_9f0;
      auVar93._20_4_ = fVar39 * fStack_9ec;
      auVar93._24_4_ = fVar47 * fStack_9e8;
      auVar93._28_4_ = uVar8;
      auVar195 = vsubps_avx(auVar92,auVar93);
      auVar94._4_4_ = fVar292 * (float)local_a20._4_4_;
      auVar94._0_4_ = fVar259 * (float)local_a20._0_4_;
      auVar94._8_4_ = fVar324 * fStack_a18;
      auVar94._12_4_ = fVar353 * fStack_a14;
      auVar94._16_4_ = fVar388 * fStack_a10;
      auVar94._20_4_ = fVar40 * fStack_a0c;
      auVar94._24_4_ = fVar48 * fStack_a08;
      auVar94._28_4_ = uVar8;
      auVar439 = vsubps_avx(auVar195,auVar94);
      auVar195 = vrcpps_avx(auVar439);
      fVar258 = auVar195._0_4_;
      fVar259 = auVar195._4_4_;
      auVar95._4_4_ = auVar439._4_4_ * fVar259;
      auVar95._0_4_ = auVar439._0_4_ * fVar258;
      fVar260 = auVar195._8_4_;
      auVar95._8_4_ = auVar439._8_4_ * fVar260;
      fVar271 = auVar195._12_4_;
      auVar95._12_4_ = auVar439._12_4_ * fVar271;
      fVar272 = auVar195._16_4_;
      auVar95._16_4_ = auVar439._16_4_ * fVar272;
      fVar277 = auVar195._20_4_;
      auVar95._20_4_ = auVar439._20_4_ * fVar277;
      fVar292 = auVar195._24_4_;
      auVar95._24_4_ = auVar439._24_4_ * fVar292;
      auVar95._28_4_ = fStack_a04;
      auVar148 = vsubps_avx(auVar412,auVar95);
      auVar309._8_4_ = 0x7fffffff;
      auVar309._0_8_ = 0x7fffffff7fffffff;
      auVar309._12_4_ = 0x7fffffff;
      auVar309._16_4_ = 0x7fffffff;
      auVar309._20_4_ = 0x7fffffff;
      auVar309._24_4_ = 0x7fffffff;
      auVar309._28_4_ = 0x7fffffff;
      auVar195 = vandps_avx(auVar439,auVar309);
      auVar344._8_4_ = 0x219392ef;
      auVar344._0_8_ = 0x219392ef219392ef;
      auVar344._12_4_ = 0x219392ef;
      auVar344._16_4_ = 0x219392ef;
      auVar344._20_4_ = 0x219392ef;
      auVar344._24_4_ = 0x219392ef;
      auVar344._28_4_ = 0x219392ef;
      auVar31 = vcmpps_avx(auVar195,auVar344,1);
      auVar314 = ZEXT3264(auVar31);
      auVar96._4_4_ = (fVar259 + fVar259 * auVar148._4_4_) * -auVar400._4_4_;
      auVar96._0_4_ = (fVar258 + fVar258 * auVar148._0_4_) * -auVar400._0_4_;
      auVar96._8_4_ = (fVar260 + fVar260 * auVar148._8_4_) * -auVar400._8_4_;
      auVar96._12_4_ = (fVar271 + fVar271 * auVar148._12_4_) * -auVar400._12_4_;
      auVar96._16_4_ = (fVar272 + fVar272 * auVar148._16_4_) * -auVar400._16_4_;
      auVar96._20_4_ = (fVar277 + fVar277 * auVar148._20_4_) * -auVar400._20_4_;
      auVar96._24_4_ = (fVar292 + fVar292 * auVar148._24_4_) * -auVar400._24_4_;
      auVar96._28_4_ = auVar400._28_4_ ^ 0x80000000;
      auVar195 = vcmpps_avx(auVar439,auVar149,1);
      auVar195 = vorps_avx(auVar31,auVar195);
      auVar195 = vblendvps_avx(auVar96,auVar372,auVar195);
      _local_820 = vmaxps_avx(auVar54,auVar195);
      auVar347 = ZEXT3264(_local_820);
      auVar291 = ZEXT3264(local_520);
      auVar400 = ZEXT1232(auVar109) << 0x20;
      auVar195 = vcmpps_avx(auVar439,auVar400,6);
      auVar195 = vorps_avx(auVar31,auVar195);
      auVar195 = vblendvps_avx(auVar96,auVar429,auVar195);
      auVar147 = vandps_avx(auVar147,local_520);
      local_380 = vminps_avx(auVar33,auVar195);
      auVar195 = vcmpps_avx(_local_820,local_380,2);
      auVar31 = auVar147 & auVar195;
      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar31 >> 0x7f,0) != '\0') ||
            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0xbf,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar31[0x1f] < '\0') {
        auVar31 = vminps_avx(_local_a80,auVar152);
        auVar32 = vminps_avx(auVar32,auVar221);
        auVar31 = vminps_avx(auVar31,auVar32);
        auVar30 = vsubps_avx(auVar31,auVar30);
        auVar147 = vandps_avx(auVar195,auVar147);
        auVar119._4_4_ = fStack_31c;
        auVar119._0_4_ = local_320;
        auVar119._8_4_ = fStack_318;
        auVar119._12_4_ = fStack_314;
        auVar119._16_4_ = fStack_310;
        auVar119._20_4_ = fStack_30c;
        auVar119._24_4_ = fStack_308;
        auVar119._28_4_ = fStack_304;
        auVar195 = vminps_avx(auVar119,auVar412);
        auVar195 = vmaxps_avx(auVar195,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar200 + fVar170 * (auVar195._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar230 + fVar196 * (auVar195._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar231 + fVar197 * (auVar195._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fVar232 + fVar199 * (auVar195._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar200 + fVar170 * (auVar195._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar230 + fVar196 * (auVar195._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar231 + fVar197 * (auVar195._24_4_ + 6.0) * 0.125;
        fStack_184 = fVar232 + auVar195._28_4_ + 7.0;
        auVar118._4_4_ = fStack_33c;
        auVar118._0_4_ = local_340;
        auVar118._8_4_ = fStack_338;
        auVar118._12_4_ = fStack_334;
        auVar118._16_4_ = fStack_330;
        auVar118._20_4_ = fStack_32c;
        auVar118._24_4_ = fStack_328;
        auVar118._28_4_ = fStack_324;
        auVar195 = vminps_avx(auVar118,auVar412);
        auVar195 = vmaxps_avx(auVar195,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar200 + fVar170 * (auVar195._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar230 + fVar196 * (auVar195._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar231 + fVar197 * (auVar195._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fVar232 + fVar199 * (auVar195._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar200 + fVar170 * (auVar195._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar230 + fVar196 * (auVar195._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar231 + fVar197 * (auVar195._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fVar232 + auVar195._28_4_ + 7.0;
        auVar97._4_4_ = auVar30._4_4_ * 0.99999976;
        auVar97._0_4_ = auVar30._0_4_ * 0.99999976;
        auVar97._8_4_ = auVar30._8_4_ * 0.99999976;
        auVar97._12_4_ = auVar30._12_4_ * 0.99999976;
        auVar97._16_4_ = auVar30._16_4_ * 0.99999976;
        auVar97._20_4_ = auVar30._20_4_ * 0.99999976;
        auVar97._24_4_ = auVar30._24_4_ * 0.99999976;
        auVar97._28_4_ = 0x3f7ffffc;
        auVar195 = vmaxps_avx(auVar400,auVar97);
        auVar98._4_4_ = auVar195._4_4_ * auVar195._4_4_;
        auVar98._0_4_ = auVar195._0_4_ * auVar195._0_4_;
        auVar98._8_4_ = auVar195._8_4_ * auVar195._8_4_;
        auVar98._12_4_ = auVar195._12_4_ * auVar195._12_4_;
        auVar98._16_4_ = auVar195._16_4_ * auVar195._16_4_;
        auVar98._20_4_ = auVar195._20_4_ * auVar195._20_4_;
        auVar98._24_4_ = auVar195._24_4_ * auVar195._24_4_;
        auVar98._28_4_ = auVar195._28_4_;
        auVar30 = vsubps_avx(auVar184,auVar98);
        auVar99._4_4_ = auVar30._4_4_ * fVar166 * 4.0;
        auVar99._0_4_ = auVar30._0_4_ * fVar165 * 4.0;
        auVar99._8_4_ = auVar30._8_4_ * fVar167 * 4.0;
        auVar99._12_4_ = auVar30._12_4_ * fVar168 * 4.0;
        auVar99._16_4_ = auVar30._16_4_ * fVar402 * 4.0;
        auVar99._20_4_ = auVar30._20_4_ * fVar403 * 4.0;
        auVar99._24_4_ = auVar30._24_4_ * fVar404 * 4.0;
        auVar99._28_4_ = auVar195._28_4_;
        auVar430 = vsubps_avx(auVar81,auVar99);
        local_920 = vcmpps_avx(auVar430,ZEXT832(0) << 0x20,5);
        auVar195 = local_920;
        if ((((((((local_920 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_920 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_920 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_920 >> 0x7f,0) == '\0') &&
              (local_920 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_920 >> 0xbf,0) == '\0') &&
            (local_920 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_920[0x1f]) {
          _local_860 = ZEXT832(0) << 0x20;
          _local_880 = ZEXT832(0) << 0x20;
          auVar221 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar415 = ZEXT864(0) << 0x20;
          auVar247 = ZEXT828(0) << 0x20;
          auVar286._8_4_ = 0x7f800000;
          auVar286._0_8_ = 0x7f8000007f800000;
          auVar286._12_4_ = 0x7f800000;
          auVar286._16_4_ = 0x7f800000;
          auVar286._20_4_ = 0x7f800000;
          auVar286._24_4_ = 0x7f800000;
          auVar286._28_4_ = 0x7f800000;
          auVar310._8_4_ = 0xff800000;
          auVar310._0_8_ = 0xff800000ff800000;
          auVar310._12_4_ = 0xff800000;
          auVar310._16_4_ = 0xff800000;
          auVar310._20_4_ = 0xff800000;
          auVar310._24_4_ = 0xff800000;
          auVar310._28_4_ = 0xff800000;
          local_920 = auVar57;
          _local_840 = _local_860;
        }
        else {
          auVar32 = vsqrtps_avx(auVar430);
          auVar222._0_4_ = fVar165 + fVar165;
          auVar222._4_4_ = fVar166 + fVar166;
          auVar222._8_4_ = fVar167 + fVar167;
          auVar222._12_4_ = fVar168 + fVar168;
          auVar222._16_4_ = fVar402 + fVar402;
          auVar222._20_4_ = fVar403 + fVar403;
          auVar222._24_4_ = fVar404 + fVar404;
          auVar222._28_4_ = fVar171 + fVar171;
          auVar31 = vrcpps_avx(auVar222);
          fVar171 = auVar31._0_4_;
          fVar258 = auVar31._4_4_;
          auVar100._4_4_ = auVar222._4_4_ * fVar258;
          auVar100._0_4_ = auVar222._0_4_ * fVar171;
          fVar259 = auVar31._8_4_;
          auVar100._8_4_ = auVar222._8_4_ * fVar259;
          fVar260 = auVar31._12_4_;
          auVar100._12_4_ = auVar222._12_4_ * fVar260;
          fVar271 = auVar31._16_4_;
          auVar100._16_4_ = auVar222._16_4_ * fVar271;
          fVar272 = auVar31._20_4_;
          auVar100._20_4_ = auVar222._20_4_ * fVar272;
          fVar277 = auVar31._24_4_;
          auVar100._24_4_ = auVar222._24_4_ * fVar277;
          auVar100._28_4_ = auVar222._28_4_;
          auVar221 = vsubps_avx(auVar412,auVar100);
          fVar171 = fVar171 + fVar171 * auVar221._0_4_;
          fVar258 = fVar258 + fVar258 * auVar221._4_4_;
          fVar259 = fVar259 + fVar259 * auVar221._8_4_;
          fVar260 = fVar260 + fVar260 * auVar221._12_4_;
          fVar271 = fVar271 + fVar271 * auVar221._16_4_;
          fVar272 = fVar272 + fVar272 * auVar221._20_4_;
          fVar277 = fVar277 + fVar277 * auVar221._24_4_;
          fVar292 = auVar31._28_4_ + auVar221._28_4_;
          auVar252._0_8_ = local_980._0_8_ ^ 0x8000000080000000;
          auVar252._8_4_ = -local_980._8_4_;
          auVar252._12_4_ = -local_980._12_4_;
          auVar252._16_4_ = -local_980._16_4_;
          auVar252._20_4_ = -local_980._20_4_;
          auVar252._24_4_ = -local_980._24_4_;
          auVar252._28_4_ = -local_980._28_4_;
          auVar31 = vsubps_avx(auVar252,auVar32);
          fVar331 = auVar31._0_4_ * fVar171;
          fVar351 = auVar31._4_4_ * fVar258;
          auVar101._4_4_ = fVar351;
          auVar101._0_4_ = fVar331;
          fVar353 = auVar31._8_4_ * fVar259;
          auVar101._8_4_ = fVar353;
          fVar355 = auVar31._12_4_ * fVar260;
          auVar101._12_4_ = fVar355;
          fVar357 = auVar31._16_4_ * fVar271;
          auVar101._16_4_ = fVar357;
          fVar359 = auVar31._20_4_ * fVar272;
          auVar101._20_4_ = fVar359;
          fVar385 = auVar31._24_4_ * fVar277;
          auVar101._24_4_ = fVar385;
          auVar101._28_4_ = 0x80000000;
          auVar32 = vsubps_avx(auVar32,local_980);
          fVar171 = auVar32._0_4_ * fVar171;
          fVar258 = auVar32._4_4_ * fVar258;
          auVar102._4_4_ = fVar258;
          auVar102._0_4_ = fVar171;
          fVar259 = auVar32._8_4_ * fVar259;
          auVar102._8_4_ = fVar259;
          fVar260 = auVar32._12_4_ * fVar260;
          auVar102._12_4_ = fVar260;
          fVar271 = auVar32._16_4_ * fVar271;
          auVar102._16_4_ = fVar271;
          fVar272 = auVar32._20_4_ * fVar272;
          auVar102._20_4_ = fVar272;
          fVar277 = auVar32._24_4_ * fVar277;
          auVar102._24_4_ = fVar277;
          auVar102._28_4_ = auVar147._28_4_;
          fVar293 = (fVar331 * local_5a0 + fVar407) * fVar273;
          fVar294 = (fVar351 * fStack_59c + fVar416) * fVar296;
          fVar295 = (fVar353 * fStack_598 + fVar417) * fVar332;
          fVar323 = (fVar355 * fStack_594 + fVar418) * fVar373;
          fVar324 = (fVar357 * fStack_590 + fVar419) * fVar432;
          fVar327 = (fVar359 * fStack_58c + fVar420) * fVar297;
          fVar328 = (fVar385 * fStack_588 + fVar421) * fVar299;
          auStack_690._12_4_ = auVar34._28_4_;
          auVar189._0_4_ = fVar360 + fVar257 * fVar293;
          auVar189._4_4_ = fVar374 + fVar276 * fVar294;
          auVar189._8_4_ = fVar377 + fVar320 * fVar295;
          auVar189._12_4_ = fVar380 + fVar349 * fVar323;
          auVar189._16_4_ = fVar383 + fVar382 * fVar324;
          auVar189._20_4_ = fVar386 + fVar38 * fVar327;
          auVar189._24_4_ = fVar389 + fVar46 * fVar328;
          auVar189._28_4_ = fVar392 + auVar32._28_4_ + fVar422;
          auVar103._4_4_ = (float)local_a20._4_4_ * fVar351;
          auVar103._0_4_ = (float)local_a20._0_4_ * fVar331;
          auVar103._8_4_ = fStack_a18 * fVar353;
          auVar103._12_4_ = fStack_a14 * fVar355;
          auVar103._16_4_ = fStack_a10 * fVar357;
          auVar103._20_4_ = fStack_a0c * fVar359;
          auVar103._24_4_ = fStack_a08 * fVar385;
          auVar103._28_4_ = fVar292;
          auVar221 = vsubps_avx(auVar103,auVar189);
          auVar223._0_4_ = fVar361 + fVar255 * fVar293;
          auVar223._4_4_ = fVar375 + fVar274 * fVar294;
          auVar223._8_4_ = fVar378 + fVar298 * fVar295;
          auVar223._12_4_ = fVar381 + fVar336 * fVar323;
          auVar223._16_4_ = fVar384 + fVar376 * fVar324;
          auVar223._20_4_ = fVar387 + fVar36 * fVar327;
          auVar223._24_4_ = fVar390 + fVar44 * fVar328;
          auVar223._28_4_ = fVar393 + fVar292;
          auVar287._0_4_ = (float)local_a00._0_4_ * fVar331;
          auVar287._4_4_ = (float)local_a00._4_4_ * fVar351;
          auVar287._8_4_ = fStack_9f8 * fVar353;
          auVar287._12_4_ = fStack_9f4 * fVar355;
          auVar287._16_4_ = fStack_9f0 * fVar357;
          auVar287._20_4_ = fStack_9ec * fVar359;
          auVar287._24_4_ = fStack_9e8 * fVar385;
          auVar287._28_4_ = 0;
          auVar33 = vsubps_avx(auVar287,auVar223);
          auVar253._0_4_ = local_940 + fVar198 * fVar293;
          auVar253._4_4_ = fStack_93c + fVar275 * fVar294;
          auVar253._8_4_ = fStack_938 + fVar319 * fVar295;
          auVar253._12_4_ = fStack_934 + fVar348 * fVar323;
          auVar253._16_4_ = fStack_930 + fVar379 * fVar324;
          auVar253._20_4_ = fStack_92c + fVar37 * fVar327;
          auVar253._24_4_ = fStack_928 + fVar45 * fVar328;
          auVar253._28_4_ = fStack_924 + auVar31._28_4_;
          auVar104._4_4_ = fVar351 * (float)local_800._4_4_;
          auVar104._0_4_ = fVar331 * (float)local_800._0_4_;
          auVar104._8_4_ = fVar353 * fStack_7f8;
          auVar104._12_4_ = fVar355 * fStack_7f4;
          auVar104._16_4_ = fVar357 * fStack_7f0;
          auVar104._20_4_ = fVar359 * fStack_7ec;
          auVar104._24_4_ = fVar385 * fStack_7e8;
          auVar104._28_4_ = 0;
          auVar31 = vsubps_avx(auVar104,auVar253);
          auVar247 = auVar31._0_28_;
          fVar273 = (fVar171 * local_5a0 + fVar407) * fVar273;
          fVar296 = (fVar258 * fStack_59c + fVar416) * fVar296;
          fVar332 = (fVar259 * fStack_598 + fVar417) * fVar332;
          fVar373 = (fVar260 * fStack_594 + fVar418) * fVar373;
          fVar432 = (fVar271 * fStack_590 + fVar419) * fVar432;
          fVar297 = (fVar272 * fStack_58c + fVar420) * fVar297;
          fVar299 = (fVar277 * fStack_588 + fVar421) * fVar299;
          auVar311._0_4_ = fVar360 + fVar257 * fVar273;
          auVar311._4_4_ = fVar374 + fVar276 * fVar296;
          auVar311._8_4_ = fVar377 + fVar320 * fVar332;
          auVar311._12_4_ = fVar380 + fVar349 * fVar373;
          auVar311._16_4_ = fVar383 + fVar382 * fVar432;
          auVar311._20_4_ = fVar386 + fVar38 * fVar297;
          auVar311._24_4_ = fVar389 + fVar46 * fVar299;
          auVar311._28_4_ = fVar392 + (float)auStack_690._12_4_;
          auVar105._4_4_ = (float)local_a20._4_4_ * fVar258;
          auVar105._0_4_ = (float)local_a20._0_4_ * fVar171;
          auVar105._8_4_ = fStack_a18 * fVar259;
          auVar105._12_4_ = fStack_a14 * fVar260;
          auVar105._16_4_ = fStack_a10 * fVar271;
          auVar105._20_4_ = fStack_a0c * fVar272;
          auVar105._24_4_ = fStack_a08 * fVar277;
          auVar105._28_4_ = fStack_a04;
          _local_840 = vsubps_avx(auVar105,auVar311);
          auVar312._0_4_ = fVar361 + fVar255 * fVar273;
          auVar312._4_4_ = fVar375 + fVar274 * fVar296;
          auVar312._8_4_ = fVar378 + fVar298 * fVar332;
          auVar312._12_4_ = fVar381 + fVar336 * fVar373;
          auVar312._16_4_ = fVar384 + fVar376 * fVar432;
          auVar312._20_4_ = fVar387 + fVar36 * fVar297;
          auVar312._24_4_ = fVar390 + fVar44 * fVar299;
          auVar312._28_4_ = fVar393 + local_840._28_4_;
          auVar106._4_4_ = (float)local_a00._4_4_ * fVar258;
          auVar106._0_4_ = (float)local_a00._0_4_ * fVar171;
          auVar106._8_4_ = fStack_9f8 * fVar259;
          auVar106._12_4_ = fStack_9f4 * fVar260;
          auVar106._16_4_ = fStack_9f0 * fVar271;
          auVar106._20_4_ = fStack_9ec * fVar272;
          auVar106._24_4_ = fStack_9e8 * fVar277;
          auVar106._28_4_ = fStack_a04;
          _local_860 = vsubps_avx(auVar106,auVar312);
          auVar288._0_4_ = local_940 + fVar198 * fVar273;
          auVar288._4_4_ = fStack_93c + fVar275 * fVar296;
          auVar288._8_4_ = fStack_938 + fVar319 * fVar332;
          auVar288._12_4_ = fStack_934 + fVar348 * fVar373;
          auVar288._16_4_ = fStack_930 + fVar379 * fVar432;
          auVar288._20_4_ = fStack_92c + fVar37 * fVar297;
          auVar288._24_4_ = fStack_928 + fVar45 * fVar299;
          auVar288._28_4_ = fStack_924 + fVar422 + 0.0;
          auVar107._4_4_ = fVar258 * (float)local_800._4_4_;
          auVar107._0_4_ = fVar171 * (float)local_800._0_4_;
          auVar107._8_4_ = fVar259 * fStack_7f8;
          auVar107._12_4_ = fVar260 * fStack_7f4;
          auVar107._16_4_ = fVar271 * fStack_7f0;
          auVar107._20_4_ = fVar272 * fStack_7ec;
          auVar107._24_4_ = fVar277 * fStack_7e8;
          auVar107._28_4_ = local_860._28_4_;
          _local_880 = vsubps_avx(auVar107,auVar288);
          auVar32 = vcmpps_avx(auVar430,auVar400,5);
          auVar289._8_4_ = 0x7f800000;
          auVar289._0_8_ = 0x7f8000007f800000;
          auVar289._12_4_ = 0x7f800000;
          auVar289._16_4_ = 0x7f800000;
          auVar289._20_4_ = 0x7f800000;
          auVar289._24_4_ = 0x7f800000;
          auVar289._28_4_ = 0x7f800000;
          auVar286 = vblendvps_avx(auVar289,auVar101,auVar32);
          auVar413._8_4_ = 0x7fffffff;
          auVar413._0_8_ = 0x7fffffff7fffffff;
          auVar413._12_4_ = 0x7fffffff;
          auVar413._16_4_ = 0x7fffffff;
          auVar413._20_4_ = 0x7fffffff;
          auVar413._24_4_ = 0x7fffffff;
          auVar413._28_4_ = 0x7fffffff;
          auVar31 = vandps_avx(auVar413,local_360);
          auVar31 = vmaxps_avx(local_540,auVar31);
          auVar430._8_4_ = 0x36000000;
          auVar430._0_8_ = 0x3600000036000000;
          auVar430._12_4_ = 0x36000000;
          auVar430._16_4_ = 0x36000000;
          auVar430._20_4_ = 0x36000000;
          auVar430._24_4_ = 0x36000000;
          auVar430._28_4_ = 0x36000000;
          auVar108._4_4_ = auVar31._4_4_ * 1.9073486e-06;
          auVar108._0_4_ = auVar31._0_4_ * 1.9073486e-06;
          auVar108._8_4_ = auVar31._8_4_ * 1.9073486e-06;
          auVar108._12_4_ = auVar31._12_4_ * 1.9073486e-06;
          auVar108._16_4_ = auVar31._16_4_ * 1.9073486e-06;
          auVar108._20_4_ = auVar31._20_4_ * 1.9073486e-06;
          auVar108._24_4_ = auVar31._24_4_ * 1.9073486e-06;
          auVar108._28_4_ = auVar31._28_4_;
          auVar31 = vandps_avx(auVar413,local_580);
          auVar31 = vcmpps_avx(auVar31,auVar108,1);
          auVar313._8_4_ = 0xff800000;
          auVar313._0_8_ = 0xff800000ff800000;
          auVar313._12_4_ = 0xff800000;
          auVar313._16_4_ = 0xff800000;
          auVar313._20_4_ = 0xff800000;
          auVar313._24_4_ = 0xff800000;
          auVar313._28_4_ = 0xff800000;
          auVar310 = vblendvps_avx(auVar313,auVar102,auVar32);
          auVar400 = auVar32 & auVar31;
          if ((((((((auVar400 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar400 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar400 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar400 >> 0x7f,0) != '\0') ||
                (auVar400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar400 >> 0xbf,0) != '\0') ||
              (auVar400 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar400[0x1f] < '\0') {
            auVar195 = vandps_avx(auVar31,auVar32);
            auVar213 = vpackssdw_avx(auVar195._0_16_,auVar195._16_16_);
            auVar31 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,2);
            auVar469._8_4_ = 0xff800000;
            auVar469._0_8_ = 0xff800000ff800000;
            auVar469._12_4_ = 0xff800000;
            auVar469._16_4_ = 0xff800000;
            auVar469._20_4_ = 0xff800000;
            auVar469._24_4_ = 0xff800000;
            auVar469._28_4_ = 0xff800000;
            auVar453._8_4_ = 0x7f800000;
            auVar453._0_8_ = 0x7f8000007f800000;
            auVar453._12_4_ = 0x7f800000;
            auVar453._16_4_ = 0x7f800000;
            auVar453._20_4_ = 0x7f800000;
            auVar453._24_4_ = 0x7f800000;
            auVar453._28_4_ = 0x7f800000;
            auVar30 = vblendvps_avx(auVar453,auVar469,auVar31);
            auVar143 = vpmovsxwd_avx(auVar213);
            auVar213 = vpunpckhwd_avx(auVar213,auVar213);
            auVar414._16_16_ = auVar213;
            auVar414._0_16_ = auVar143;
            auVar286 = vblendvps_avx(auVar286,auVar30,auVar414);
            auVar430 = vblendvps_avx(auVar469,auVar453,auVar31);
            auVar310 = vblendvps_avx(auVar310,auVar430,auVar414);
            auVar30 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
            auVar160._0_4_ = auVar30._0_4_ ^ auVar195._0_4_;
            auVar160._4_4_ = auVar30._4_4_ ^ auVar195._4_4_;
            auVar160._8_4_ = auVar30._8_4_ ^ auVar195._8_4_;
            auVar160._12_4_ = auVar30._12_4_ ^ auVar195._12_4_;
            auVar160._16_4_ = auVar30._16_4_ ^ auVar195._16_4_;
            auVar160._20_4_ = auVar30._20_4_ ^ auVar195._20_4_;
            auVar160._24_4_ = auVar30._24_4_ ^ auVar195._24_4_;
            auVar160._28_4_ = auVar30._28_4_ ^ auVar195._28_4_;
            auVar195 = vorps_avx(auVar31,auVar160);
            auVar195 = vandps_avx(auVar32,auVar195);
          }
          auVar415 = ZEXT3264(auVar33);
          local_960 = auVar221;
        }
        auVar431 = ZEXT3264(auVar430);
        auVar440 = ZEXT3264(auVar147);
        auVar401 = ZEXT1664(auVar209);
        _local_3e0 = _local_820;
        local_3c0 = vminps_avx(local_380,auVar286);
        _local_6c0 = vmaxps_avx(_local_820,auVar310);
        auVar314 = ZEXT3264(_local_6c0);
        local_3a0 = _local_6c0;
        auVar30 = vcmpps_avx(_local_820,local_3c0,2);
        local_600 = vandps_avx(auVar147,auVar30);
        auVar291 = ZEXT3264(local_600);
        auVar30 = vcmpps_avx(_local_6c0,local_380,2);
        local_640 = vandps_avx(auVar147,auVar30);
        auVar347 = ZEXT3264(local_640);
        auVar147 = vorps_avx(local_640,local_600);
        if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar147 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar147 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar147 >> 0x7f,0) != '\0') ||
              (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar147 >> 0xbf,0) != '\0') ||
            (auVar147 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar147[0x1f] < '\0') {
          local_8a0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          local_660._0_4_ = auVar195._0_4_ ^ local_8a0._0_4_;
          local_660._4_4_ = auVar195._4_4_ ^ local_8a0._4_4_;
          local_660._8_4_ = auVar195._8_4_ ^ local_8a0._8_4_;
          local_660._12_4_ = auVar195._12_4_ ^ local_8a0._12_4_;
          local_660._16_4_ = auVar195._16_4_ ^ local_8a0._16_4_;
          local_660._20_4_ = auVar195._20_4_ ^ local_8a0._20_4_;
          local_660._24_4_ = auVar195._24_4_ ^ local_8a0._24_4_;
          local_660._28_4_ = (uint)auVar195._28_4_ ^ (uint)local_8a0._28_4_;
          auVar314 = ZEXT3264(_local_a00);
          auVar10 = local_800._0_28_;
          auVar291 = ZEXT3264(_local_800);
          auVar155._0_4_ =
               (float)local_a20._0_4_ * auVar221._0_4_ +
               auVar415._0_4_ * (float)local_a00._0_4_ + (float)local_800._0_4_ * auVar247._0_4_;
          auVar155._4_4_ =
               (float)local_a20._4_4_ * auVar221._4_4_ +
               auVar415._4_4_ * (float)local_a00._4_4_ + (float)local_800._4_4_ * auVar247._4_4_;
          auVar155._8_4_ =
               fStack_a18 * auVar221._8_4_ +
               auVar415._8_4_ * fStack_9f8 + fStack_7f8 * auVar247._8_4_;
          auVar155._12_4_ =
               fStack_a14 * auVar221._12_4_ +
               auVar415._12_4_ * fStack_9f4 + fStack_7f4 * auVar247._12_4_;
          auVar155._16_4_ =
               fStack_a10 * auVar221._16_4_ +
               auVar415._16_4_ * fStack_9f0 + fStack_7f0 * auVar247._16_4_;
          auVar155._20_4_ =
               fStack_a0c * auVar221._20_4_ +
               auVar415._20_4_ * fStack_9ec + fStack_7ec * auVar247._20_4_;
          auVar155._24_4_ =
               fStack_a08 * auVar221._24_4_ +
               auVar415._24_4_ * fStack_9e8 + fStack_7e8 * auVar247._24_4_;
          auVar155._28_4_ = auVar195._28_4_ + local_8a0._28_4_ + auVar221._28_4_;
          auVar190._8_4_ = 0x7fffffff;
          auVar190._0_8_ = 0x7fffffff7fffffff;
          auVar190._12_4_ = 0x7fffffff;
          auVar190._16_4_ = 0x7fffffff;
          auVar190._20_4_ = 0x7fffffff;
          auVar190._24_4_ = 0x7fffffff;
          auVar190._28_4_ = 0x7fffffff;
          auVar147 = vandps_avx(auVar155,auVar190);
          auVar191._8_4_ = 0x3e99999a;
          auVar191._0_8_ = 0x3e99999a3e99999a;
          auVar191._12_4_ = 0x3e99999a;
          auVar191._16_4_ = 0x3e99999a;
          auVar191._20_4_ = 0x3e99999a;
          auVar191._24_4_ = 0x3e99999a;
          auVar191._28_4_ = 0x3e99999a;
          auVar147 = vcmpps_avx(auVar147,auVar191,1);
          auVar147 = vorps_avx(local_660,auVar147);
          auVar192._8_4_ = 3;
          auVar192._0_8_ = 0x300000003;
          auVar192._12_4_ = 3;
          auVar192._16_4_ = 3;
          auVar192._20_4_ = 3;
          auVar192._24_4_ = 3;
          auVar192._28_4_ = 3;
          auVar224._8_4_ = 2;
          auVar224._0_8_ = 0x200000002;
          auVar224._12_4_ = 2;
          auVar224._16_4_ = 2;
          auVar224._20_4_ = 2;
          auVar224._24_4_ = 2;
          auVar224._28_4_ = 2;
          auVar147 = vblendvps_avx(auVar224,auVar192,auVar147);
          local_680 = ZEXT432(local_be8);
          local_6a0 = vpshufd_avx(ZEXT416(local_be8),0);
          fVar171 = 0.0;
          auVar213 = vpcmpgtd_avx(auVar147._16_16_,local_6a0);
          auStack_690 = auVar34._16_16_;
          auVar143 = vpcmpgtd_avx(auVar147._0_16_,local_6a0);
          auVar193._16_16_ = auVar213;
          auVar193._0_16_ = auVar143;
          local_620 = vblendps_avx(ZEXT1632(auVar143),auVar193,0xf0);
          local_5e0 = vandnps_avx(local_620,local_600);
          auVar347 = ZEXT3264(local_5e0);
          auVar147 = local_600 & ~local_620;
          local_ae0 = auVar13._0_4_;
          fStack_adc = auVar13._4_4_;
          fStack_ad8 = auVar13._8_4_;
          fStack_ad4 = auVar13._12_4_;
          local_ac0 = auVar53._0_4_;
          fStack_abc = auVar53._4_4_;
          fStack_ab8 = auVar53._8_4_;
          fStack_ab4 = auVar53._12_4_;
          local_ad0 = auVar12._0_4_;
          fStack_acc = auVar12._4_4_;
          fStack_ac8 = auVar12._8_4_;
          fStack_ac4 = auVar12._12_4_;
          local_ab0 = auVar11._0_4_;
          fStack_aac = auVar11._4_4_;
          fStack_aa8 = auVar11._8_4_;
          fStack_aa4 = auVar11._12_4_;
          if ((((((((auVar147 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar147 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar147 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar147 >> 0x7f,0) == '\0') &&
                (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar147 >> 0xbf,0) == '\0') &&
              (auVar147 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar147[0x1f]) {
            auVar213 = vshufps_avx(auVar209,auVar209,0);
            auVar156._16_16_ = auVar213;
            auVar156._0_16_ = auVar213;
            fVar257 = (float)local_a20._0_4_;
            fVar258 = (float)local_a20._4_4_;
            fVar259 = fStack_a18;
            fVar260 = fStack_a14;
            fVar271 = fStack_a10;
            fVar272 = fStack_a0c;
            fVar273 = fStack_a08;
          }
          else {
            local_9a0._4_4_ = (float)local_820._4_4_ + fVar233;
            local_9a0._0_4_ = (float)local_820._0_4_ + fVar163;
            fStack_998 = fStack_818 + fVar169;
            fStack_994 = fStack_814 + fVar256;
            fStack_990 = fStack_810 + fVar163;
            fStack_98c = fStack_80c + fVar233;
            fStack_988 = fStack_808 + fVar169;
            fStack_984 = fStack_804 + fVar256;
            do {
              auVar157._8_4_ = 0x7f800000;
              auVar157._0_8_ = 0x7f8000007f800000;
              auVar157._12_4_ = 0x7f800000;
              auVar157._16_4_ = 0x7f800000;
              auVar157._20_4_ = 0x7f800000;
              auVar157._24_4_ = 0x7f800000;
              auVar157._28_4_ = 0x7f800000;
              auVar147 = auVar347._0_32_;
              auVar195 = vblendvps_avx(auVar157,_local_820,auVar147);
              auVar30 = vshufps_avx(auVar195,auVar195,0xb1);
              auVar30 = vminps_avx(auVar195,auVar30);
              auVar31 = vshufpd_avx(auVar30,auVar30,5);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar31 = vperm2f128_avx(auVar30,auVar30,1);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar195 = vcmpps_avx(auVar195,auVar30,0);
              auVar30 = auVar147 & auVar195;
              if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar30 >> 0x7f,0) != '\0') ||
                    (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0xbf,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar30[0x1f] < '\0') {
                auVar147 = vandps_avx(auVar195,auVar147);
              }
              uVar121 = vmovmskps_avx(auVar147);
              uVar124 = 0;
              if (uVar121 != 0) {
                for (; (uVar121 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
                }
              }
              uVar123 = (ulong)uVar124;
              *(undefined4 *)(local_5e0 + uVar123 * 4) = 0;
              fVar171 = local_1a0[uVar123];
              uVar124 = *(uint *)(local_3e0 + uVar123 * 4);
              fVar255 = auVar175._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar255 = sqrtf((float)local_9c0._0_4_);
              }
              auVar209 = vminps_avx(auVar11,auVar12);
              auVar213 = vmaxps_avx(auVar11,auVar12);
              auVar143 = vminps_avx(auVar53,auVar13);
              auVar179 = vminps_avx(auVar209,auVar143);
              auVar209 = vmaxps_avx(auVar53,auVar13);
              auVar143 = vmaxps_avx(auVar213,auVar209);
              auVar237._8_4_ = 0x7fffffff;
              auVar237._0_8_ = 0x7fffffff7fffffff;
              auVar237._12_4_ = 0x7fffffff;
              auVar213 = vandps_avx(auVar179,auVar237);
              auVar209 = vandps_avx(auVar143,auVar237);
              auVar213 = vmaxps_avx(auVar213,auVar209);
              auVar209 = vmovshdup_avx(auVar213);
              auVar209 = vmaxss_avx(auVar209,auVar213);
              auVar213 = vshufpd_avx(auVar213,auVar213,1);
              auVar213 = vmaxss_avx(auVar213,auVar209);
              fVar198 = auVar213._0_4_ * 1.9073486e-06;
              local_920._0_4_ = fVar255 * 1.9073486e-06;
              local_7e0._0_16_ = vshufps_avx(auVar143,auVar143,0xff);
              auVar213 = vinsertps_avx(ZEXT416(uVar124),ZEXT416((uint)fVar171),0x10);
              auVar401 = ZEXT1664(auVar213);
              bVar132 = true;
              uVar123 = 0;
              do {
                auVar394 = auVar401._0_16_;
                auVar213 = vmovshdup_avx(auVar394);
                fVar171 = auVar213._0_4_;
                fVar259 = 1.0 - fVar171;
                fVar255 = fVar259 * fVar259 * fVar259;
                fVar257 = fVar171 * fVar171 * fVar171;
                fVar258 = fVar171 * fVar259;
                auVar213 = vshufps_avx(ZEXT416((uint)(fVar257 * 0.16666667)),
                                       ZEXT416((uint)(fVar257 * 0.16666667)),0);
                auVar209 = ZEXT416((uint)((fVar257 * 4.0 + fVar255 +
                                          fVar171 * fVar258 * 12.0 + fVar259 * fVar258 * 6.0) *
                                         0.16666667));
                auVar209 = vshufps_avx(auVar209,auVar209,0);
                auVar143 = ZEXT416((uint)((fVar255 * 4.0 + fVar257 +
                                          fVar259 * fVar258 * 12.0 + fVar171 * fVar258 * 6.0) *
                                         0.16666667));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar179 = vshufps_avx(auVar394,auVar394,0);
                auVar203._0_4_ = auVar179._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar203._4_4_ = auVar179._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar203._8_4_ = auVar179._8_4_ * fStack_9a8 + 0.0;
                auVar203._12_4_ = auVar179._12_4_ * fStack_9a4 + 0.0;
                auVar179 = vshufps_avx(ZEXT416((uint)(fVar255 * 0.16666667)),
                                       ZEXT416((uint)(fVar255 * 0.16666667)),0);
                auVar137._0_4_ =
                     auVar179._0_4_ * local_ab0 +
                     auVar143._0_4_ * local_ad0 +
                     auVar213._0_4_ * local_ae0 + auVar209._0_4_ * local_ac0;
                auVar137._4_4_ =
                     auVar179._4_4_ * fStack_aac +
                     auVar143._4_4_ * fStack_acc +
                     auVar213._4_4_ * fStack_adc + auVar209._4_4_ * fStack_abc;
                auVar137._8_4_ =
                     auVar179._8_4_ * fStack_aa8 +
                     auVar143._8_4_ * fStack_ac8 +
                     auVar213._8_4_ * fStack_ad8 + auVar209._8_4_ * fStack_ab8;
                auVar137._12_4_ =
                     auVar179._12_4_ * fStack_aa4 +
                     auVar143._12_4_ * fStack_ac4 +
                     auVar213._12_4_ * fStack_ad4 + auVar209._12_4_ * fStack_ab4;
                local_960._0_16_ = auVar137;
                auVar213 = vsubps_avx(auVar203,auVar137);
                local_940 = auVar213._0_4_;
                fStack_93c = auVar213._4_4_;
                fStack_938 = auVar213._8_4_;
                fStack_934 = auVar213._12_4_;
                auVar213 = vdpps_avx(auVar213,auVar213,0x7f);
                fVar255 = auVar213._0_4_;
                local_be0 = auVar401._0_4_;
                if (fVar255 < 0.0) {
                  fVar257 = sqrtf(fVar255);
                }
                else {
                  auVar209 = vsqrtss_avx(auVar213,auVar213);
                  fVar257 = auVar209._0_4_;
                }
                auVar209 = ZEXT416((uint)(fVar171 * fVar171 * 0.5));
                auVar209 = vshufps_avx(auVar209,auVar209,0);
                auVar143 = ZEXT416((uint)((fVar259 * fVar259 + fVar258 * 4.0) * 0.5));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar179 = ZEXT416((uint)((fVar171 * -fVar171 - fVar258 * 4.0) * 0.5));
                auVar179 = vshufps_avx(auVar179,auVar179,0);
                auVar142 = ZEXT416((uint)(fVar259 * -fVar259 * 0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar362._0_4_ =
                     local_ab0 * auVar142._0_4_ +
                     local_ad0 * auVar179._0_4_ +
                     local_ae0 * auVar209._0_4_ + local_ac0 * auVar143._0_4_;
                auVar362._4_4_ =
                     fStack_aac * auVar142._4_4_ +
                     fStack_acc * auVar179._4_4_ +
                     fStack_adc * auVar209._4_4_ + fStack_abc * auVar143._4_4_;
                auVar362._8_4_ =
                     fStack_aa8 * auVar142._8_4_ +
                     fStack_ac8 * auVar179._8_4_ +
                     fStack_ad8 * auVar209._8_4_ + fStack_ab8 * auVar143._8_4_;
                auVar362._12_4_ =
                     fStack_aa4 * auVar142._12_4_ +
                     fStack_ac4 * auVar179._12_4_ +
                     fStack_ad4 * auVar209._12_4_ + fStack_ab4 * auVar143._12_4_;
                auVar209 = vshufps_avx(auVar394,auVar394,0x55);
                auVar143 = ZEXT416((uint)(fVar259 - (fVar171 + fVar171)));
                auVar179 = vshufps_avx(auVar143,auVar143,0);
                auVar143 = ZEXT416((uint)(fVar171 - (fVar259 + fVar259)));
                auVar142 = vshufps_avx(auVar143,auVar143,0);
                auVar14 = vshufps_avx(ZEXT416((uint)fVar259),ZEXT416((uint)fVar259),0);
                auVar143 = vdpps_avx(auVar362,auVar362,0x7f);
                auVar176._0_4_ =
                     local_ab0 * auVar14._0_4_ +
                     local_ad0 * auVar142._0_4_ +
                     local_ae0 * auVar209._0_4_ + local_ac0 * auVar179._0_4_;
                auVar176._4_4_ =
                     fStack_aac * auVar14._4_4_ +
                     fStack_acc * auVar142._4_4_ +
                     fStack_adc * auVar209._4_4_ + fStack_abc * auVar179._4_4_;
                auVar176._8_4_ =
                     fStack_aa8 * auVar14._8_4_ +
                     fStack_ac8 * auVar142._8_4_ +
                     fStack_ad8 * auVar209._8_4_ + fStack_ab8 * auVar179._8_4_;
                auVar176._12_4_ =
                     fStack_aa4 * auVar14._12_4_ +
                     fStack_ac4 * auVar142._12_4_ +
                     fStack_ad4 * auVar209._12_4_ + fStack_ab4 * auVar179._12_4_;
                auVar209 = vblendps_avx(auVar143,_DAT_01f7aa10,0xe);
                auVar179 = vrsqrtss_avx(auVar209,auVar209);
                fVar258 = auVar179._0_4_;
                fVar171 = auVar143._0_4_;
                auVar179 = vdpps_avx(auVar362,auVar176,0x7f);
                auVar142 = vshufps_avx(auVar143,auVar143,0);
                auVar177._0_4_ = auVar176._0_4_ * auVar142._0_4_;
                auVar177._4_4_ = auVar176._4_4_ * auVar142._4_4_;
                auVar177._8_4_ = auVar176._8_4_ * auVar142._8_4_;
                auVar177._12_4_ = auVar176._12_4_ * auVar142._12_4_;
                auVar179 = vshufps_avx(auVar179,auVar179,0);
                auVar263._0_4_ = auVar362._0_4_ * auVar179._0_4_;
                auVar263._4_4_ = auVar362._4_4_ * auVar179._4_4_;
                auVar263._8_4_ = auVar362._8_4_ * auVar179._8_4_;
                auVar263._12_4_ = auVar362._12_4_ * auVar179._12_4_;
                auVar14 = vsubps_avx(auVar177,auVar263);
                auVar179 = vrcpss_avx(auVar209,auVar209);
                auVar209 = vmaxss_avx(ZEXT416((uint)fVar198),
                                      ZEXT416((uint)(local_be0 * (float)local_920._0_4_)));
                auVar415 = ZEXT1664(auVar209);
                auVar179 = ZEXT416((uint)(auVar179._0_4_ * (2.0 - fVar171 * auVar179._0_4_)));
                auVar179 = vshufps_avx(auVar179,auVar179,0);
                uVar110 = CONCAT44(auVar362._4_4_,auVar362._0_4_);
                auVar280._0_8_ = uVar110 ^ 0x8000000080000000;
                auVar280._8_4_ = -auVar362._8_4_;
                auVar280._12_4_ = -auVar362._12_4_;
                auVar142 = ZEXT416((uint)(fVar258 * 1.5 +
                                         fVar171 * -0.5 * fVar258 * fVar258 * fVar258));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar238._0_4_ = auVar142._0_4_ * auVar14._0_4_ * auVar179._0_4_;
                auVar238._4_4_ = auVar142._4_4_ * auVar14._4_4_ * auVar179._4_4_;
                auVar238._8_4_ = auVar142._8_4_ * auVar14._8_4_ * auVar179._8_4_;
                auVar238._12_4_ = auVar142._12_4_ * auVar14._12_4_ * auVar179._12_4_;
                auVar303._0_4_ = auVar362._0_4_ * auVar142._0_4_;
                auVar303._4_4_ = auVar362._4_4_ * auVar142._4_4_;
                auVar303._8_4_ = auVar362._8_4_ * auVar142._8_4_;
                auVar303._12_4_ = auVar362._12_4_ * auVar142._12_4_;
                if (fVar171 < 0.0) {
                  local_9e0._0_16_ = auVar238;
                  fVar171 = sqrtf(fVar171);
                  auVar415 = ZEXT464(auVar209._0_4_);
                  auVar238 = local_9e0._0_16_;
                }
                else {
                  auVar143 = vsqrtss_avx(auVar143,auVar143);
                  fVar171 = auVar143._0_4_;
                }
                auVar115._4_4_ = fStack_93c;
                auVar115._0_4_ = local_940;
                auVar115._8_4_ = fStack_938;
                auVar115._12_4_ = fStack_934;
                auVar143 = vdpps_avx(auVar115,auVar303,0x7f);
                fVar171 = (fVar198 / fVar171) * (fVar257 + 1.0) + auVar415._0_4_ + fVar257 * fVar198
                ;
                auVar179 = vdpps_avx(auVar280,auVar303,0x7f);
                auVar142 = vdpps_avx(auVar115,auVar238,0x7f);
                auVar14 = vdpps_avx(_local_9b0,auVar303,0x7f);
                auVar15 = vdpps_avx(auVar115,auVar280,0x7f);
                fVar257 = auVar179._0_4_ + auVar142._0_4_;
                fVar258 = auVar143._0_4_;
                auVar138._0_4_ = fVar258 * fVar258;
                auVar138._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                auVar138._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                auVar138._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                auVar142 = vsubps_avx(auVar213,auVar138);
                auVar179 = vdpps_avx(auVar115,_local_9b0,0x7f);
                fVar259 = auVar15._0_4_ - fVar258 * fVar257;
                fVar260 = auVar179._0_4_ - fVar258 * auVar14._0_4_;
                auVar179 = vrsqrtss_avx(auVar142,auVar142);
                fVar271 = auVar142._0_4_;
                fVar258 = auVar179._0_4_;
                fVar258 = fVar258 * 1.5 + fVar271 * -0.5 * fVar258 * fVar258 * fVar258;
                if (fVar271 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar257);
                  local_7a0._0_4_ = fVar259;
                  local_7c0._0_4_ = fVar260;
                  local_980._0_4_ = fVar258;
                  fVar271 = sqrtf(fVar271);
                  auVar415 = ZEXT464(auVar209._0_4_);
                  fVar258 = (float)local_980._0_4_;
                  fVar259 = (float)local_7a0._0_4_;
                  fVar260 = (float)local_7c0._0_4_;
                  auVar209 = local_9e0._0_16_;
                }
                else {
                  auVar209 = vsqrtss_avx(auVar142,auVar142);
                  fVar271 = auVar209._0_4_;
                  auVar209 = ZEXT416((uint)fVar257);
                }
                auVar440 = ZEXT1664(auVar143);
                auVar431 = ZEXT464((uint)fVar171);
                auVar182 = vpermilps_avx(local_960._0_16_,0xff);
                auVar15 = vshufps_avx(auVar362,auVar362,0xff);
                fVar257 = fVar259 * fVar258 - auVar15._0_4_;
                auVar264._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
                auVar264._8_4_ = auVar14._8_4_ ^ 0x80000000;
                auVar264._12_4_ = auVar14._12_4_ ^ 0x80000000;
                auVar281._0_4_ = -fVar257;
                auVar281._4_4_ = 0x80000000;
                auVar281._8_4_ = 0x80000000;
                auVar281._12_4_ = 0x80000000;
                auVar291 = ZEXT1664(auVar281);
                auVar179 = vinsertps_avx(auVar281,ZEXT416((uint)(fVar260 * fVar258)),0x1c);
                auVar142 = vmovsldup_avx(ZEXT416((uint)(auVar209._0_4_ * fVar260 * fVar258 -
                                                       auVar14._0_4_ * fVar257)));
                auVar179 = vdivps_avx(auVar179,auVar142);
                auVar209 = vinsertps_avx(auVar209,auVar264,0x10);
                auVar209 = vdivps_avx(auVar209,auVar142);
                auVar142 = vmovsldup_avx(auVar143);
                auVar182 = ZEXT416((uint)(fVar271 - auVar182._0_4_));
                auVar14 = vmovsldup_avx(auVar182);
                auVar204._0_4_ = auVar142._0_4_ * auVar179._0_4_ + auVar14._0_4_ * auVar209._0_4_;
                auVar204._4_4_ = auVar142._4_4_ * auVar179._4_4_ + auVar14._4_4_ * auVar209._4_4_;
                auVar204._8_4_ = auVar142._8_4_ * auVar179._8_4_ + auVar14._8_4_ * auVar209._8_4_;
                auVar204._12_4_ =
                     auVar142._12_4_ * auVar179._12_4_ + auVar14._12_4_ * auVar209._12_4_;
                auVar179 = vsubps_avx(auVar394,auVar204);
                auVar401 = ZEXT1664(auVar179);
                auVar205._8_4_ = 0x7fffffff;
                auVar205._0_8_ = 0x7fffffff7fffffff;
                auVar205._12_4_ = 0x7fffffff;
                auVar209 = vandps_avx(auVar143,auVar205);
                fVar257 = (float)local_a20._0_4_;
                fVar258 = (float)local_a20._4_4_;
                fVar259 = fStack_a18;
                fVar260 = fStack_a14;
                fVar271 = fStack_a10;
                fVar272 = fStack_a0c;
                fVar273 = fStack_a08;
                if (auVar209._0_4_ < fVar171) {
                  auVar239._8_4_ = 0x7fffffff;
                  auVar239._0_8_ = 0x7fffffff7fffffff;
                  auVar239._12_4_ = 0x7fffffff;
                  auVar209 = vandps_avx(auVar182,auVar239);
                  if (auVar209._0_4_ <
                      (float)local_7e0._0_4_ * 1.9073486e-06 + auVar415._0_4_ + fVar171) {
                    fVar198 = auVar179._0_4_ + (float)local_8d0._0_4_;
                    auVar314 = ZEXT3264(_local_a00);
                    if (fVar198 < fVar234) {
                      bVar133 = 0;
                    }
                    else {
                      fVar274 = *(float *)(ray + k * 4 + 0x80);
                      auVar415 = ZEXT464((uint)fVar274);
                      if (fVar274 < fVar198) {
                        bVar133 = 0;
                      }
                      else {
                        auVar209 = vmovshdup_avx(auVar179);
                        bVar133 = 0;
                        if ((0.0 <= auVar209._0_4_) && (auVar209._0_4_ <= 1.0)) {
                          auVar213 = vrsqrtss_avx(auVar213,auVar213);
                          fVar275 = auVar213._0_4_;
                          pGVar25 = (context->scene->geometries).items[uVar120].ptr;
                          if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                            bVar133 = 0;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar133 = 1, pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0
                                  )) {
                            auVar213 = ZEXT416((uint)(fVar275 * 1.5 +
                                                     fVar255 * -0.5 * fVar275 * fVar275 * fVar275));
                            auVar213 = vshufps_avx(auVar213,auVar213,0);
                            auVar206._0_4_ = auVar213._0_4_ * local_940;
                            auVar206._4_4_ = auVar213._4_4_ * fStack_93c;
                            auVar206._8_4_ = auVar213._8_4_ * fStack_938;
                            auVar206._12_4_ = auVar213._12_4_ * fStack_934;
                            auVar139._0_4_ = auVar362._0_4_ + auVar15._0_4_ * auVar206._0_4_;
                            auVar139._4_4_ = auVar362._4_4_ + auVar15._4_4_ * auVar206._4_4_;
                            auVar139._8_4_ = auVar362._8_4_ + auVar15._8_4_ * auVar206._8_4_;
                            auVar139._12_4_ = auVar362._12_4_ + auVar15._12_4_ * auVar206._12_4_;
                            auVar213 = vshufps_avx(auVar206,auVar206,0xc9);
                            auVar209 = vshufps_avx(auVar362,auVar362,0xc9);
                            auVar207._0_4_ = auVar209._0_4_ * auVar206._0_4_;
                            auVar207._4_4_ = auVar209._4_4_ * auVar206._4_4_;
                            auVar207._8_4_ = auVar209._8_4_ * auVar206._8_4_;
                            auVar207._12_4_ = auVar209._12_4_ * auVar206._12_4_;
                            auVar240._0_4_ = auVar362._0_4_ * auVar213._0_4_;
                            auVar240._4_4_ = auVar362._4_4_ * auVar213._4_4_;
                            auVar240._8_4_ = auVar362._8_4_ * auVar213._8_4_;
                            auVar240._12_4_ = auVar362._12_4_ * auVar213._12_4_;
                            auVar394 = vsubps_avx(auVar240,auVar207);
                            auVar213 = vshufps_avx(auVar394,auVar394,0xc9);
                            auVar209 = vshufps_avx(auVar139,auVar139,0xc9);
                            auVar241._0_4_ = auVar209._0_4_ * auVar213._0_4_;
                            auVar241._4_4_ = auVar209._4_4_ * auVar213._4_4_;
                            auVar241._8_4_ = auVar209._8_4_ * auVar213._8_4_;
                            auVar241._12_4_ = auVar209._12_4_ * auVar213._12_4_;
                            auVar213 = vshufps_avx(auVar394,auVar394,0xd2);
                            auVar140._0_4_ = auVar139._0_4_ * auVar213._0_4_;
                            auVar140._4_4_ = auVar139._4_4_ * auVar213._4_4_;
                            auVar140._8_4_ = auVar139._8_4_ * auVar213._8_4_;
                            auVar140._12_4_ = auVar139._12_4_ * auVar213._12_4_;
                            auVar213 = vsubps_avx(auVar241,auVar140);
                            local_730 = vshufps_avx(auVar179,auVar179,0x55);
                            local_760 = (RTCHitN  [16])vshufps_avx(auVar213,auVar213,0x55);
                            auStack_750 = vshufps_avx(auVar213,auVar213,0xaa);
                            local_740 = vshufps_avx(auVar213,auVar213,0);
                            local_720 = ZEXT816(0) << 0x20;
                            local_710 = local_780._0_8_;
                            uStack_708 = local_780._8_8_;
                            local_700 = local_770._0_8_;
                            uStack_6f8 = local_770._8_8_;
                            uVar124 = context->user->instID[0];
                            _local_6f0 = CONCAT44(uVar124,uVar124);
                            _uStack_6e8 = CONCAT44(uVar124,uVar124);
                            uVar124 = context->user->instPrimID[0];
                            _uStack_6e0 = CONCAT44(uVar124,uVar124);
                            _uStack_6d8 = CONCAT44(uVar124,uVar124);
                            *(float *)(ray + k * 4 + 0x80) = fVar198;
                            auVar213 = *(undefined1 (*) [16])
                                        (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                            local_900._0_16_ = auVar213;
                            local_a50.valid = (int *)local_900;
                            local_a50.geometryUserPtr = pGVar25->userPtr;
                            local_a50.context = context->user;
                            local_a50.hit = local_760;
                            local_a50.N = 4;
                            local_a50.ray = (RTCRayN *)ray;
                            if (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar291 = ZEXT1664(auVar281);
                              auVar401 = ZEXT1664(auVar179);
                              auVar431 = ZEXT464((uint)fVar171);
                              auVar440 = ZEXT1664(auVar143);
                              (*pGVar25->occlusionFilterN)(&local_a50);
                              auVar314 = ZEXT3264(_local_a00);
                              auVar213 = local_900._0_16_;
                            }
                            if (auVar213 == (undefined1  [16])0x0) {
                              auVar213 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar213 = auVar213 ^ _DAT_01f7ae20;
                            }
                            else {
                              p_Var29 = context->args->filter;
                              if ((p_Var29 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar291 = ZEXT1664(auVar291._0_16_);
                                auVar401 = ZEXT1664(auVar401._0_16_);
                                auVar431 = ZEXT1664(auVar431._0_16_);
                                auVar440 = ZEXT1664(auVar440._0_16_);
                                (*p_Var29)(&local_a50);
                                auVar314 = ZEXT3264(_local_a00);
                                auVar213 = local_900._0_16_;
                              }
                              auVar209 = vpcmpeqd_avx(auVar213,_DAT_01f7aa10);
                              auVar213 = auVar209 ^ _DAT_01f7ae20;
                              auVar208._8_4_ = 0xff800000;
                              auVar208._0_8_ = 0xff800000ff800000;
                              auVar208._12_4_ = 0xff800000;
                              auVar209 = vblendvps_avx(auVar208,*(undefined1 (*) [16])
                                                                 (local_a50.ray + 0x80),auVar209);
                              *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar209;
                            }
                            auVar415 = ZEXT464((uint)fVar274);
                            auVar178._8_8_ = 0x100000001;
                            auVar178._0_8_ = 0x100000001;
                            bVar133 = (auVar178 & auVar213) != (undefined1  [16])0x0;
                            fVar257 = (float)local_a20._0_4_;
                            fVar258 = (float)local_a20._4_4_;
                            fVar259 = fStack_a18;
                            fVar260 = fStack_a14;
                            fVar271 = fStack_a10;
                            fVar272 = fStack_a0c;
                            fVar273 = fStack_a08;
                            if (!(bool)bVar133) {
                              *(float *)(ray + k * 4 + 0x80) = fVar274;
                            }
                          }
                        }
                      }
                    }
                    goto LAB_01145581;
                  }
                }
                bVar132 = uVar123 < 4;
                uVar123 = uVar123 + 1;
              } while (uVar123 != 5);
              bVar132 = false;
              auVar314 = ZEXT3264(_local_a00);
              bVar133 = 5;
LAB_01145581:
              bVar131 = (bool)(bVar131 | bVar132 & bVar133);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar156._4_4_ = uVar8;
              auVar156._0_4_ = uVar8;
              auVar156._8_4_ = uVar8;
              auVar156._12_4_ = uVar8;
              auVar156._16_4_ = uVar8;
              auVar156._20_4_ = uVar8;
              auVar156._24_4_ = uVar8;
              auVar156._28_4_ = uVar8;
              auVar195 = vcmpps_avx(_local_9a0,auVar156,2);
              fVar171 = auVar195._28_4_;
              auVar147 = vandps_avx(auVar195,local_5e0);
              auVar347 = ZEXT3264(auVar147);
              auVar195 = local_5e0 & auVar195;
              local_5e0 = auVar147;
            } while ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar195 >> 0x7f,0) != '\0') ||
                       (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar195 >> 0xbf,0) != '\0') ||
                     (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar195[0x1f] < '\0');
            auVar347 = ZEXT3264(local_3a0);
            auVar10 = local_800._0_28_;
          }
          auVar194._0_4_ =
               fVar257 * (float)local_840._0_4_ +
               auVar314._0_4_ * (float)local_860._0_4_ + auVar10._0_4_ * (float)local_880._0_4_;
          auVar194._4_4_ =
               fVar258 * (float)local_840._4_4_ +
               auVar314._4_4_ * (float)local_860._4_4_ + auVar10._4_4_ * (float)local_880._4_4_;
          auVar194._8_4_ =
               fVar259 * fStack_838 + auVar314._8_4_ * fStack_858 + auVar10._8_4_ * fStack_878;
          auVar194._12_4_ =
               fVar260 * fStack_834 + auVar314._12_4_ * fStack_854 + auVar10._12_4_ * fStack_874;
          auVar194._16_4_ =
               fVar271 * fStack_830 + auVar314._16_4_ * fStack_850 + auVar10._16_4_ * fStack_870;
          auVar194._20_4_ =
               fVar272 * fStack_82c + auVar314._20_4_ * fStack_84c + auVar10._20_4_ * fStack_86c;
          auVar194._24_4_ =
               fVar273 * fStack_828 + auVar314._24_4_ * fStack_848 + auVar10._24_4_ * fStack_868;
          auVar194._28_4_ = fVar171 + fVar171 + auVar347._28_4_;
          auVar225._8_4_ = 0x7fffffff;
          auVar225._0_8_ = 0x7fffffff7fffffff;
          auVar225._12_4_ = 0x7fffffff;
          auVar225._16_4_ = 0x7fffffff;
          auVar225._20_4_ = 0x7fffffff;
          auVar225._24_4_ = 0x7fffffff;
          auVar225._28_4_ = 0x7fffffff;
          auVar147 = vandps_avx(auVar194,auVar225);
          auVar226._8_4_ = 0x3e99999a;
          auVar226._0_8_ = 0x3e99999a3e99999a;
          auVar226._12_4_ = 0x3e99999a;
          auVar226._16_4_ = 0x3e99999a;
          auVar226._20_4_ = 0x3e99999a;
          auVar226._24_4_ = 0x3e99999a;
          auVar226._28_4_ = 0x3e99999a;
          auVar147 = vcmpps_avx(auVar147,auVar226,1);
          auVar195 = vorps_avx(auVar147,local_660);
          auVar227._0_4_ = fVar163 + (float)local_6c0._0_4_;
          auVar227._4_4_ = fVar233 + (float)local_6c0._4_4_;
          auVar227._8_4_ = fVar169 + fStack_6b8;
          auVar227._12_4_ = fVar256 + fStack_6b4;
          auVar227._16_4_ = fVar163 + fStack_6b0;
          auVar227._20_4_ = fVar233 + fStack_6ac;
          auVar227._24_4_ = fVar169 + fStack_6a8;
          auVar227._28_4_ = fVar256 + fStack_6a4;
          auVar147 = vcmpps_avx(auVar227,auVar156,2);
          _local_880 = vandps_avx(auVar147,local_640);
          auVar228._8_4_ = 3;
          auVar228._0_8_ = 0x300000003;
          auVar228._12_4_ = 3;
          auVar228._16_4_ = 3;
          auVar228._20_4_ = 3;
          auVar228._24_4_ = 3;
          auVar228._28_4_ = 3;
          auVar254._8_4_ = 2;
          auVar254._0_8_ = 0x200000002;
          auVar254._12_4_ = 2;
          auVar254._16_4_ = 2;
          auVar254._20_4_ = 2;
          auVar254._24_4_ = 2;
          auVar254._28_4_ = 2;
          auVar147 = vblendvps_avx(auVar254,auVar228,auVar195);
          auVar213 = vpcmpgtd_avx(auVar147._16_16_,local_6a0);
          auVar209 = vpshufd_avx(local_680._0_16_,0);
          auVar209 = vpcmpgtd_avx(auVar147._0_16_,auVar209);
          auVar229._16_16_ = auVar213;
          auVar229._0_16_ = auVar156._0_16_;
          _local_860 = vblendps_avx(ZEXT1632(auVar209),auVar229,0xf0);
          auVar147 = vandnps_avx(_local_860,_local_880);
          auVar195 = _local_880 & ~_local_860;
          local_900 = auVar147;
          if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar195 >> 0x7f,0) != '\0') ||
                (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar195 >> 0xbf,0) != '\0') ||
              (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar195[0x1f] < '\0') {
            local_840._4_4_ = fVar233 + local_3a0._4_4_;
            local_840._0_4_ = fVar163 + local_3a0._0_4_;
            fStack_838 = fVar169 + local_3a0._8_4_;
            fStack_834 = fVar256 + local_3a0._12_4_;
            fStack_830 = fVar163 + local_3a0._16_4_;
            fStack_82c = fVar233 + local_3a0._20_4_;
            fStack_828 = fVar169 + local_3a0._24_4_;
            fStack_824 = fVar256 + local_3a0._28_4_;
            _local_9a0 = local_3a0;
            do {
              auVar158._8_4_ = 0x7f800000;
              auVar158._0_8_ = 0x7f8000007f800000;
              auVar158._12_4_ = 0x7f800000;
              auVar158._16_4_ = 0x7f800000;
              auVar158._20_4_ = 0x7f800000;
              auVar158._24_4_ = 0x7f800000;
              auVar158._28_4_ = 0x7f800000;
              auVar195 = vblendvps_avx(auVar158,_local_9a0,auVar147);
              auVar30 = vshufps_avx(auVar195,auVar195,0xb1);
              auVar30 = vminps_avx(auVar195,auVar30);
              auVar31 = vshufpd_avx(auVar30,auVar30,5);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar31 = vperm2f128_avx(auVar30,auVar30,1);
              auVar30 = vminps_avx(auVar30,auVar31);
              auVar30 = vcmpps_avx(auVar195,auVar30,0);
              auVar31 = auVar147 & auVar30;
              auVar195 = auVar147;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar195 = vandps_avx(auVar30,auVar147);
              }
              uVar121 = vmovmskps_avx(auVar195);
              uVar124 = 0;
              if (uVar121 != 0) {
                for (; (uVar121 >> uVar124 & 1) == 0; uVar124 = uVar124 + 1) {
                }
              }
              uVar123 = (ulong)uVar124;
              local_900 = auVar147;
              *(undefined4 *)(local_900 + uVar123 * 4) = 0;
              fVar171 = local_1c0[uVar123];
              uVar124 = *(uint *)(local_380 + uVar123 * 4);
              fVar255 = auVar35._0_4_;
              if ((float)local_9c0._0_4_ < 0.0) {
                fVar255 = sqrtf((float)local_9c0._0_4_);
              }
              auVar209 = vminps_avx(auVar11,auVar12);
              auVar213 = vmaxps_avx(auVar11,auVar12);
              auVar143 = vminps_avx(auVar53,auVar13);
              auVar179 = vminps_avx(auVar209,auVar143);
              auVar209 = vmaxps_avx(auVar53,auVar13);
              auVar143 = vmaxps_avx(auVar213,auVar209);
              auVar242._8_4_ = 0x7fffffff;
              auVar242._0_8_ = 0x7fffffff7fffffff;
              auVar242._12_4_ = 0x7fffffff;
              auVar213 = vandps_avx(auVar179,auVar242);
              auVar209 = vandps_avx(auVar143,auVar242);
              auVar213 = vmaxps_avx(auVar213,auVar209);
              auVar209 = vmovshdup_avx(auVar213);
              auVar209 = vmaxss_avx(auVar209,auVar213);
              auVar213 = vshufpd_avx(auVar213,auVar213,1);
              auVar213 = vmaxss_avx(auVar213,auVar209);
              fVar198 = auVar213._0_4_ * 1.9073486e-06;
              local_920._0_4_ = fVar255 * 1.9073486e-06;
              local_7e0._0_16_ = vshufps_avx(auVar143,auVar143,0xff);
              auVar213 = vinsertps_avx(ZEXT416(uVar124),ZEXT416((uint)fVar171),0x10);
              auVar401 = ZEXT1664(auVar213);
              bVar132 = true;
              uVar123 = 0;
              do {
                auVar394 = auVar401._0_16_;
                auVar213 = vmovshdup_avx(auVar394);
                fVar171 = auVar213._0_4_;
                fVar259 = 1.0 - fVar171;
                fVar255 = fVar259 * fVar259 * fVar259;
                fVar257 = fVar171 * fVar171 * fVar171;
                fVar258 = fVar171 * fVar259;
                auVar213 = vshufps_avx(ZEXT416((uint)(fVar257 * 0.16666667)),
                                       ZEXT416((uint)(fVar257 * 0.16666667)),0);
                auVar209 = ZEXT416((uint)((fVar257 * 4.0 + fVar255 +
                                          fVar171 * fVar258 * 12.0 + fVar259 * fVar258 * 6.0) *
                                         0.16666667));
                auVar209 = vshufps_avx(auVar209,auVar209,0);
                auVar143 = ZEXT416((uint)((fVar255 * 4.0 + fVar257 +
                                          fVar259 * fVar258 * 12.0 + fVar171 * fVar258 * 6.0) *
                                         0.16666667));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar179 = vshufps_avx(auVar394,auVar394,0);
                auVar210._0_4_ = auVar179._0_4_ * (float)local_9b0._0_4_ + 0.0;
                auVar210._4_4_ = auVar179._4_4_ * (float)local_9b0._4_4_ + 0.0;
                auVar210._8_4_ = auVar179._8_4_ * fStack_9a8 + 0.0;
                auVar210._12_4_ = auVar179._12_4_ * fStack_9a4 + 0.0;
                auVar179 = vshufps_avx(ZEXT416((uint)(fVar255 * 0.16666667)),
                                       ZEXT416((uint)(fVar255 * 0.16666667)),0);
                auVar141._0_4_ =
                     auVar179._0_4_ * local_ab0 +
                     auVar143._0_4_ * local_ad0 +
                     auVar213._0_4_ * local_ae0 + auVar209._0_4_ * local_ac0;
                auVar141._4_4_ =
                     auVar179._4_4_ * fStack_aac +
                     auVar143._4_4_ * fStack_acc +
                     auVar213._4_4_ * fStack_adc + auVar209._4_4_ * fStack_abc;
                auVar141._8_4_ =
                     auVar179._8_4_ * fStack_aa8 +
                     auVar143._8_4_ * fStack_ac8 +
                     auVar213._8_4_ * fStack_ad8 + auVar209._8_4_ * fStack_ab8;
                auVar141._12_4_ =
                     auVar179._12_4_ * fStack_aa4 +
                     auVar143._12_4_ * fStack_ac4 +
                     auVar213._12_4_ * fStack_ad4 + auVar209._12_4_ * fStack_ab4;
                local_960._0_16_ = auVar141;
                auVar213 = vsubps_avx(auVar210,auVar141);
                local_940 = auVar213._0_4_;
                fStack_93c = auVar213._4_4_;
                fStack_938 = auVar213._8_4_;
                fStack_934 = auVar213._12_4_;
                auVar213 = vdpps_avx(auVar213,auVar213,0x7f);
                fVar255 = auVar213._0_4_;
                local_be0 = auVar401._0_4_;
                if (fVar255 < 0.0) {
                  fVar257 = sqrtf(fVar255);
                }
                else {
                  auVar209 = vsqrtss_avx(auVar213,auVar213);
                  fVar257 = auVar209._0_4_;
                }
                auVar209 = ZEXT416((uint)(fVar171 * fVar171 * 0.5));
                auVar209 = vshufps_avx(auVar209,auVar209,0);
                auVar143 = ZEXT416((uint)((fVar259 * fVar259 + fVar258 * 4.0) * 0.5));
                auVar143 = vshufps_avx(auVar143,auVar143,0);
                auVar179 = ZEXT416((uint)((fVar171 * -fVar171 - fVar258 * 4.0) * 0.5));
                auVar179 = vshufps_avx(auVar179,auVar179,0);
                auVar142 = ZEXT416((uint)(fVar259 * -fVar259 * 0.5));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar363._0_4_ =
                     local_ab0 * auVar142._0_4_ +
                     local_ad0 * auVar179._0_4_ +
                     local_ae0 * auVar209._0_4_ + local_ac0 * auVar143._0_4_;
                auVar363._4_4_ =
                     fStack_aac * auVar142._4_4_ +
                     fStack_acc * auVar179._4_4_ +
                     fStack_adc * auVar209._4_4_ + fStack_abc * auVar143._4_4_;
                auVar363._8_4_ =
                     fStack_aa8 * auVar142._8_4_ +
                     fStack_ac8 * auVar179._8_4_ +
                     fStack_ad8 * auVar209._8_4_ + fStack_ab8 * auVar143._8_4_;
                auVar363._12_4_ =
                     fStack_aa4 * auVar142._12_4_ +
                     fStack_ac4 * auVar179._12_4_ +
                     fStack_ad4 * auVar209._12_4_ + fStack_ab4 * auVar143._12_4_;
                auVar209 = vshufps_avx(auVar394,auVar394,0x55);
                auVar143 = ZEXT416((uint)(fVar259 - (fVar171 + fVar171)));
                auVar179 = vshufps_avx(auVar143,auVar143,0);
                auVar143 = ZEXT416((uint)(fVar171 - (fVar259 + fVar259)));
                auVar142 = vshufps_avx(auVar143,auVar143,0);
                auVar14 = vshufps_avx(ZEXT416((uint)fVar259),ZEXT416((uint)fVar259),0);
                auVar143 = vdpps_avx(auVar363,auVar363,0x7f);
                auVar180._0_4_ =
                     local_ab0 * auVar14._0_4_ +
                     local_ad0 * auVar142._0_4_ +
                     local_ae0 * auVar209._0_4_ + local_ac0 * auVar179._0_4_;
                auVar180._4_4_ =
                     fStack_aac * auVar14._4_4_ +
                     fStack_acc * auVar142._4_4_ +
                     fStack_adc * auVar209._4_4_ + fStack_abc * auVar179._4_4_;
                auVar180._8_4_ =
                     fStack_aa8 * auVar14._8_4_ +
                     fStack_ac8 * auVar142._8_4_ +
                     fStack_ad8 * auVar209._8_4_ + fStack_ab8 * auVar179._8_4_;
                auVar180._12_4_ =
                     fStack_aa4 * auVar14._12_4_ +
                     fStack_ac4 * auVar142._12_4_ +
                     fStack_ad4 * auVar209._12_4_ + fStack_ab4 * auVar179._12_4_;
                auVar209 = vblendps_avx(auVar143,_DAT_01f7aa10,0xe);
                auVar179 = vrsqrtss_avx(auVar209,auVar209);
                fVar258 = auVar179._0_4_;
                fVar171 = auVar143._0_4_;
                auVar179 = vdpps_avx(auVar363,auVar180,0x7f);
                auVar142 = vshufps_avx(auVar143,auVar143,0);
                auVar181._0_4_ = auVar180._0_4_ * auVar142._0_4_;
                auVar181._4_4_ = auVar180._4_4_ * auVar142._4_4_;
                auVar181._8_4_ = auVar180._8_4_ * auVar142._8_4_;
                auVar181._12_4_ = auVar180._12_4_ * auVar142._12_4_;
                auVar179 = vshufps_avx(auVar179,auVar179,0);
                auVar265._0_4_ = auVar363._0_4_ * auVar179._0_4_;
                auVar265._4_4_ = auVar363._4_4_ * auVar179._4_4_;
                auVar265._8_4_ = auVar363._8_4_ * auVar179._8_4_;
                auVar265._12_4_ = auVar363._12_4_ * auVar179._12_4_;
                auVar14 = vsubps_avx(auVar181,auVar265);
                auVar179 = vrcpss_avx(auVar209,auVar209);
                auVar209 = vmaxss_avx(ZEXT416((uint)fVar198),
                                      ZEXT416((uint)(local_be0 * (float)local_920._0_4_)));
                auVar415 = ZEXT1664(auVar209);
                auVar179 = ZEXT416((uint)(auVar179._0_4_ * (2.0 - fVar171 * auVar179._0_4_)));
                auVar179 = vshufps_avx(auVar179,auVar179,0);
                uVar110 = CONCAT44(auVar363._4_4_,auVar363._0_4_);
                auVar282._0_8_ = uVar110 ^ 0x8000000080000000;
                auVar282._8_4_ = -auVar363._8_4_;
                auVar282._12_4_ = -auVar363._12_4_;
                auVar142 = ZEXT416((uint)(fVar258 * 1.5 +
                                         fVar171 * -0.5 * fVar258 * fVar258 * fVar258));
                auVar142 = vshufps_avx(auVar142,auVar142,0);
                auVar243._0_4_ = auVar142._0_4_ * auVar14._0_4_ * auVar179._0_4_;
                auVar243._4_4_ = auVar142._4_4_ * auVar14._4_4_ * auVar179._4_4_;
                auVar243._8_4_ = auVar142._8_4_ * auVar14._8_4_ * auVar179._8_4_;
                auVar243._12_4_ = auVar142._12_4_ * auVar14._12_4_ * auVar179._12_4_;
                auVar304._0_4_ = auVar363._0_4_ * auVar142._0_4_;
                auVar304._4_4_ = auVar363._4_4_ * auVar142._4_4_;
                auVar304._8_4_ = auVar363._8_4_ * auVar142._8_4_;
                auVar304._12_4_ = auVar363._12_4_ * auVar142._12_4_;
                if (fVar171 < 0.0) {
                  local_9e0._0_16_ = auVar243;
                  fVar171 = sqrtf(fVar171);
                  auVar415 = ZEXT464(auVar209._0_4_);
                  auVar243 = local_9e0._0_16_;
                }
                else {
                  auVar143 = vsqrtss_avx(auVar143,auVar143);
                  fVar171 = auVar143._0_4_;
                }
                auVar116._4_4_ = fStack_93c;
                auVar116._0_4_ = local_940;
                auVar116._8_4_ = fStack_938;
                auVar116._12_4_ = fStack_934;
                auVar143 = vdpps_avx(auVar116,auVar304,0x7f);
                fVar171 = (fVar198 / fVar171) * (fVar257 + 1.0) + auVar415._0_4_ + fVar257 * fVar198
                ;
                auVar179 = vdpps_avx(auVar282,auVar304,0x7f);
                auVar142 = vdpps_avx(auVar116,auVar243,0x7f);
                auVar14 = vdpps_avx(_local_9b0,auVar304,0x7f);
                auVar15 = vdpps_avx(auVar116,auVar282,0x7f);
                fVar257 = auVar179._0_4_ + auVar142._0_4_;
                fVar258 = auVar143._0_4_;
                auVar144._0_4_ = fVar258 * fVar258;
                auVar144._4_4_ = auVar143._4_4_ * auVar143._4_4_;
                auVar144._8_4_ = auVar143._8_4_ * auVar143._8_4_;
                auVar144._12_4_ = auVar143._12_4_ * auVar143._12_4_;
                auVar142 = vsubps_avx(auVar213,auVar144);
                auVar179 = vdpps_avx(auVar116,_local_9b0,0x7f);
                fVar259 = auVar15._0_4_ - fVar258 * fVar257;
                fVar260 = auVar179._0_4_ - fVar258 * auVar14._0_4_;
                auVar179 = vrsqrtss_avx(auVar142,auVar142);
                fVar271 = auVar142._0_4_;
                fVar258 = auVar179._0_4_;
                fVar258 = fVar258 * 1.5 + fVar271 * -0.5 * fVar258 * fVar258 * fVar258;
                if (fVar271 < 0.0) {
                  local_9e0._0_16_ = ZEXT416((uint)fVar257);
                  local_7a0._0_4_ = fVar259;
                  local_7c0._0_4_ = fVar260;
                  local_980._0_4_ = fVar258;
                  fVar271 = sqrtf(fVar271);
                  auVar415 = ZEXT464(auVar209._0_4_);
                  fVar258 = (float)local_980._0_4_;
                  fVar259 = (float)local_7a0._0_4_;
                  fVar260 = (float)local_7c0._0_4_;
                  auVar209 = local_9e0._0_16_;
                }
                else {
                  auVar209 = vsqrtss_avx(auVar142,auVar142);
                  fVar271 = auVar209._0_4_;
                  auVar209 = ZEXT416((uint)fVar257);
                }
                auVar440 = ZEXT1664(auVar143);
                auVar431 = ZEXT464((uint)fVar171);
                auVar182 = vpermilps_avx(local_960._0_16_,0xff);
                auVar15 = vshufps_avx(auVar363,auVar363,0xff);
                fVar259 = fVar259 * fVar258 - auVar15._0_4_;
                auVar266._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
                auVar266._8_4_ = auVar14._8_4_ ^ 0x80000000;
                auVar266._12_4_ = auVar14._12_4_ ^ 0x80000000;
                auVar283._0_4_ = -fVar259;
                auVar283._4_4_ = 0x80000000;
                auVar283._8_4_ = 0x80000000;
                auVar283._12_4_ = 0x80000000;
                auVar291 = ZEXT1664(auVar283);
                fVar257 = auVar209._0_4_ * fVar260 * fVar258;
                auVar314 = ZEXT464((uint)fVar257);
                auVar179 = vinsertps_avx(auVar283,ZEXT416((uint)(fVar260 * fVar258)),0x1c);
                auVar142 = vmovsldup_avx(ZEXT416((uint)(fVar257 - auVar14._0_4_ * fVar259)));
                auVar179 = vdivps_avx(auVar179,auVar142);
                auVar209 = vinsertps_avx(auVar209,auVar266,0x10);
                auVar209 = vdivps_avx(auVar209,auVar142);
                auVar142 = vmovsldup_avx(auVar143);
                auVar182 = ZEXT416((uint)(fVar271 - auVar182._0_4_));
                auVar14 = vmovsldup_avx(auVar182);
                auVar211._0_4_ = auVar142._0_4_ * auVar179._0_4_ + auVar14._0_4_ * auVar209._0_4_;
                auVar211._4_4_ = auVar142._4_4_ * auVar179._4_4_ + auVar14._4_4_ * auVar209._4_4_;
                auVar211._8_4_ = auVar142._8_4_ * auVar179._8_4_ + auVar14._8_4_ * auVar209._8_4_;
                auVar211._12_4_ =
                     auVar142._12_4_ * auVar179._12_4_ + auVar14._12_4_ * auVar209._12_4_;
                auVar179 = vsubps_avx(auVar394,auVar211);
                auVar401 = ZEXT1664(auVar179);
                auVar212._8_4_ = 0x7fffffff;
                auVar212._0_8_ = 0x7fffffff7fffffff;
                auVar212._12_4_ = 0x7fffffff;
                auVar209 = vandps_avx(auVar143,auVar212);
                if (auVar209._0_4_ < fVar171) {
                  auVar244._8_4_ = 0x7fffffff;
                  auVar244._0_8_ = 0x7fffffff7fffffff;
                  auVar244._12_4_ = 0x7fffffff;
                  auVar209 = vandps_avx(auVar182,auVar244);
                  if (auVar209._0_4_ <
                      (float)local_7e0._0_4_ * 1.9073486e-06 + auVar415._0_4_ + fVar171) {
                    fVar198 = auVar179._0_4_ + (float)local_8d0._0_4_;
                    if (fVar234 <= fVar198) {
                      fVar258 = *(float *)(ray + k * 4 + 0x80);
                      auVar415 = ZEXT464((uint)fVar258);
                      if (fVar258 < fVar198) {
                        bVar133 = 0;
                        goto LAB_01145e08;
                      }
                      auVar209 = vmovshdup_avx(auVar179);
                      bVar133 = 0;
                      if ((auVar209._0_4_ < 0.0) || (1.0 < auVar209._0_4_)) goto LAB_01145e08;
                      auVar213 = vrsqrtss_avx(auVar213,auVar213);
                      fVar259 = auVar213._0_4_;
                      pGVar25 = (context->scene->geometries).items[uVar120].ptr;
                      if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                           (bVar133 = 1, pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                          auVar213 = ZEXT416((uint)(fVar259 * 1.5 +
                                                   fVar255 * -0.5 * fVar259 * fVar259 * fVar259));
                          auVar213 = vshufps_avx(auVar213,auVar213,0);
                          auVar214._0_4_ = auVar213._0_4_ * local_940;
                          auVar214._4_4_ = auVar213._4_4_ * fStack_93c;
                          auVar214._8_4_ = auVar213._8_4_ * fStack_938;
                          auVar214._12_4_ = auVar213._12_4_ * fStack_934;
                          auVar145._0_4_ = auVar363._0_4_ + auVar15._0_4_ * auVar214._0_4_;
                          auVar145._4_4_ = auVar363._4_4_ + auVar15._4_4_ * auVar214._4_4_;
                          auVar145._8_4_ = auVar363._8_4_ + auVar15._8_4_ * auVar214._8_4_;
                          auVar145._12_4_ = auVar363._12_4_ + auVar15._12_4_ * auVar214._12_4_;
                          auVar213 = vshufps_avx(auVar214,auVar214,0xc9);
                          auVar209 = vshufps_avx(auVar363,auVar363,0xc9);
                          auVar215._0_4_ = auVar209._0_4_ * auVar214._0_4_;
                          auVar215._4_4_ = auVar209._4_4_ * auVar214._4_4_;
                          auVar215._8_4_ = auVar209._8_4_ * auVar214._8_4_;
                          auVar215._12_4_ = auVar209._12_4_ * auVar214._12_4_;
                          auVar245._0_4_ = auVar363._0_4_ * auVar213._0_4_;
                          auVar245._4_4_ = auVar363._4_4_ * auVar213._4_4_;
                          auVar245._8_4_ = auVar363._8_4_ * auVar213._8_4_;
                          auVar245._12_4_ = auVar363._12_4_ * auVar213._12_4_;
                          auVar394 = vsubps_avx(auVar245,auVar215);
                          auVar213 = vshufps_avx(auVar394,auVar394,0xc9);
                          auVar209 = vshufps_avx(auVar145,auVar145,0xc9);
                          auVar246._0_4_ = auVar209._0_4_ * auVar213._0_4_;
                          auVar246._4_4_ = auVar209._4_4_ * auVar213._4_4_;
                          auVar246._8_4_ = auVar209._8_4_ * auVar213._8_4_;
                          auVar246._12_4_ = auVar209._12_4_ * auVar213._12_4_;
                          auVar213 = vshufps_avx(auVar394,auVar394,0xd2);
                          auVar146._0_4_ = auVar145._0_4_ * auVar213._0_4_;
                          auVar146._4_4_ = auVar145._4_4_ * auVar213._4_4_;
                          auVar146._8_4_ = auVar145._8_4_ * auVar213._8_4_;
                          auVar146._12_4_ = auVar145._12_4_ * auVar213._12_4_;
                          auVar213 = vsubps_avx(auVar246,auVar146);
                          local_730 = vshufps_avx(auVar179,auVar179,0x55);
                          local_760 = (RTCHitN  [16])vshufps_avx(auVar213,auVar213,0x55);
                          auStack_750 = vshufps_avx(auVar213,auVar213,0xaa);
                          local_740 = vshufps_avx(auVar213,auVar213,0);
                          local_720 = ZEXT816(0) << 0x20;
                          local_710 = local_780._0_8_;
                          uStack_708 = local_780._8_8_;
                          local_700 = local_770._0_8_;
                          uStack_6f8 = local_770._8_8_;
                          uVar124 = context->user->instID[0];
                          _local_6f0 = CONCAT44(uVar124,uVar124);
                          _uStack_6e8 = CONCAT44(uVar124,uVar124);
                          uVar124 = context->user->instPrimID[0];
                          _uStack_6e0 = CONCAT44(uVar124,uVar124);
                          _uStack_6d8 = CONCAT44(uVar124,uVar124);
                          *(float *)(ray + k * 4 + 0x80) = fVar198;
                          local_8c0 = *(undefined1 (*) [16])
                                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
                          local_a50.valid = (int *)local_8c0;
                          local_a50.geometryUserPtr = pGVar25->userPtr;
                          local_a50.context = context->user;
                          local_a50.hit = local_760;
                          local_a50.N = 4;
                          local_a50.ray = (RTCRayN *)ray;
                          if (pGVar25->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar291 = ZEXT1664(auVar283);
                            auVar314 = ZEXT464((uint)fVar257);
                            auVar401 = ZEXT1664(auVar179);
                            auVar431 = ZEXT464((uint)fVar171);
                            auVar440 = ZEXT1664(auVar143);
                            (*pGVar25->occlusionFilterN)(&local_a50);
                          }
                          if (local_8c0 == (undefined1  [16])0x0) {
                            auVar213 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar213 = auVar213 ^ _DAT_01f7ae20;
                          }
                          else {
                            p_Var29 = context->args->filter;
                            if ((p_Var29 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar291 = ZEXT1664(auVar291._0_16_);
                              auVar314 = ZEXT1664(auVar314._0_16_);
                              auVar401 = ZEXT1664(auVar401._0_16_);
                              auVar431 = ZEXT1664(auVar431._0_16_);
                              auVar440 = ZEXT1664(auVar440._0_16_);
                              (*p_Var29)(&local_a50);
                            }
                            auVar209 = vpcmpeqd_avx(local_8c0,_DAT_01f7aa10);
                            auVar213 = auVar209 ^ _DAT_01f7ae20;
                            auVar216._8_4_ = 0xff800000;
                            auVar216._0_8_ = 0xff800000ff800000;
                            auVar216._12_4_ = 0xff800000;
                            auVar209 = vblendvps_avx(auVar216,*(undefined1 (*) [16])
                                                               (local_a50.ray + 0x80),auVar209);
                            *(undefined1 (*) [16])(local_a50.ray + 0x80) = auVar209;
                          }
                          auVar415 = ZEXT464((uint)fVar258);
                          auVar183._8_8_ = 0x100000001;
                          auVar183._0_8_ = 0x100000001;
                          bVar133 = (auVar183 & auVar213) != (undefined1  [16])0x0;
                          if (!(bool)bVar133) {
                            *(float *)(ray + k * 4 + 0x80) = fVar258;
                          }
                        }
                        goto LAB_01145e08;
                      }
                    }
                    bVar133 = 0;
                    goto LAB_01145e08;
                  }
                }
                bVar132 = uVar123 < 4;
                uVar123 = uVar123 + 1;
              } while (uVar123 != 5);
              bVar132 = false;
              bVar133 = 5;
LAB_01145e08:
              bVar131 = (bool)(bVar131 | bVar132 & bVar133);
              uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar156._4_4_ = uVar8;
              auVar156._0_4_ = uVar8;
              auVar156._8_4_ = uVar8;
              auVar156._12_4_ = uVar8;
              auVar156._16_4_ = uVar8;
              auVar156._20_4_ = uVar8;
              auVar156._24_4_ = uVar8;
              auVar156._28_4_ = uVar8;
              auVar195 = vcmpps_avx(_local_840,auVar156,2);
              auVar147 = vandps_avx(auVar195,local_900);
              auVar195 = local_900 & auVar195;
              local_900 = auVar147;
            } while ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar195 >> 0x7f,0) != '\0') ||
                       (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar195 >> 0xbf,0) != '\0') ||
                     (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar195[0x1f] < '\0');
          }
          auVar147 = vandps_avx(local_620,local_600);
          auVar195 = vandps_avx(_local_880,_local_860);
          auVar347 = ZEXT3264(CONCAT1616(auVar52,auVar52));
          auVar269._0_4_ = fVar163 + local_3e0._0_4_;
          auVar269._4_4_ = fVar233 + local_3e0._4_4_;
          auVar269._8_4_ = fVar169 + local_3e0._8_4_;
          auVar269._12_4_ = fVar256 + local_3e0._12_4_;
          auVar269._16_4_ = fVar163 + local_3e0._16_4_;
          auVar269._20_4_ = fVar233 + local_3e0._20_4_;
          auVar269._24_4_ = fVar169 + local_3e0._24_4_;
          auVar269._28_4_ = fVar256 + local_3e0._28_4_;
          auVar30 = vcmpps_avx(auVar269,auVar156,2);
          auVar147 = vandps_avx(auVar30,auVar147);
          auVar270._0_4_ = local_3a0._0_4_ + fVar163;
          auVar270._4_4_ = local_3a0._4_4_ + fVar233;
          auVar270._8_4_ = local_3a0._8_4_ + fVar169;
          auVar270._12_4_ = local_3a0._12_4_ + fVar256;
          auVar270._16_4_ = local_3a0._16_4_ + fVar163;
          auVar270._20_4_ = local_3a0._20_4_ + fVar233;
          auVar270._24_4_ = local_3a0._24_4_ + fVar169;
          auVar270._28_4_ = local_3a0._28_4_ + fVar256;
          auVar30 = vcmpps_avx(auVar270,auVar156,2);
          auVar195 = vandps_avx(auVar30,auVar195);
          auVar195 = vorps_avx(auVar147,auVar195);
          if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar195 >> 0x7f,0) != '\0') ||
                (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar195 >> 0xbf,0) != '\0') ||
              (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar195[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar127 * 0x60) = auVar195;
            auVar147 = vblendvps_avx(local_3a0,_local_3e0,auVar147);
            *(undefined1 (*) [32])(auStack_160 + uVar127 * 0x60) = auVar147;
            uVar9 = vmovlps_avx(local_5b0);
            (&uStack_140)[uVar127 * 0xc] = uVar9;
            aiStack_138[uVar127 * 0x18] = local_be8 + 1;
            iVar126 = iVar126 + 1;
          }
        }
      }
    }
    if (iVar126 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar153._4_4_ = uVar8;
    auVar153._0_4_ = uVar8;
    auVar153._8_4_ = uVar8;
    auVar153._12_4_ = uVar8;
    auVar153._16_4_ = uVar8;
    auVar153._20_4_ = uVar8;
    auVar153._24_4_ = uVar8;
    auVar153._28_4_ = uVar8;
    uVar124 = -iVar126;
    pauVar122 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar126 - 1) * 0x60);
    while( true ) {
      auVar147 = pauVar122[1];
      auVar188._0_4_ = fVar163 + auVar147._0_4_;
      auVar188._4_4_ = fVar233 + auVar147._4_4_;
      auVar188._8_4_ = fVar169 + auVar147._8_4_;
      auVar188._12_4_ = fVar256 + auVar147._12_4_;
      auVar188._16_4_ = fVar163 + auVar147._16_4_;
      auVar188._20_4_ = fVar233 + auVar147._20_4_;
      auVar188._24_4_ = fVar169 + auVar147._24_4_;
      auVar188._28_4_ = fVar256 + auVar147._28_4_;
      auVar195 = vcmpps_avx(auVar188,auVar153,2);
      _local_760 = vandps_avx(auVar195,*pauVar122);
      auVar195 = *pauVar122 & auVar195;
      if ((((((((auVar195 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar195 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar195 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar195 >> 0x7f,0) != '\0') ||
            (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar195 >> 0xbf,0) != '\0') ||
          (auVar195 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar195[0x1f] < '\0') break;
      pauVar122 = pauVar122 + -3;
      uVar124 = uVar124 + 1;
      if (uVar124 == 0) goto LAB_011462fb;
    }
    auVar154._8_4_ = 0x7f800000;
    auVar154._0_8_ = 0x7f8000007f800000;
    auVar154._12_4_ = 0x7f800000;
    auVar154._16_4_ = 0x7f800000;
    auVar154._20_4_ = 0x7f800000;
    auVar154._24_4_ = 0x7f800000;
    auVar154._28_4_ = 0x7f800000;
    auVar147 = vblendvps_avx(auVar154,auVar147,_local_760);
    auVar195 = vshufps_avx(auVar147,auVar147,0xb1);
    auVar195 = vminps_avx(auVar147,auVar195);
    auVar30 = vshufpd_avx(auVar195,auVar195,5);
    auVar195 = vminps_avx(auVar195,auVar30);
    auVar30 = vperm2f128_avx(auVar195,auVar195,1);
    auVar195 = vminps_avx(auVar195,auVar30);
    auVar195 = vcmpps_avx(auVar147,auVar195,0);
    auVar30 = _local_760 & auVar195;
    auVar147 = _local_760;
    if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar30 >> 0x7f,0) != '\0') ||
          (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar30 >> 0xbf,0) != '\0') ||
        (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar30[0x1f] < '\0')
    {
      auVar147 = vandps_avx(auVar195,_local_760);
    }
    auVar136._8_8_ = 0;
    auVar136._0_8_ = *(ulong *)pauVar122[2];
    local_be8 = *(uint *)(pauVar122[2] + 8);
    uVar125 = vmovmskps_avx(auVar147);
    uVar121 = 0;
    if (uVar125 != 0) {
      for (; (uVar125 >> uVar121 & 1) == 0; uVar121 = uVar121 + 1) {
      }
    }
    *(undefined4 *)(local_760 + (ulong)uVar121 * 4) = 0;
    *pauVar122 = _local_760;
    uVar125 = ~uVar124;
    if ((((((((_local_760 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_760 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_760 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_760 >> 0x7f,0) != '\0') ||
          (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_760 >> 0xbf,0) != '\0') ||
        (_local_760 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_760[0x1f] < '\0') {
      uVar125 = -uVar124;
    }
    uVar127 = (ulong)uVar125;
    auVar213 = vshufps_avx(auVar136,auVar136,0);
    auVar209 = vshufps_avx(auVar136,auVar136,0x55);
    auVar209 = vsubps_avx(auVar209,auVar213);
    local_3e0._4_4_ = auVar213._4_4_ + auVar209._4_4_ * 0.14285715;
    local_3e0._0_4_ = auVar213._0_4_ + auVar209._0_4_ * 0.0;
    fStack_3d8 = auVar213._8_4_ + auVar209._8_4_ * 0.2857143;
    fStack_3d4 = auVar213._12_4_ + auVar209._12_4_ * 0.42857146;
    fStack_3d0 = auVar213._0_4_ + auVar209._0_4_ * 0.5714286;
    fStack_3cc = auVar213._4_4_ + auVar209._4_4_ * 0.71428573;
    fStack_3c8 = auVar213._8_4_ + auVar209._8_4_ * 0.8571429;
    fStack_3c4 = auVar213._12_4_ + auVar209._12_4_;
    local_5b0._8_8_ = 0;
    local_5b0._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar121 * 4);
  } while( true );
LAB_011462fb:
  if (bVar131 != false) {
    return bVar131;
  }
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar161._4_4_ = uVar8;
  auVar161._0_4_ = uVar8;
  auVar161._8_4_ = uVar8;
  auVar161._12_4_ = uVar8;
  auVar161._16_4_ = uVar8;
  auVar161._20_4_ = uVar8;
  auVar161._24_4_ = uVar8;
  auVar161._28_4_ = uVar8;
  auVar147 = vcmpps_avx(local_300,auVar161,2);
  uVar120 = vmovmskps_avx(auVar147);
  uVar120 = (uint)local_8a8 - 1 & (uint)local_8a8 & uVar120;
  if (uVar120 == 0) {
    return false;
  }
  goto LAB_01143742;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }